

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementShellANCF_3443.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChElementShellANCF_3443::ComputeInternalJacobianContIntDamping
          (ChElementShellANCF_3443 *this,ChMatrixRef *H,double Kfactor,double Rfactor)

{
  ChKblockGeneric *pCVar1;
  long lVar2;
  long lVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  pointer pLVar73;
  PointerType pdVar74;
  uint uVar75;
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  int iVar82;
  long lVar83;
  long lVar84;
  long lVar85;
  undefined1 (*pauVar86) [64];
  ulong uVar87;
  int iVar88;
  long lVar89;
  long lVar90;
  long lVar91;
  undefined1 (*pauVar92) [64];
  char *__function;
  long lVar93;
  long lVar94;
  long lVar95;
  ActualDstType actualDst;
  undefined1 (*pauVar96) [64];
  ChElementShellANCF_3443 *this_00;
  ChElementShellANCF_3443 *this_01;
  long lVar97;
  long lVar98;
  long lVar99;
  double *pdVar100;
  long lVar101;
  ulong uVar102;
  double *pdVar103;
  PointerType pdVar104;
  ulong uVar105;
  double *pdVar106;
  long lVar107;
  undefined1 auVar108 [32];
  undefined1 auVar109 [64];
  undefined1 auVar110 [64];
  undefined1 auVar111 [64];
  undefined1 auVar112 [64];
  undefined1 auVar113 [64];
  undefined1 auVar114 [64];
  undefined1 auVar115 [64];
  undefined1 auVar116 [64];
  undefined1 auVar117 [64];
  undefined1 auVar118 [64];
  undefined1 auVar119 [64];
  undefined1 auVar120 [64];
  undefined1 auVar121 [64];
  undefined1 auVar122 [64];
  undefined1 auVar123 [64];
  undefined1 auVar124 [64];
  undefined1 auVar125 [64];
  undefined1 auVar126 [64];
  undefined1 auVar127 [64];
  undefined1 auVar128 [64];
  undefined1 auVar129 [64];
  undefined1 auVar130 [64];
  undefined1 auVar131 [64];
  undefined1 auVar132 [64];
  undefined1 auVar133 [64];
  undefined1 auVar134 [64];
  undefined1 auVar135 [64];
  undefined1 auVar136 [64];
  undefined1 auVar137 [64];
  undefined1 auVar138 [64];
  double dVar139;
  double in_XMM0_Qb;
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  Matrix<double,__1,__1,_1,__1,__1> DScaled_Combined_PE;
  Matrix<double,__1,__1,_1,__1,__1> Scaled_Combined_PE;
  Matrix<double,__1,__1,_1,__1,__1> PE;
  ChMatrixNM<double,_6,_6> D;
  SrcEvaluatorType srcEvaluator;
  DstEvaluatorType dstEvaluator;
  MatrixNx6 ebar_ebardot;
  ChMatrixNM<double,_NSF,_3_*_NIP>_conflict3 S_scaled_SD;
  ulong local_6490;
  int local_6468;
  int local_6464;
  DenseStorage<double,__1,__1,__1,_1> local_6460;
  DenseStorage<double,__1,__1,__1,_1> local_6440;
  DenseStorage<double,__1,__1,__1,_1> local_6420;
  long local_6408;
  undefined1 local_6400 [64];
  undefined1 local_63a0 [96];
  pointer local_6340;
  pointer local_6338;
  pointer local_6330;
  pointer local_6328;
  pointer local_6320;
  pointer local_6318;
  pointer local_6310;
  pointer local_6308;
  pointer local_6300;
  double local_62f8;
  double local_62f0;
  double local_62e8;
  double local_62e0;
  double local_62d8;
  double local_62d0;
  double local_62c8;
  double local_62c0;
  double local_62b8;
  double local_62b0;
  double local_62a8;
  double local_62a0;
  double local_6298;
  double local_6290;
  double local_6288;
  undefined1 local_6280 [64];
  assign_op<double,_double> *local_6218;
  double local_6210;
  double local_6208;
  undefined1 local_6200 [64];
  undefined1 local_61c0 [64];
  double local_6150;
  double dStack_6148;
  undefined1 local_6140 [64];
  undefined1 local_6100 [64];
  undefined1 local_60c0 [112];
  undefined1 *local_6050;
  undefined1 local_6048 [8];
  undefined1 local_6040 [64];
  undefined1 local_6000 [64];
  undefined1 local_5fc0 [64];
  undefined1 local_5f80 [64];
  undefined1 local_5f40 [64];
  undefined1 local_5f00 [64];
  undefined1 local_5ec0 [64];
  undefined1 local_5e80 [64];
  undefined1 local_5e40 [64];
  undefined1 local_5e00 [64];
  undefined1 local_5dc0 [64];
  undefined1 local_5d80 [64];
  undefined1 local_5d40 [64];
  undefined1 local_5d00 [64];
  undefined1 local_5cc0 [64];
  undefined1 local_5c80 [64];
  undefined1 local_5c40 [64];
  undefined1 local_5c00 [64];
  undefined1 local_5bc0 [64];
  undefined1 local_5b80 [64];
  undefined1 local_5b40 [64];
  undefined1 local_5b00 [64];
  undefined1 local_5ac0 [64];
  undefined1 local_5a80 [64];
  undefined1 local_5a40 [64];
  undefined1 local_5a00 [64];
  undefined1 local_59c0 [64];
  undefined1 local_5980 [64];
  undefined1 local_5940 [64];
  undefined1 local_5900 [64];
  undefined1 local_58c0 [64];
  undefined1 local_5880 [64];
  undefined1 local_5840 [64];
  undefined1 local_5800 [64];
  undefined1 local_57c0 [64];
  undefined1 local_5780 [64];
  undefined1 local_5740 [64];
  undefined1 local_5700 [64];
  undefined1 local_56c0 [64];
  undefined1 local_5680 [64];
  undefined1 local_5640 [64];
  undefined1 local_5600 [64];
  undefined1 local_55c0 [64];
  undefined1 local_5580 [64];
  undefined1 local_5540 [64];
  undefined1 local_5500 [64];
  undefined1 local_54c0 [64];
  undefined1 local_5480 [64];
  undefined1 local_5440 [64];
  undefined1 local_5400 [64];
  undefined1 local_53c0 [64];
  undefined1 local_5380 [64];
  undefined1 local_5340 [64];
  undefined1 local_5300 [64];
  undefined1 local_52c0 [64];
  undefined1 local_5280 [64];
  undefined1 local_5240 [64];
  undefined1 local_5200 [64];
  undefined1 local_51c0 [64];
  undefined1 local_5180 [64];
  undefined1 local_5140 [64];
  undefined1 local_5100 [64];
  undefined1 local_50c0 [64];
  undefined1 local_5080 [64];
  undefined1 local_5040 [64];
  undefined1 local_5000 [64];
  undefined1 local_4fc0 [64];
  undefined1 local_4f80 [64];
  undefined1 local_4f40 [64];
  undefined1 local_4f00 [64];
  undefined1 local_4ec0 [64];
  undefined1 local_4e80 [64];
  undefined1 local_4e40 [64];
  undefined1 local_4e00 [64];
  undefined1 local_4dc0 [64];
  undefined1 local_4d80 [64];
  undefined1 local_4d40 [64];
  undefined1 local_4d00 [64];
  undefined1 local_4cc0 [64];
  undefined1 local_4c80 [64];
  undefined1 local_4c40 [64];
  undefined1 local_4c00 [64];
  undefined1 local_4bc0 [64];
  undefined1 local_4b80 [64];
  undefined1 local_4b40 [64];
  undefined1 local_4b00 [64];
  undefined1 local_4ac0 [64];
  undefined1 local_4a80 [64];
  undefined1 local_4a40 [64];
  undefined1 local_4a00 [64];
  undefined1 local_49c0 [64];
  undefined1 local_4980 [64];
  undefined1 local_4940 [64];
  undefined1 local_4900 [64];
  undefined1 local_48c0 [64];
  undefined1 local_4880 [64];
  undefined1 local_4840 [64];
  undefined1 local_4800 [64];
  undefined1 local_47c0 [64];
  undefined1 local_4780 [64];
  undefined1 local_4740 [64];
  undefined1 local_4700 [64];
  undefined1 local_46c0 [64];
  undefined1 local_4680 [64];
  undefined1 local_4640 [64];
  undefined1 local_4600 [64];
  undefined1 local_45c0 [64];
  undefined1 local_4580 [64];
  undefined1 local_4540 [64];
  undefined1 local_4500 [64];
  undefined1 local_44c0 [64];
  undefined1 local_4480 [64];
  undefined1 local_4440 [64];
  undefined1 local_4400 [64];
  undefined1 local_43c0 [64];
  undefined1 local_4380 [64];
  undefined1 local_4340 [64];
  undefined1 local_4300 [64];
  undefined1 local_42c0 [64];
  undefined1 local_4280 [64];
  undefined1 local_4240 [64];
  undefined1 local_4200 [64];
  undefined1 local_41c0 [64];
  undefined1 local_4180 [64];
  undefined1 local_4140 [64];
  undefined1 local_4100 [64];
  undefined1 local_40c0 [64];
  undefined1 local_4080 [64];
  undefined1 local_4040 [64];
  undefined1 local_4000 [64];
  undefined1 local_3fc0 [64];
  undefined1 local_3f80 [64];
  undefined1 local_3f40 [64];
  undefined1 local_3f00 [64];
  undefined1 local_3ec0 [64];
  undefined1 local_3e80 [64];
  undefined1 local_3e40 [64];
  undefined1 local_3e00 [64];
  undefined1 local_3dc0 [64];
  undefined1 local_3d80 [64];
  undefined1 local_3d40 [64];
  undefined1 local_3d00 [64];
  undefined1 local_3cc0 [64];
  undefined1 local_3c80 [64];
  undefined1 local_3c40 [64];
  undefined1 local_3c00 [64];
  undefined1 local_3bc0 [64];
  undefined1 local_3b80 [64];
  undefined1 local_3b40 [64];
  undefined1 local_3b00 [64];
  undefined1 local_3ac0 [64];
  undefined1 local_3a80 [64];
  undefined1 local_3a40 [64];
  undefined1 local_3a00 [64];
  undefined1 local_39c0 [64];
  undefined1 local_3980 [64];
  undefined1 local_3940 [64];
  undefined1 local_3900 [64];
  undefined1 local_38c0 [64];
  undefined1 local_3880 [64];
  undefined1 local_3840 [64];
  undefined1 local_3800 [64];
  undefined1 local_37c0 [64];
  undefined1 local_3780 [64];
  undefined1 local_3740 [64];
  undefined1 local_3700 [64];
  undefined1 local_36c0 [64];
  undefined1 local_3680 [64];
  undefined1 local_3640 [64];
  undefined1 local_3600 [64];
  undefined1 local_35c0 [64];
  undefined1 local_3580 [64];
  undefined1 local_3540 [64];
  undefined1 local_3500 [64];
  undefined1 local_34c0 [64];
  undefined1 local_3480 [64];
  undefined1 local_3440 [64];
  undefined1 local_3400 [64];
  undefined1 local_33c0 [64];
  MatrixNx6 local_3380;
  undefined1 local_3080 [8];
  Transpose<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> TStack_3078;
  assign_op<double,_double> *paStack_3070;
  variable_if_dynamic<long,__1> vStack_3068;
  variable_if_dynamic<long,__1> vStack_3060;
  long lStack_3058;
  Matrix<double,_16,_6,_1,_16,_6> *pMStack_3050;
  undefined1 local_2dc0 [11664];
  
  local_6210 = Rfactor;
  local_6150 = Kfactor;
  dStack_6148 = in_XMM0_Qb;
  CalcCombinedCoordMatrix(this,&local_3380);
  if (((H->
       super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
       ).
       super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
       .
       super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
       .m_cols.m_value |
      (H->
      super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
      ).
      super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
      .
      super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
      .m_rows.m_value) < 0) {
    __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                  ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,
                  "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, -1, 1>]"
                 );
  }
  TStack_3078.m_matrix = (non_const_type)local_5b40;
  local_5b40._0_8_ = (double *)0x0;
  local_4e00._0_8_ =
       (H->
       super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
       ).
       super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
       .
       super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
       .m_data;
  local_3080 = (undefined1  [8])local_4e00;
  local_4e00._16_8_ =
       (H->
       super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
       ).m_stride.m_outer.m_value;
  paStack_3070 = (assign_op<double,_double> *)local_63a0;
  vStack_3068.m_value = (long)H;
  Eigen::internal::
  dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>_>,_Eigen::internal::evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>_>,_Eigen::internal::assign_op<double,_double>,_0>,_4,_0>
  ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>,_Eigen::internal::evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
         *)local_3080);
  if (0 < this->m_numLayers) {
    local_6218 = (assign_op<double,_double> *)&this->m_SD;
    auVar4._8_8_ = 0;
    auVar4._0_8_ = local_6150;
    local_3c00 = vbroadcastsd_avx512f(auVar4);
    local_6464 = 0x40;
    local_6468 = 0x20;
    local_6490 = 0;
    lVar85 = 0;
    do {
      if ((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
          m_rows < 0x10) {
LAB_0078ef84:
        __function = 
        "Eigen::Block<Eigen::Matrix<double, -1, -1, 1>, 16, 96>::Block(XprType &, Index, Index) [XprType = Eigen::Matrix<double, -1, -1, 1>, BlockRows = 16, BlockCols = 96, InnerPanel = false]"
        ;
LAB_0078ef10:
        __assert_fail("startRow >= 0 && BlockRows >= 0 && startRow + BlockRows <= xpr.rows() && startCol >= 0 && BlockCols >= 0 && startCol + BlockCols <= xpr.cols()"
                      ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x85,__function);
      }
      uVar75 = (int)lVar85 * 0x60;
      uVar102 = CONCAT44(0,uVar75);
      lVar91 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
               m_storage.m_cols;
      if (lVar91 < (long)(uVar102 + 0x60)) goto LAB_0078ef84;
      local_3080 = (undefined1  [8])(*(long *)local_6218 + uVar102 * 8);
      paStack_3070 = local_6218;
      vStack_3068.m_value = 0;
      local_6408 = lVar85;
      local_6208 = (double)(uVar102 + 0x60);
      vStack_3060.m_value = uVar102;
      lStack_3058 = lVar91;
      pMStack_3050 = &local_3380;
      memset((Matrix<double,_96,_6,_0,_96,_6> *)local_4e00,0,0x1200);
      local_5b40._0_8_ = (double *)0x3ff0000000000000;
      Eigen::internal::
      generic_product_impl<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,16,96,false>>,Eigen::Matrix<double,16,6,1,16,6>,Eigen::DenseShape,Eigen::DenseShape,8>
      ::scaleAndAddTo<Eigen::Matrix<double,96,6,0,96,6>>
                ((Matrix<double,_96,_6,_0,_96,_6> *)local_4e00,
                 (Transpose<Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_16,_96,_false>_>
                  *)local_3080,&local_3380,(Scalar *)local_5b40);
      local_6420.m_cols = 0;
      local_6420.m_data = (double *)0x0;
      local_6420.m_rows = 0;
      Eigen::DenseStorage<double,_-1,_-1,_-1,_1>::resize(&local_6420,0x2400,0x30,0xc0);
      auVar113 = local_61c0;
      auVar117 = local_6200;
      lVar83 = (long)local_6464;
      lVar84 = (long)local_6468;
      local_6400._0_8_ = uVar102;
      lVar89 = (long)(int)uVar75;
      lVar85 = lVar89 + 0x20;
      local_6280._0_8_ = local_6420.m_rows;
      iVar82 = uVar75 + 0x20;
      local_61c0._0_4_ = iVar82;
      lVar93 = (long)iVar82;
      lVar91 = lVar93 + 0x20;
      iVar88 = uVar75 + 0x40;
      pauVar92 = (undefined1 (*) [64])(local_6420.m_data + 0xb8);
      local_6140._0_8_ = local_6420.m_cols * 0x18;
      lVar107 = local_6420.m_cols * 0x10;
      local_6200._0_4_ = iVar88;
      lVar90 = (long)iVar88;
      lVar95 = lVar90 + 0x20;
      lVar99 = 0;
      lVar94 = 0;
      do {
        if (((((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
               m_storage.m_rows <= lVar94) ||
             (lVar97 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                       .m_storage.m_cols, lVar97 < lVar85)) || (local_6420.m_rows <= lVar99)) ||
           (local_6420.m_cols < 0x20)) goto LAB_0078eefb;
        pdVar100 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                   m_storage.m_data;
        lVar97 = lVar97 * lVar94;
        auVar109._8_8_ = local_4e00._8_8_;
        auVar109._0_8_ = local_4e00._0_8_;
        auVar109._16_8_ = local_4e00._16_8_;
        auVar109._24_40_ = local_4e00._24_40_;
        auVar109 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar100 + lVar89 + lVar97),auVar109);
        pauVar92[-0x17] = auVar109;
        auVar109 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar100 + lVar89 + lVar97 + 8),local_4dc0)
        ;
        pauVar92[-0x16] = auVar109;
        auVar109 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar100 + lVar89 + lVar97 + 0x10),
                                  local_4d80);
        pauVar92[-0x15] = auVar109;
        auVar109 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar100 + lVar89 + lVar97 + 0x18),
                                  local_4d40);
        pauVar92[-0x14] = auVar109;
        if (((iVar82 < 0) ||
            ((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage
             .m_rows <= lVar94)) ||
           ((lVar97 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                      m_storage.m_cols, lVar97 < lVar91 || (local_6420.m_cols < 0x40))))
        goto LAB_0078eefb;
        pdVar100 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                   m_storage.m_data;
        lVar97 = lVar97 * lVar94;
        auVar109 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar100 + lVar93 + lVar97),local_4d00);
        pauVar92[-0x13] = auVar109;
        auVar109 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar100 + lVar93 + lVar97 + 8),local_4cc0)
        ;
        pauVar92[-0x12] = auVar109;
        auVar109 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar100 + lVar93 + lVar97 + 0x10),
                                  local_4c80);
        pauVar92[-0x11] = auVar109;
        auVar109 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar100 + lVar93 + lVar97 + 0x18),
                                  local_4c40);
        pauVar92[-0x10] = auVar109;
        if (((iVar88 < 0) ||
            ((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage
             .m_rows <= lVar94)) ||
           ((lVar97 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                      m_storage.m_cols, lVar97 < lVar95 || (local_6420.m_cols < 0x60))))
        goto LAB_0078eefb;
        pdVar100 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                   m_storage.m_data;
        lVar97 = lVar97 * lVar94;
        auVar109 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar100 + lVar90 + lVar97),local_4c00);
        pauVar92[-0xf] = auVar109;
        auVar109 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar100 + lVar90 + lVar97 + 8),local_4bc0)
        ;
        pauVar92[-0xe] = auVar109;
        auVar109 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar100 + lVar90 + lVar97 + 0x10),
                                  local_4b80);
        pauVar92[-0xd] = auVar109;
        auVar109 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar100 + lVar90 + lVar97 + 0x18),
                                  local_4b40);
        pauVar92[-0xc] = auVar109;
        if (((((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
               m_storage.m_rows <= lVar94) ||
             (lVar97 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                       .m_storage.m_cols, lVar97 < lVar95)) || (lVar97 < lVar91)) ||
           (local_6420.m_cols < 0x80)) goto LAB_0078eefb;
        pdVar100 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                   m_storage.m_data;
        lVar97 = lVar97 * lVar94;
        auVar109 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar100 + lVar90 + lVar97),local_4d00);
        auVar110 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar100 + lVar93 + lVar97),local_4c00);
        auVar109 = vaddpd_avx512f(auVar109,auVar110);
        pauVar92[-0xb] = auVar109;
        auVar109 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar100 + lVar90 + lVar97 + 8),local_4cc0)
        ;
        auVar110 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar100 + lVar93 + lVar97 + 8),local_4bc0)
        ;
        auVar109 = vaddpd_avx512f(auVar109,auVar110);
        pauVar92[-10] = auVar109;
        auVar109 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar100 + lVar90 + lVar97 + 0x10),
                                  local_4c80);
        auVar110 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar100 + lVar93 + lVar97 + 0x10),
                                  local_4b80);
        auVar109 = vaddpd_avx512f(auVar109,auVar110);
        pauVar92[-9] = auVar109;
        auVar109 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar100 + lVar90 + lVar97 + 0x18),
                                  local_4c40);
        auVar110 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar100 + lVar93 + lVar97 + 0x18),
                                  local_4b40);
        auVar109 = vaddpd_avx512f(auVar109,auVar110);
        pauVar92[-8] = auVar109;
        if ((((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
              m_storage.m_rows <= lVar94) ||
            (lVar97 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                      m_storage.m_cols, lVar97 < lVar95)) ||
           ((lVar97 < lVar85 || (local_6420.m_cols < 0xa0)))) goto LAB_0078eefb;
        pdVar100 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                   m_storage.m_data;
        lVar97 = lVar97 * lVar94;
        auVar110._8_8_ = local_4e00._8_8_;
        auVar110._0_8_ = local_4e00._0_8_;
        auVar110._16_8_ = local_4e00._16_8_;
        auVar110._24_40_ = local_4e00._24_40_;
        auVar109 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar100 + lVar90 + lVar97),auVar110);
        auVar110 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar100 + lVar89 + lVar97),local_4c00);
        auVar109 = vaddpd_avx512f(auVar109,auVar110);
        pauVar92[-7] = auVar109;
        auVar109 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar100 + lVar90 + lVar97 + 8),local_4dc0)
        ;
        auVar110 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar100 + lVar89 + lVar97 + 8),local_4bc0)
        ;
        auVar109 = vaddpd_avx512f(auVar109,auVar110);
        pauVar92[-6] = auVar109;
        auVar109 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar100 + lVar90 + lVar97 + 0x10),
                                  local_4d80);
        auVar110 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar100 + lVar89 + lVar97 + 0x10),
                                  local_4b80);
        auVar109 = vaddpd_avx512f(auVar109,auVar110);
        pauVar92[-5] = auVar109;
        auVar109 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar100 + lVar90 + lVar97 + 0x18),
                                  local_4d40);
        auVar110 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar100 + lVar89 + lVar97 + 0x18),
                                  local_4b40);
        auVar109 = vaddpd_avx512f(auVar109,auVar110);
        pauVar92[-4] = auVar109;
        if ((((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
              m_storage.m_rows <= lVar94) ||
            (lVar97 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                      m_storage.m_cols, lVar97 < lVar91)) ||
           ((lVar97 < lVar85 || (local_6420.m_cols < 0xc0)))) goto LAB_0078eefb;
        pdVar100 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                   m_storage.m_data;
        lVar97 = lVar97 * lVar94;
        auVar111._8_8_ = local_4e00._8_8_;
        auVar111._0_8_ = local_4e00._0_8_;
        auVar111._16_8_ = local_4e00._16_8_;
        auVar111._24_40_ = local_4e00._24_40_;
        auVar109 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar100 + lVar93 + lVar97),auVar111);
        auVar110 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar100 + lVar89 + lVar97),local_4d00);
        auVar109 = vaddpd_avx512f(auVar109,auVar110);
        pauVar92[-3] = auVar109;
        auVar109 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar100 + lVar93 + lVar97 + 8),local_4dc0)
        ;
        auVar110 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar100 + lVar89 + lVar97 + 8),local_4cc0)
        ;
        auVar109 = vaddpd_avx512f(auVar109,auVar110);
        pauVar92[-2] = auVar109;
        auVar109 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar100 + lVar93 + lVar97 + 0x10),
                                  local_4d80);
        auVar110 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar100 + lVar89 + lVar97 + 0x10),
                                  local_4c80);
        auVar109 = vaddpd_avx512f(auVar109,auVar110);
        pauVar92[-1] = auVar109;
        auVar109 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar100 + lVar93 + lVar97 + 0x18),
                                  local_4d40);
        auVar110 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar100 + lVar89 + lVar97 + 0x18),
                                  local_4c40);
        auVar109 = vaddpd_avx512f(auVar109,auVar110);
        *pauVar92 = auVar109;
        if ((((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
              m_storage.m_rows <= lVar94) ||
            (lVar97 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                      m_storage.m_cols, lVar97 < lVar85)) || (local_6420.m_rows <= lVar99 + 1))
        goto LAB_0078eefb;
        pdVar100 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                   m_storage.m_data;
        lVar97 = lVar97 * lVar94;
        auVar109 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar100 + lVar89 + lVar97),local_4b00);
        *(undefined1 (*) [64])(pauVar92[-0x17] + local_6420.m_cols * 8) = auVar109;
        auVar109 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar100 + lVar89 + lVar97 + 8),local_4ac0)
        ;
        *(undefined1 (*) [64])(pauVar92[-0x16] + local_6420.m_cols * 8) = auVar109;
        auVar109 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar100 + lVar89 + lVar97 + 0x10),
                                  local_4a80);
        *(undefined1 (*) [64])(pauVar92[-0x15] + local_6420.m_cols * 8) = auVar109;
        auVar109 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar100 + lVar89 + lVar97 + 0x18),
                                  local_4a40);
        *(undefined1 (*) [64])(pauVar92[-0x14] + local_6420.m_cols * 8) = auVar109;
        if (((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage
             .m_rows <= lVar94) ||
           (lVar97 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                     m_storage.m_cols, lVar97 < lVar91)) goto LAB_0078eefb;
        pdVar100 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                   m_storage.m_data;
        lVar97 = lVar97 * lVar94;
        auVar109 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar100 + lVar93 + lVar97),local_4a00);
        *(undefined1 (*) [64])(pauVar92[-0x13] + local_6420.m_cols * 8) = auVar109;
        auVar109 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar100 + lVar93 + lVar97 + 8),local_49c0)
        ;
        *(undefined1 (*) [64])(pauVar92[-0x12] + local_6420.m_cols * 8) = auVar109;
        auVar109 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar100 + lVar93 + lVar97 + 0x10),
                                  local_4980);
        *(undefined1 (*) [64])(pauVar92[-0x11] + local_6420.m_cols * 8) = auVar109;
        auVar109 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar100 + lVar93 + lVar97 + 0x18),
                                  local_4940);
        *(undefined1 (*) [64])(pauVar92[-0x10] + local_6420.m_cols * 8) = auVar109;
        if (((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage
             .m_rows <= lVar94) ||
           (lVar97 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                     m_storage.m_cols, lVar97 < lVar95)) goto LAB_0078eefb;
        pdVar100 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                   m_storage.m_data;
        lVar97 = lVar97 * lVar94;
        auVar109 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar100 + lVar90 + lVar97),local_4900);
        *(undefined1 (*) [64])(pauVar92[-0xf] + local_6420.m_cols * 8) = auVar109;
        auVar109 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar100 + lVar90 + lVar97 + 8),local_48c0)
        ;
        *(undefined1 (*) [64])(pauVar92[-0xe] + local_6420.m_cols * 8) = auVar109;
        auVar109 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar100 + lVar90 + lVar97 + 0x10),
                                  local_4880);
        *(undefined1 (*) [64])(pauVar92[-0xd] + local_6420.m_cols * 8) = auVar109;
        auVar109 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar100 + lVar90 + lVar97 + 0x18),
                                  local_4840);
        *(undefined1 (*) [64])(pauVar92[-0xc] + local_6420.m_cols * 8) = auVar109;
        if ((((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
              m_storage.m_rows <= lVar94) ||
            (lVar97 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                      m_storage.m_cols, lVar97 < lVar95)) || (lVar97 < lVar91)) goto LAB_0078eefb;
        pdVar100 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                   m_storage.m_data;
        lVar97 = lVar97 * lVar94;
        auVar109 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar100 + lVar90 + lVar97),local_4a00);
        auVar110 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar100 + lVar93 + lVar97),local_4900);
        auVar109 = vaddpd_avx512f(auVar109,auVar110);
        *(undefined1 (*) [64])(pauVar92[-0xb] + local_6420.m_cols * 8) = auVar109;
        auVar109 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar100 + lVar90 + lVar97 + 8),local_49c0)
        ;
        auVar110 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar100 + lVar93 + lVar97 + 8),local_48c0)
        ;
        auVar109 = vaddpd_avx512f(auVar109,auVar110);
        *(undefined1 (*) [64])(pauVar92[-10] + local_6420.m_cols * 8) = auVar109;
        auVar109 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar100 + lVar90 + lVar97 + 0x10),
                                  local_4980);
        auVar110 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar100 + lVar93 + lVar97 + 0x10),
                                  local_4880);
        auVar109 = vaddpd_avx512f(auVar109,auVar110);
        *(undefined1 (*) [64])(pauVar92[-9] + local_6420.m_cols * 8) = auVar109;
        auVar109 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar100 + lVar90 + lVar97 + 0x18),
                                  local_4940);
        auVar110 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar100 + lVar93 + lVar97 + 0x18),
                                  local_4840);
        auVar109 = vaddpd_avx512f(auVar109,auVar110);
        *(undefined1 (*) [64])(pauVar92[-8] + local_6420.m_cols * 8) = auVar109;
        if ((((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
              m_storage.m_rows <= lVar94) ||
            (lVar97 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                      m_storage.m_cols, lVar97 < lVar95)) || (lVar97 < lVar85)) goto LAB_0078eefb;
        pdVar100 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                   m_storage.m_data;
        lVar97 = lVar97 * lVar94;
        auVar109 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar100 + lVar90 + lVar97),local_4b00);
        auVar110 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar100 + lVar89 + lVar97),local_4900);
        auVar109 = vaddpd_avx512f(auVar109,auVar110);
        *(undefined1 (*) [64])(pauVar92[-7] + local_6420.m_cols * 8) = auVar109;
        auVar109 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar100 + lVar90 + lVar97 + 8),local_4ac0)
        ;
        auVar110 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar100 + lVar89 + lVar97 + 8),local_48c0)
        ;
        auVar109 = vaddpd_avx512f(auVar109,auVar110);
        *(undefined1 (*) [64])(pauVar92[-6] + local_6420.m_cols * 8) = auVar109;
        auVar109 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar100 + lVar90 + lVar97 + 0x10),
                                  local_4a80);
        auVar110 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar100 + lVar89 + lVar97 + 0x10),
                                  local_4880);
        auVar109 = vaddpd_avx512f(auVar109,auVar110);
        *(undefined1 (*) [64])(pauVar92[-5] + local_6420.m_cols * 8) = auVar109;
        auVar109 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar100 + lVar90 + lVar97 + 0x18),
                                  local_4a40);
        auVar110 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar100 + lVar89 + lVar97 + 0x18),
                                  local_4840);
        auVar109 = vaddpd_avx512f(auVar109,auVar110);
        *(undefined1 (*) [64])(pauVar92[-4] + local_6420.m_cols * 8) = auVar109;
        if ((((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
              m_storage.m_rows <= lVar94) ||
            (lVar97 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                      m_storage.m_cols, lVar97 < lVar91)) || (lVar97 < lVar85)) goto LAB_0078eefb;
        pdVar100 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                   m_storage.m_data;
        lVar97 = lVar97 * lVar94;
        auVar109 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar100 + lVar93 + lVar97),local_4b00);
        auVar110 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar100 + lVar89 + lVar97),local_4a00);
        auVar109 = vaddpd_avx512f(auVar109,auVar110);
        *(undefined1 (*) [64])(pauVar92[-3] + local_6420.m_cols * 8) = auVar109;
        auVar109 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar100 + lVar93 + lVar97 + 8),local_4ac0)
        ;
        auVar110 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar100 + lVar89 + lVar97 + 8),local_49c0)
        ;
        auVar109 = vaddpd_avx512f(auVar109,auVar110);
        *(undefined1 (*) [64])(pauVar92[-2] + local_6420.m_cols * 8) = auVar109;
        auVar109 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar100 + lVar93 + lVar97 + 0x10),
                                  local_4a80);
        auVar110 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar100 + lVar89 + lVar97 + 0x10),
                                  local_4980);
        auVar109 = vaddpd_avx512f(auVar109,auVar110);
        *(undefined1 (*) [64])(pauVar92[-1] + local_6420.m_cols * 8) = auVar109;
        auVar109 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar100 + lVar93 + lVar97 + 0x18),
                                  local_4a40);
        auVar110 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar100 + lVar89 + lVar97 + 0x18),
                                  local_4940);
        auVar109 = vaddpd_avx512f(auVar109,auVar110);
        *(undefined1 (*) [64])(*pauVar92 + local_6420.m_cols * 8) = auVar109;
        if ((((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
              m_storage.m_rows <= lVar94) ||
            (lVar97 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                      m_storage.m_cols, lVar97 < lVar85)) || (local_6420.m_rows <= lVar99 + 2))
        goto LAB_0078eefb;
        pdVar100 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                   m_storage.m_data;
        lVar97 = lVar97 * lVar94;
        auVar109 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar100 + lVar89 + lVar97),local_4800);
        *(undefined1 (*) [64])(pauVar92[-0x17] + lVar107) = auVar109;
        auVar109 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar100 + lVar89 + lVar97 + 8),local_47c0)
        ;
        *(undefined1 (*) [64])(pauVar92[-0x16] + lVar107) = auVar109;
        auVar109 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar100 + lVar89 + lVar97 + 0x10),
                                  local_4780);
        *(undefined1 (*) [64])(pauVar92[-0x15] + lVar107) = auVar109;
        auVar109 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar100 + lVar89 + lVar97 + 0x18),
                                  local_4740);
        *(undefined1 (*) [64])(pauVar92[-0x14] + lVar107) = auVar109;
        if (((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage
             .m_rows <= lVar94) ||
           (lVar97 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                     m_storage.m_cols, lVar97 < lVar91)) goto LAB_0078eefb;
        pdVar100 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                   m_storage.m_data;
        lVar97 = lVar97 * lVar94;
        auVar109 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar100 + lVar93 + lVar97),local_4700);
        *(undefined1 (*) [64])(pauVar92[-0x13] + lVar107) = auVar109;
        auVar109 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar100 + lVar93 + lVar97 + 8),local_46c0)
        ;
        *(undefined1 (*) [64])(pauVar92[-0x12] + lVar107) = auVar109;
        auVar109 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar100 + lVar93 + lVar97 + 0x10),
                                  local_4680);
        *(undefined1 (*) [64])(pauVar92[-0x11] + lVar107) = auVar109;
        auVar109 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar100 + lVar93 + lVar97 + 0x18),
                                  local_4640);
        *(undefined1 (*) [64])(pauVar92[-0x10] + lVar107) = auVar109;
        if (((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage
             .m_rows <= lVar94) ||
           (lVar97 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                     m_storage.m_cols, lVar97 < lVar95)) goto LAB_0078eefb;
        pdVar100 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                   m_storage.m_data;
        lVar97 = lVar97 * lVar94;
        auVar109 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar100 + lVar90 + lVar97),local_4600);
        *(undefined1 (*) [64])(pauVar92[-0xf] + lVar107) = auVar109;
        auVar109 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar100 + lVar90 + lVar97 + 8),local_45c0)
        ;
        *(undefined1 (*) [64])(pauVar92[-0xe] + lVar107) = auVar109;
        auVar109 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar100 + lVar90 + lVar97 + 0x10),
                                  local_4580);
        *(undefined1 (*) [64])(pauVar92[-0xd] + lVar107) = auVar109;
        auVar109 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar100 + lVar90 + lVar97 + 0x18),
                                  local_4540);
        *(undefined1 (*) [64])(pauVar92[-0xc] + lVar107) = auVar109;
        if ((((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
              m_storage.m_rows <= lVar94) ||
            (lVar97 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                      m_storage.m_cols, lVar97 < lVar95)) || (lVar97 < lVar91)) goto LAB_0078eefb;
        pdVar100 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                   m_storage.m_data;
        lVar97 = lVar97 * lVar94;
        auVar109 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar100 + lVar90 + lVar97),local_4700);
        auVar110 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar100 + lVar93 + lVar97),local_4600);
        auVar109 = vaddpd_avx512f(auVar109,auVar110);
        *(undefined1 (*) [64])(pauVar92[-0xb] + lVar107) = auVar109;
        auVar109 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar100 + lVar90 + lVar97 + 8),local_46c0)
        ;
        auVar110 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar100 + lVar93 + lVar97 + 8),local_45c0)
        ;
        auVar109 = vaddpd_avx512f(auVar109,auVar110);
        *(undefined1 (*) [64])(pauVar92[-10] + lVar107) = auVar109;
        auVar109 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar100 + lVar90 + lVar97 + 0x10),
                                  local_4680);
        auVar110 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar100 + lVar93 + lVar97 + 0x10),
                                  local_4580);
        auVar109 = vaddpd_avx512f(auVar109,auVar110);
        *(undefined1 (*) [64])(pauVar92[-9] + lVar107) = auVar109;
        auVar109 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar100 + lVar90 + lVar97 + 0x18),
                                  local_4640);
        auVar110 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar100 + lVar93 + lVar97 + 0x18),
                                  local_4540);
        auVar109 = vaddpd_avx512f(auVar109,auVar110);
        *(undefined1 (*) [64])(pauVar92[-8] + lVar107) = auVar109;
        if ((((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
              m_storage.m_rows <= lVar94) ||
            (lVar97 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                      m_storage.m_cols, lVar97 < lVar95)) || (lVar97 < lVar85)) goto LAB_0078eefb;
        pdVar100 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                   m_storage.m_data;
        lVar97 = lVar97 * lVar94;
        auVar109 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar100 + lVar90 + lVar97),local_4800);
        auVar110 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar100 + lVar89 + lVar97),local_4600);
        auVar109 = vaddpd_avx512f(auVar109,auVar110);
        *(undefined1 (*) [64])(pauVar92[-7] + lVar107) = auVar109;
        auVar109 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar100 + lVar90 + lVar97 + 8),local_47c0)
        ;
        auVar110 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar100 + lVar89 + lVar97 + 8),local_45c0)
        ;
        auVar109 = vaddpd_avx512f(auVar109,auVar110);
        *(undefined1 (*) [64])(pauVar92[-6] + lVar107) = auVar109;
        auVar109 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar100 + lVar90 + lVar97 + 0x10),
                                  local_4780);
        auVar110 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar100 + lVar89 + lVar97 + 0x10),
                                  local_4580);
        auVar109 = vaddpd_avx512f(auVar109,auVar110);
        *(undefined1 (*) [64])(pauVar92[-5] + lVar107) = auVar109;
        auVar109 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar100 + lVar90 + lVar97 + 0x18),
                                  local_4740);
        auVar110 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar100 + lVar89 + lVar97 + 0x18),
                                  local_4540);
        auVar109 = vaddpd_avx512f(auVar109,auVar110);
        *(undefined1 (*) [64])(pauVar92[-4] + lVar107) = auVar109;
        if ((((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
              m_storage.m_rows <= lVar94) ||
            (lVar97 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                      m_storage.m_cols, lVar97 < lVar91)) || (lVar97 < lVar85)) goto LAB_0078eefb;
        pdVar100 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                   m_storage.m_data;
        lVar97 = lVar97 * lVar94;
        auVar109 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar100 + lVar93 + lVar97),local_4800);
        auVar110 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar100 + lVar89 + lVar97),local_4700);
        auVar109 = vaddpd_avx512f(auVar109,auVar110);
        *(undefined1 (*) [64])(pauVar92[-3] + lVar107) = auVar109;
        auVar109 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar100 + lVar93 + lVar97 + 8),local_47c0)
        ;
        auVar110 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar100 + lVar89 + lVar97 + 8),local_46c0)
        ;
        auVar109 = vaddpd_avx512f(auVar109,auVar110);
        *(undefined1 (*) [64])(pauVar92[-2] + lVar107) = auVar109;
        auVar109 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar100 + lVar93 + lVar97 + 0x10),
                                  local_4780);
        auVar110 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar100 + lVar89 + lVar97 + 0x10),
                                  local_4680);
        auVar109 = vaddpd_avx512f(auVar109,auVar110);
        *(undefined1 (*) [64])(pauVar92[-1] + lVar107) = auVar109;
        auVar109 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar100 + lVar93 + lVar97 + 0x18),
                                  local_4740);
        auVar110 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar100 + lVar89 + lVar97 + 0x18),
                                  local_4640);
        auVar109 = vaddpd_avx512f(auVar109,auVar110);
        *(undefined1 (*) [64])(*pauVar92 + lVar107) = auVar109;
        pauVar92 = (undefined1 (*) [64])(*pauVar92 + local_6420.m_cols * 0x18);
        lVar99 = lVar99 + 3;
        lVar94 = lVar94 + 1;
      } while (lVar99 != 0x30);
      auVar140._8_8_ = 0;
      auVar140._0_8_ = this->m_Alpha;
      auVar141._8_8_ = 0;
      auVar141._0_8_ = local_6210;
      auVar81._8_8_ = dStack_6148;
      auVar81._0_8_ = local_6150;
      auVar4 = vfmadd213sd_fma(auVar141,auVar140,auVar81);
      auVar109 = vbroadcastsd_avx512f(auVar4);
      auVar142._8_8_ = 0;
      auVar142._0_8_ = this->m_Alpha * local_6150;
      auVar110 = vbroadcastsd_avx512f(auVar142);
      lVar85 = 0x2c0;
      do {
        auVar111 = vmulpd_avx512f(auVar109,*(undefined1 (*) [64])(local_50c0 + lVar85));
        auVar112 = vmulpd_avx512f(auVar110,*(undefined1 (*) [64])(local_47c0 + lVar85));
        auVar111 = vaddpd_avx512f(auVar111,auVar112);
        *(undefined1 (*) [64])(local_5e00 + lVar85) = auVar111;
        auVar111 = vmulpd_avx512f(auVar109,*(undefined1 (*) [64])(local_5080 + lVar85));
        auVar112 = vmulpd_avx512f(auVar110,*(undefined1 (*) [64])(local_4780 + lVar85));
        auVar111 = vaddpd_avx512f(auVar111,auVar112);
        *(undefined1 (*) [64])(local_5dc0 + lVar85) = auVar111;
        auVar111 = vmulpd_avx512f(auVar109,*(undefined1 (*) [64])(local_5040 + lVar85));
        auVar112 = vmulpd_avx512f(auVar110,*(undefined1 (*) [64])(local_4740 + lVar85));
        auVar111 = vaddpd_avx512f(auVar111,auVar112);
        *(undefined1 (*) [64])(local_5d80 + lVar85) = auVar111;
        auVar111 = vmulpd_avx512f(auVar109,*(undefined1 (*) [64])(local_5000 + lVar85));
        auVar112 = vmulpd_avx512f(auVar110,*(undefined1 (*) [64])(local_4700 + lVar85));
        auVar111 = vaddpd_avx512f(auVar111,auVar112);
        *(undefined1 (*) [64])(local_5d40 + lVar85) = auVar111;
        auVar111 = vmulpd_avx512f(auVar109,*(undefined1 (*) [64])(local_4fc0 + lVar85));
        auVar112 = vmulpd_avx512f(auVar110,*(undefined1 (*) [64])(local_46c0 + lVar85));
        auVar111 = vaddpd_avx512f(auVar111,auVar112);
        *(undefined1 (*) [64])(local_5d00 + lVar85) = auVar111;
        auVar111 = vmulpd_avx512f(auVar109,*(undefined1 (*) [64])(local_4f80 + lVar85));
        auVar112 = vmulpd_avx512f(auVar110,*(undefined1 (*) [64])(local_4680 + lVar85));
        auVar111 = vaddpd_avx512f(auVar111,auVar112);
        *(undefined1 (*) [64])(local_5cc0 + lVar85) = auVar111;
        auVar111 = vmulpd_avx512f(auVar109,*(undefined1 (*) [64])(local_4f40 + lVar85));
        auVar112 = vmulpd_avx512f(auVar110,*(undefined1 (*) [64])(local_4640 + lVar85));
        auVar111 = vaddpd_avx512f(auVar111,auVar112);
        *(undefined1 (*) [64])(local_5c80 + lVar85) = auVar111;
        auVar111 = vmulpd_avx512f(auVar109,*(undefined1 (*) [64])(local_4f00 + lVar85));
        auVar112 = vmulpd_avx512f(auVar110,*(undefined1 (*) [64])(local_4600 + lVar85));
        auVar111 = vaddpd_avx512f(auVar111,auVar112);
        *(undefined1 (*) [64])(local_5c40 + lVar85) = auVar111;
        auVar111 = vmulpd_avx512f(auVar109,*(undefined1 (*) [64])(local_4ec0 + lVar85));
        auVar112 = vmulpd_avx512f(auVar110,*(undefined1 (*) [64])(local_45c0 + lVar85));
        auVar111 = vaddpd_avx512f(auVar111,auVar112);
        *(undefined1 (*) [64])(local_5c00 + lVar85) = auVar111;
        auVar111 = vmulpd_avx512f(auVar109,*(undefined1 (*) [64])(local_4e80 + lVar85));
        auVar112 = vmulpd_avx512f(auVar110,*(undefined1 (*) [64])(local_4580 + lVar85));
        auVar111 = vaddpd_avx512f(auVar111,auVar112);
        *(undefined1 (*) [64])(local_5bc0 + lVar85) = auVar111;
        auVar111 = vmulpd_avx512f(auVar109,*(undefined1 (*) [64])(local_4e40 + lVar85));
        auVar112 = vmulpd_avx512f(auVar110,*(undefined1 (*) [64])(local_4540 + lVar85));
        auVar111 = vaddpd_avx512f(auVar111,auVar112);
        *(undefined1 (*) [64])(local_5b80 + lVar85) = auVar111;
        auVar111 = vmulpd_avx512f(auVar109,*(undefined1 (*) [64])(local_4e00 + lVar85));
        auVar112 = vmulpd_avx512f(auVar110,*(undefined1 (*) [64])(local_4500 + lVar85));
        auVar111 = vaddpd_avx512f(auVar111,auVar112);
        *(undefined1 (*) [64])(local_5b40 + lVar85) = auVar111;
        lVar85 = lVar85 + 0x300;
      } while (lVar85 != 0xbc0);
      lVar85 = local_6408 * 0x20 + 0x20;
      if (((this->m_kGQ).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
           m_rows < lVar85) ||
         ((this->m_kGQ).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
          m_cols < 1)) {
LAB_0078ef4b:
        __function = 
        "Eigen::Block<Eigen::Matrix<double, -1, -1>, 32, 1>::Block(XprType &, Index, Index) [XprType = Eigen::Matrix<double, -1, -1>, BlockRows = 32, BlockCols = 1, InnerPanel = false]"
        ;
        goto LAB_0078ef10;
      }
      pdVar100 = (this->m_kGQ).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_data;
      lVar91 = 0x2c0;
      do {
        auVar109 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar100 + local_6408 * 0x20),
                                  *(undefined1 (*) [64])(local_5e00 + lVar91));
        *(undefined1 (*) [64])(local_5e00 + lVar91) = auVar109;
        auVar109 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar100 + local_6408 * 0x20 + 8),
                                  *(undefined1 (*) [64])(local_5dc0 + lVar91));
        *(undefined1 (*) [64])(local_5dc0 + lVar91) = auVar109;
        auVar109 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar100 + local_6408 * 0x20 + 0x10),
                                  *(undefined1 (*) [64])(local_5d80 + lVar91));
        *(undefined1 (*) [64])(local_5d80 + lVar91) = auVar109;
        auVar109 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar100 + local_6408 * 0x20 + 0x18),
                                  *(undefined1 (*) [64])(local_5d40 + lVar91));
        *(undefined1 (*) [64])(local_5d40 + lVar91) = auVar109;
        auVar109 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar100 + local_6408 * 0x20),
                                  *(undefined1 (*) [64])(local_5d00 + lVar91));
        *(undefined1 (*) [64])(local_5d00 + lVar91) = auVar109;
        auVar109 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar100 + local_6408 * 0x20 + 8),
                                  *(undefined1 (*) [64])(local_5cc0 + lVar91));
        *(undefined1 (*) [64])(local_5cc0 + lVar91) = auVar109;
        auVar109 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar100 + local_6408 * 0x20 + 0x10),
                                  *(undefined1 (*) [64])(local_5c80 + lVar91));
        *(undefined1 (*) [64])(local_5c80 + lVar91) = auVar109;
        auVar109 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar100 + local_6408 * 0x20 + 0x18),
                                  *(undefined1 (*) [64])(local_5c40 + lVar91));
        *(undefined1 (*) [64])(local_5c40 + lVar91) = auVar109;
        auVar109 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar100 + local_6408 * 0x20),
                                  *(undefined1 (*) [64])(local_5c00 + lVar91));
        *(undefined1 (*) [64])(local_5c00 + lVar91) = auVar109;
        auVar109 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar100 + local_6408 * 0x20 + 8),
                                  *(undefined1 (*) [64])(local_5bc0 + lVar91));
        *(undefined1 (*) [64])(local_5bc0 + lVar91) = auVar109;
        auVar109 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar100 + local_6408 * 0x20 + 0x10),
                                  *(undefined1 (*) [64])(local_5b80 + lVar91));
        *(undefined1 (*) [64])(local_5b80 + lVar91) = auVar109;
        auVar109 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar100 + local_6408 * 0x20 + 0x18),
                                  *(undefined1 (*) [64])(local_5b40 + lVar91));
        *(undefined1 (*) [64])(local_5b40 + lVar91) = auVar109;
        lVar91 = lVar91 + 0x300;
      } while (lVar91 != 0xbc0);
      local_6200._8_56_ = auVar117._8_56_;
      local_6200._0_8_ = lVar85;
      local_61c0._8_56_ = auVar113._8_56_;
      local_61c0._0_8_ = local_6408 * 0x20;
      local_6440.m_data = (double *)0x0;
      local_6440.m_rows = 0;
      local_6440.m_cols = 0;
      Eigen::DenseStorage<double,_-1,_-1,_-1,_1>::resize(&local_6440,0x2400,0x30,0xc0);
      auVar117 = local_6400;
      lVar85 = uVar102 + 0x20;
      lVar89 = (long)(int)(uVar75 + 0x20);
      lVar91 = lVar89 + 0x20;
      lVar93 = (long)(int)(uVar75 + 0x40);
      lVar95 = lVar93 + 0x20;
      pauVar92 = (undefined1 (*) [64])(local_6440.m_data + 0xb8);
      local_6280._0_8_ = local_6440.m_cols * 0x18;
      lVar99 = local_6440.m_cols * 0x10;
      lVar94 = 0;
      lVar90 = 0;
      do {
        if (((((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
               m_storage.m_rows <= lVar90) ||
             (lVar107 = (this->m_SD).
                        super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
                        m_cols, lVar107 < lVar85)) || (local_6440.m_rows <= lVar94)) ||
           (local_6440.m_cols < 0x20)) goto LAB_0078eefb;
        pdVar100 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                   m_storage.m_data;
        lVar107 = lVar107 * lVar90;
        auVar113._8_56_ = local_5b40._8_56_;
        auVar113._0_8_ = local_5b40._0_8_;
        auVar113 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar100 + uVar102 + lVar107),auVar113);
        pauVar92[-0x17] = auVar113;
        auVar113 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar100 + uVar102 + lVar107 + 8),
                                  local_5b00);
        pauVar92[-0x16] = auVar113;
        auVar113 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar100 + uVar102 + lVar107 + 0x10),
                                  local_5ac0);
        pauVar92[-0x15] = auVar113;
        auVar113 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar100 + uVar102 + lVar107 + 0x18),
                                  local_5a80);
        pauVar92[-0x14] = auVar113;
        if ((((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
              m_storage.m_rows <= lVar90) ||
            (lVar107 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                       .m_storage.m_cols, lVar107 < lVar91)) || (local_6440.m_cols < 0x40))
        goto LAB_0078eefb;
        pdVar100 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                   m_storage.m_data;
        lVar107 = lVar107 * lVar90;
        auVar113 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar100 + lVar89 + lVar107),local_5a40);
        pauVar92[-0x13] = auVar113;
        auVar113 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar100 + lVar89 + lVar107 + 8),local_5a00
                                 );
        pauVar92[-0x12] = auVar113;
        auVar113 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar100 + lVar89 + lVar107 + 0x10),
                                  local_59c0);
        pauVar92[-0x11] = auVar113;
        auVar113 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar100 + lVar89 + lVar107 + 0x18),
                                  local_5980);
        pauVar92[-0x10] = auVar113;
        if ((((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
              m_storage.m_rows <= lVar90) ||
            (lVar107 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                       .m_storage.m_cols, lVar107 < lVar95)) || (local_6440.m_cols < 0x60))
        goto LAB_0078eefb;
        pdVar100 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                   m_storage.m_data;
        lVar107 = lVar107 * lVar90;
        auVar113 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar100 + lVar93 + lVar107),local_5940);
        pauVar92[-0xf] = auVar113;
        auVar113 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar100 + lVar93 + lVar107 + 8),local_5900
                                 );
        pauVar92[-0xe] = auVar113;
        auVar113 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar100 + lVar93 + lVar107 + 0x10),
                                  local_58c0);
        pauVar92[-0xd] = auVar113;
        auVar113 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar100 + lVar93 + lVar107 + 0x18),
                                  local_5880);
        pauVar92[-0xc] = auVar113;
        if (((((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
               m_storage.m_rows <= lVar90) ||
             (lVar107 = (this->m_SD).
                        super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
                        m_cols, lVar107 < lVar95)) || (lVar107 < lVar91)) ||
           (local_6440.m_cols < 0x80)) goto LAB_0078eefb;
        pdVar100 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                   m_storage.m_data;
        lVar107 = lVar107 * lVar90;
        auVar113 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar100 + lVar93 + lVar107),local_5a40);
        auVar109 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar100 + lVar89 + lVar107),local_5940);
        auVar113 = vaddpd_avx512f(auVar113,auVar109);
        pauVar92[-0xb] = auVar113;
        auVar113 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar100 + lVar93 + lVar107 + 8),local_5a00
                                 );
        auVar109 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar100 + lVar89 + lVar107 + 8),local_5900
                                 );
        auVar113 = vaddpd_avx512f(auVar113,auVar109);
        pauVar92[-10] = auVar113;
        auVar113 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar100 + lVar93 + lVar107 + 0x10),
                                  local_59c0);
        auVar109 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar100 + lVar89 + lVar107 + 0x10),
                                  local_58c0);
        auVar113 = vaddpd_avx512f(auVar113,auVar109);
        pauVar92[-9] = auVar113;
        auVar113 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar100 + lVar93 + lVar107 + 0x18),
                                  local_5980);
        auVar109 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar100 + lVar89 + lVar107 + 0x18),
                                  local_5880);
        auVar113 = vaddpd_avx512f(auVar113,auVar109);
        pauVar92[-8] = auVar113;
        if ((((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
              m_storage.m_rows <= lVar90) ||
            (lVar107 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                       .m_storage.m_cols, lVar107 < lVar95)) ||
           ((lVar107 < lVar85 || (local_6440.m_cols < 0xa0)))) goto LAB_0078eefb;
        pdVar100 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                   m_storage.m_data;
        lVar107 = lVar107 * lVar90;
        auVar112._8_56_ = local_5b40._8_56_;
        auVar112._0_8_ = local_5b40._0_8_;
        auVar113 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar100 + lVar93 + lVar107),auVar112);
        auVar109 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar100 + local_6400._0_8_ + lVar107),
                                  local_5940);
        auVar113 = vaddpd_avx512f(auVar113,auVar109);
        pauVar92[-7] = auVar113;
        auVar113 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar100 + lVar93 + lVar107 + 8),local_5b00
                                 );
        auVar109 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar100 + local_6400._0_8_ + lVar107 + 8),
                                  local_5900);
        auVar113 = vaddpd_avx512f(auVar113,auVar109);
        pauVar92[-6] = auVar113;
        auVar113 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar100 + lVar93 + lVar107 + 0x10),
                                  local_5ac0);
        auVar109 = vmulpd_avx512f(*(undefined1 (*) [64])
                                   (pdVar100 + local_6400._0_8_ + lVar107 + 0x10),local_58c0);
        auVar113 = vaddpd_avx512f(auVar113,auVar109);
        pauVar92[-5] = auVar113;
        auVar113 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar100 + lVar93 + lVar107 + 0x18),
                                  local_5a80);
        auVar109 = vmulpd_avx512f(*(undefined1 (*) [64])
                                   (pdVar100 + local_6400._0_8_ + lVar107 + 0x18),local_5880);
        auVar113 = vaddpd_avx512f(auVar113,auVar109);
        pauVar92[-4] = auVar113;
        if (((((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
               m_storage.m_rows <= lVar90) ||
             (lVar107 = (this->m_SD).
                        super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
                        m_cols, lVar107 < lVar91)) || (lVar107 < lVar85)) ||
           (local_6440.m_cols < 0xc0)) goto LAB_0078eefb;
        pdVar100 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                   m_storage.m_data;
        lVar107 = lVar107 * lVar90;
        auVar114._8_56_ = local_5b40._8_56_;
        auVar114._0_8_ = local_5b40._0_8_;
        auVar113 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar100 + lVar89 + lVar107),auVar114);
        auVar109 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar100 + local_6400._0_8_ + lVar107),
                                  local_5a40);
        auVar113 = vaddpd_avx512f(auVar113,auVar109);
        pauVar92[-3] = auVar113;
        auVar113 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar100 + lVar89 + lVar107 + 8),local_5b00
                                 );
        auVar109 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar100 + local_6400._0_8_ + lVar107 + 8),
                                  local_5a00);
        auVar113 = vaddpd_avx512f(auVar113,auVar109);
        pauVar92[-2] = auVar113;
        auVar113 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar100 + lVar89 + lVar107 + 0x10),
                                  local_5ac0);
        auVar109 = vmulpd_avx512f(*(undefined1 (*) [64])
                                   (pdVar100 + local_6400._0_8_ + lVar107 + 0x10),local_59c0);
        auVar113 = vaddpd_avx512f(auVar113,auVar109);
        pauVar92[-1] = auVar113;
        auVar113 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar100 + lVar89 + lVar107 + 0x18),
                                  local_5a80);
        auVar109 = vmulpd_avx512f(*(undefined1 (*) [64])
                                   (pdVar100 + local_6400._0_8_ + lVar107 + 0x18),local_5980);
        auVar113 = vaddpd_avx512f(auVar113,auVar109);
        *pauVar92 = auVar113;
        if ((((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
              m_storage.m_rows <= lVar90) ||
            (lVar107 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                       .m_storage.m_cols, lVar107 < lVar85)) || (local_6440.m_rows <= lVar94 + 1))
        goto LAB_0078eefb;
        pdVar100 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                   m_storage.m_data;
        lVar107 = lVar107 * lVar90;
        auVar113 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar100 + uVar102 + lVar107),local_5840);
        *(undefined1 (*) [64])(pauVar92[-0x17] + local_6440.m_cols * 8) = auVar113;
        auVar113 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar100 + uVar102 + lVar107 + 8),
                                  local_5800);
        *(undefined1 (*) [64])(pauVar92[-0x16] + local_6440.m_cols * 8) = auVar113;
        auVar113 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar100 + uVar102 + lVar107 + 0x10),
                                  local_57c0);
        *(undefined1 (*) [64])(pauVar92[-0x15] + local_6440.m_cols * 8) = auVar113;
        auVar113 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar100 + uVar102 + lVar107 + 0x18),
                                  local_5780);
        *(undefined1 (*) [64])(pauVar92[-0x14] + local_6440.m_cols * 8) = auVar113;
        if (((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage
             .m_rows <= lVar90) ||
           (lVar107 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                      m_storage.m_cols, lVar107 < lVar91)) goto LAB_0078eefb;
        pdVar100 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                   m_storage.m_data;
        lVar107 = lVar107 * lVar90;
        auVar113 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar100 + lVar89 + lVar107),local_5740);
        *(undefined1 (*) [64])(pauVar92[-0x13] + local_6440.m_cols * 8) = auVar113;
        auVar113 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar100 + lVar89 + lVar107 + 8),local_5700
                                 );
        *(undefined1 (*) [64])(pauVar92[-0x12] + local_6440.m_cols * 8) = auVar113;
        auVar113 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar100 + lVar89 + lVar107 + 0x10),
                                  local_56c0);
        *(undefined1 (*) [64])(pauVar92[-0x11] + local_6440.m_cols * 8) = auVar113;
        auVar113 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar100 + lVar89 + lVar107 + 0x18),
                                  local_5680);
        *(undefined1 (*) [64])(pauVar92[-0x10] + local_6440.m_cols * 8) = auVar113;
        if (((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage
             .m_rows <= lVar90) ||
           (lVar107 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                      m_storage.m_cols, lVar107 < lVar95)) goto LAB_0078eefb;
        pdVar100 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                   m_storage.m_data;
        lVar107 = lVar107 * lVar90;
        auVar113 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar100 + lVar93 + lVar107),local_5640);
        *(undefined1 (*) [64])(pauVar92[-0xf] + local_6440.m_cols * 8) = auVar113;
        auVar113 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar100 + lVar93 + lVar107 + 8),local_5600
                                 );
        *(undefined1 (*) [64])(pauVar92[-0xe] + local_6440.m_cols * 8) = auVar113;
        auVar113 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar100 + lVar93 + lVar107 + 0x10),
                                  local_55c0);
        *(undefined1 (*) [64])(pauVar92[-0xd] + local_6440.m_cols * 8) = auVar113;
        auVar113 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar100 + lVar93 + lVar107 + 0x18),
                                  local_5580);
        *(undefined1 (*) [64])(pauVar92[-0xc] + local_6440.m_cols * 8) = auVar113;
        if ((((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
              m_storage.m_rows <= lVar90) ||
            (lVar107 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                       .m_storage.m_cols, lVar107 < lVar95)) || (lVar107 < lVar91))
        goto LAB_0078eefb;
        pdVar100 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                   m_storage.m_data;
        lVar107 = lVar107 * lVar90;
        auVar113 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar100 + lVar93 + lVar107),local_5740);
        auVar109 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar100 + lVar89 + lVar107),local_5640);
        auVar113 = vaddpd_avx512f(auVar113,auVar109);
        *(undefined1 (*) [64])(pauVar92[-0xb] + local_6440.m_cols * 8) = auVar113;
        auVar113 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar100 + lVar93 + lVar107 + 8),local_5700
                                 );
        auVar109 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar100 + lVar89 + lVar107 + 8),local_5600
                                 );
        auVar113 = vaddpd_avx512f(auVar113,auVar109);
        *(undefined1 (*) [64])(pauVar92[-10] + local_6440.m_cols * 8) = auVar113;
        auVar113 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar100 + lVar93 + lVar107 + 0x10),
                                  local_56c0);
        auVar109 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar100 + lVar89 + lVar107 + 0x10),
                                  local_55c0);
        auVar113 = vaddpd_avx512f(auVar113,auVar109);
        *(undefined1 (*) [64])(pauVar92[-9] + local_6440.m_cols * 8) = auVar113;
        auVar113 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar100 + lVar93 + lVar107 + 0x18),
                                  local_5680);
        auVar109 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar100 + lVar89 + lVar107 + 0x18),
                                  local_5580);
        auVar113 = vaddpd_avx512f(auVar113,auVar109);
        *(undefined1 (*) [64])(pauVar92[-8] + local_6440.m_cols * 8) = auVar113;
        if ((((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
              m_storage.m_rows <= lVar90) ||
            (lVar107 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                       .m_storage.m_cols, lVar107 < lVar95)) || (lVar107 < lVar85))
        goto LAB_0078eefb;
        pdVar100 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                   m_storage.m_data;
        lVar107 = lVar107 * lVar90;
        auVar113 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar100 + lVar93 + lVar107),local_5840);
        auVar109 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar100 + local_6400._0_8_ + lVar107),
                                  local_5640);
        auVar113 = vaddpd_avx512f(auVar113,auVar109);
        *(undefined1 (*) [64])(pauVar92[-7] + local_6440.m_cols * 8) = auVar113;
        auVar113 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar100 + lVar93 + lVar107 + 8),local_5800
                                 );
        auVar109 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar100 + local_6400._0_8_ + lVar107 + 8),
                                  local_5600);
        auVar113 = vaddpd_avx512f(auVar113,auVar109);
        *(undefined1 (*) [64])(pauVar92[-6] + local_6440.m_cols * 8) = auVar113;
        auVar113 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar100 + lVar93 + lVar107 + 0x10),
                                  local_57c0);
        auVar109 = vmulpd_avx512f(*(undefined1 (*) [64])
                                   (pdVar100 + local_6400._0_8_ + lVar107 + 0x10),local_55c0);
        auVar113 = vaddpd_avx512f(auVar113,auVar109);
        *(undefined1 (*) [64])(pauVar92[-5] + local_6440.m_cols * 8) = auVar113;
        auVar113 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar100 + lVar93 + lVar107 + 0x18),
                                  local_5780);
        auVar109 = vmulpd_avx512f(*(undefined1 (*) [64])
                                   (pdVar100 + local_6400._0_8_ + lVar107 + 0x18),local_5580);
        auVar113 = vaddpd_avx512f(auVar113,auVar109);
        *(undefined1 (*) [64])(pauVar92[-4] + local_6440.m_cols * 8) = auVar113;
        if ((((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
              m_storage.m_rows <= lVar90) ||
            (lVar107 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                       .m_storage.m_cols, lVar107 < lVar91)) || (lVar107 < lVar85))
        goto LAB_0078eefb;
        pdVar100 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                   m_storage.m_data;
        lVar107 = lVar107 * lVar90;
        auVar113 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar100 + lVar89 + lVar107),local_5840);
        auVar109 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar100 + local_6400._0_8_ + lVar107),
                                  local_5740);
        auVar113 = vaddpd_avx512f(auVar113,auVar109);
        *(undefined1 (*) [64])(pauVar92[-3] + local_6440.m_cols * 8) = auVar113;
        auVar113 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar100 + lVar89 + lVar107 + 8),local_5800
                                 );
        auVar109 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar100 + local_6400._0_8_ + lVar107 + 8),
                                  local_5700);
        auVar113 = vaddpd_avx512f(auVar113,auVar109);
        *(undefined1 (*) [64])(pauVar92[-2] + local_6440.m_cols * 8) = auVar113;
        auVar113 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar100 + lVar89 + lVar107 + 0x10),
                                  local_57c0);
        auVar109 = vmulpd_avx512f(*(undefined1 (*) [64])
                                   (pdVar100 + local_6400._0_8_ + lVar107 + 0x10),local_56c0);
        auVar113 = vaddpd_avx512f(auVar113,auVar109);
        *(undefined1 (*) [64])(pauVar92[-1] + local_6440.m_cols * 8) = auVar113;
        auVar113 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar100 + lVar89 + lVar107 + 0x18),
                                  local_5780);
        auVar109 = vmulpd_avx512f(*(undefined1 (*) [64])
                                   (pdVar100 + local_6400._0_8_ + lVar107 + 0x18),local_5680);
        auVar113 = vaddpd_avx512f(auVar113,auVar109);
        *(undefined1 (*) [64])(*pauVar92 + local_6440.m_cols * 8) = auVar113;
        if ((((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
              m_storage.m_rows <= lVar90) ||
            (lVar107 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                       .m_storage.m_cols, lVar107 < lVar85)) || (local_6440.m_rows <= lVar94 + 2))
        goto LAB_0078eefb;
        pdVar100 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                   m_storage.m_data;
        lVar107 = lVar107 * lVar90;
        auVar113 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar100 + uVar102 + lVar107),local_5540);
        *(undefined1 (*) [64])(pauVar92[-0x17] + lVar99) = auVar113;
        auVar113 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar100 + uVar102 + lVar107 + 8),
                                  local_5500);
        *(undefined1 (*) [64])(pauVar92[-0x16] + lVar99) = auVar113;
        auVar113 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar100 + uVar102 + lVar107 + 0x10),
                                  local_54c0);
        *(undefined1 (*) [64])(pauVar92[-0x15] + lVar99) = auVar113;
        auVar113 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar100 + uVar102 + lVar107 + 0x18),
                                  local_5480);
        *(undefined1 (*) [64])(pauVar92[-0x14] + lVar99) = auVar113;
        if (((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage
             .m_rows <= lVar90) ||
           (lVar107 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                      m_storage.m_cols, lVar107 < lVar91)) goto LAB_0078eefb;
        pdVar100 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                   m_storage.m_data;
        lVar107 = lVar107 * lVar90;
        auVar113 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar100 + lVar89 + lVar107),local_5440);
        *(undefined1 (*) [64])(pauVar92[-0x13] + lVar99) = auVar113;
        auVar113 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar100 + lVar89 + lVar107 + 8),local_5400
                                 );
        *(undefined1 (*) [64])(pauVar92[-0x12] + lVar99) = auVar113;
        auVar113 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar100 + lVar89 + lVar107 + 0x10),
                                  local_53c0);
        *(undefined1 (*) [64])(pauVar92[-0x11] + lVar99) = auVar113;
        auVar113 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar100 + lVar89 + lVar107 + 0x18),
                                  local_5380);
        *(undefined1 (*) [64])(pauVar92[-0x10] + lVar99) = auVar113;
        if (((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage
             .m_rows <= lVar90) ||
           (lVar107 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                      m_storage.m_cols, lVar107 < lVar95)) goto LAB_0078eefb;
        pdVar100 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                   m_storage.m_data;
        lVar107 = lVar107 * lVar90;
        auVar113 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar100 + lVar93 + lVar107),local_5340);
        *(undefined1 (*) [64])(pauVar92[-0xf] + lVar99) = auVar113;
        auVar113 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar100 + lVar93 + lVar107 + 8),local_5300
                                 );
        *(undefined1 (*) [64])(pauVar92[-0xe] + lVar99) = auVar113;
        auVar113 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar100 + lVar93 + lVar107 + 0x10),
                                  local_52c0);
        *(undefined1 (*) [64])(pauVar92[-0xd] + lVar99) = auVar113;
        auVar113 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar100 + lVar93 + lVar107 + 0x18),
                                  local_5280);
        *(undefined1 (*) [64])(pauVar92[-0xc] + lVar99) = auVar113;
        if ((((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
              m_storage.m_rows <= lVar90) ||
            (lVar107 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                       .m_storage.m_cols, lVar107 < lVar95)) || (lVar107 < lVar91))
        goto LAB_0078eefb;
        pdVar100 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                   m_storage.m_data;
        lVar107 = lVar107 * lVar90;
        auVar113 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar100 + lVar93 + lVar107),local_5440);
        auVar109 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar100 + lVar89 + lVar107),local_5340);
        auVar113 = vaddpd_avx512f(auVar113,auVar109);
        *(undefined1 (*) [64])(pauVar92[-0xb] + lVar99) = auVar113;
        auVar113 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar100 + lVar93 + lVar107 + 8),local_5400
                                 );
        auVar109 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar100 + lVar89 + lVar107 + 8),local_5300
                                 );
        auVar113 = vaddpd_avx512f(auVar113,auVar109);
        *(undefined1 (*) [64])(pauVar92[-10] + lVar99) = auVar113;
        auVar113 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar100 + lVar93 + lVar107 + 0x10),
                                  local_53c0);
        auVar109 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar100 + lVar89 + lVar107 + 0x10),
                                  local_52c0);
        auVar113 = vaddpd_avx512f(auVar113,auVar109);
        *(undefined1 (*) [64])(pauVar92[-9] + lVar99) = auVar113;
        auVar113 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar100 + lVar93 + lVar107 + 0x18),
                                  local_5380);
        auVar109 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar100 + lVar89 + lVar107 + 0x18),
                                  local_5280);
        auVar113 = vaddpd_avx512f(auVar113,auVar109);
        *(undefined1 (*) [64])(pauVar92[-8] + lVar99) = auVar113;
        if ((((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
              m_storage.m_rows <= lVar90) ||
            (lVar107 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                       .m_storage.m_cols, lVar107 < lVar95)) || (lVar107 < lVar85))
        goto LAB_0078eefb;
        pdVar100 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                   m_storage.m_data;
        lVar107 = lVar107 * lVar90;
        auVar113 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar100 + lVar93 + lVar107),local_5540);
        auVar109 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar100 + local_6400._0_8_ + lVar107),
                                  local_5340);
        auVar113 = vaddpd_avx512f(auVar113,auVar109);
        *(undefined1 (*) [64])(pauVar92[-7] + lVar99) = auVar113;
        auVar113 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar100 + lVar93 + lVar107 + 8),local_5500
                                 );
        auVar109 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar100 + local_6400._0_8_ + lVar107 + 8),
                                  local_5300);
        auVar113 = vaddpd_avx512f(auVar113,auVar109);
        *(undefined1 (*) [64])(pauVar92[-6] + lVar99) = auVar113;
        auVar113 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar100 + lVar93 + lVar107 + 0x10),
                                  local_54c0);
        auVar109 = vmulpd_avx512f(*(undefined1 (*) [64])
                                   (pdVar100 + local_6400._0_8_ + lVar107 + 0x10),local_52c0);
        auVar113 = vaddpd_avx512f(auVar113,auVar109);
        *(undefined1 (*) [64])(pauVar92[-5] + lVar99) = auVar113;
        auVar113 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar100 + lVar93 + lVar107 + 0x18),
                                  local_5480);
        auVar109 = vmulpd_avx512f(*(undefined1 (*) [64])
                                   (pdVar100 + local_6400._0_8_ + lVar107 + 0x18),local_5280);
        auVar113 = vaddpd_avx512f(auVar113,auVar109);
        *(undefined1 (*) [64])(pauVar92[-4] + lVar99) = auVar113;
        if ((((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
              m_storage.m_rows <= lVar90) ||
            (lVar107 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                       .m_storage.m_cols, lVar107 < lVar91)) || (lVar107 < lVar85))
        goto LAB_0078eefb;
        pdVar100 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                   m_storage.m_data;
        lVar107 = lVar107 * lVar90;
        auVar113 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar100 + lVar89 + lVar107),local_5540);
        auVar109 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar100 + local_6400._0_8_ + lVar107),
                                  local_5440);
        auVar113 = vaddpd_avx512f(auVar113,auVar109);
        *(undefined1 (*) [64])(pauVar92[-3] + lVar99) = auVar113;
        auVar113 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar100 + lVar89 + lVar107 + 8),local_5500
                                 );
        auVar109 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar100 + local_6400._0_8_ + lVar107 + 8),
                                  local_5400);
        auVar113 = vaddpd_avx512f(auVar113,auVar109);
        *(undefined1 (*) [64])(pauVar92[-2] + lVar99) = auVar113;
        auVar113 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar100 + lVar89 + lVar107 + 0x10),
                                  local_54c0);
        auVar109 = vmulpd_avx512f(*(undefined1 (*) [64])
                                   (pdVar100 + local_6400._0_8_ + lVar107 + 0x10),local_53c0);
        auVar113 = vaddpd_avx512f(auVar113,auVar109);
        *(undefined1 (*) [64])(pauVar92[-1] + lVar99) = auVar113;
        auVar113 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar100 + lVar89 + lVar107 + 0x18),
                                  local_5480);
        auVar109 = vmulpd_avx512f(*(undefined1 (*) [64])
                                   (pdVar100 + local_6400._0_8_ + lVar107 + 0x18),local_5380);
        auVar113 = vaddpd_avx512f(auVar113,auVar109);
        *(undefined1 (*) [64])(*pauVar92 + lVar99) = auVar113;
        pauVar92 = (undefined1 (*) [64])(*pauVar92 + local_6440.m_cols * 0x18);
        lVar94 = lVar94 + 3;
        lVar90 = lVar90 + 1;
      } while (lVar94 != 0x30);
      pLVar73 = (this->m_layers).
                super__Vector_base<chrono::fea::ChElementShellANCF_3443::Layer,_Eigen::aligned_allocator<chrono::fea::ChElementShellANCF_3443::Layer>_>
                ._M_impl.super__Vector_impl_data._M_start;
      lVar91 = *(long *)((long)&(pLVar73->m_material).
                                super___shared_ptr<chrono::fea::ChMaterialShellANCF,_(__gnu_cxx::_Lock_policy)2>
                                ._M_ptr + local_61c0._0_8_);
      this_01 = *(ChElementShellANCF_3443 **)
                 ((long)&(pLVar73->m_material).
                         super___shared_ptr<chrono::fea::ChMaterialShellANCF,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount + local_61c0._0_8_);
      if (this_01 == (ChElementShellANCF_3443 *)0x0) {
        this_00 = (ChElementShellANCF_3443 *)local_63a0;
        memcpy(this_00,(void *)(lVar91 + 0x20),0x120);
      }
      else {
        this_00 = (ChElementShellANCF_3443 *)local_63a0;
        if (__libc_single_threaded == '\0') {
          LOCK();
          pCVar1 = &(this_01->super_ChElementShell).super_ChElementGeneric.Kmatr;
          *(int *)&(pCVar1->super_ChKblock)._vptr_ChKblock =
               *(int *)&(pCVar1->super_ChKblock)._vptr_ChKblock + 1;
          UNLOCK();
        }
        else {
          pCVar1 = &(this_01->super_ChElementShell).super_ChElementGeneric.Kmatr;
          *(int *)&(pCVar1->super_ChKblock)._vptr_ChKblock =
               *(int *)&(pCVar1->super_ChKblock)._vptr_ChKblock + 1;
        }
        memcpy(this_00,(void *)(lVar91 + 0x20),0x120);
        if (this_01 != (ChElementShellANCF_3443 *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_01);
          this_00 = this_01;
        }
      }
      RotateReorderStiffnessMatrix
                (this_00,(ChMatrixNM<double,_6,_6> *)local_63a0,
                 *(double *)
                  ((long)&((this->m_layers).
                           super__Vector_base<chrono::fea::ChElementShellANCF_3443::Layer,_Eigen::aligned_allocator<chrono::fea::ChElementShellANCF_3443::Layer>_>
                           ._M_impl.super__Vector_impl_data._M_start)->m_theta + local_61c0._0_8_));
      local_6460.m_data = (double *)0x0;
      local_6460.m_rows = 0;
      local_6460.m_cols = 0;
      Eigen::DenseStorage<double,_-1,_-1,_-1,_1>::resize(&local_6460,0x2400,0x30,0xc0);
      if (((((((local_6440.m_rows < 0x30) || (local_6440.m_cols < 0x20)) ||
             (local_6440.m_cols < 0x40)) ||
            ((local_6440.m_cols < 0x60 || (local_6440.m_cols < 0x80)))) ||
           (local_6440.m_cols < 0xa0)) || ((local_6440.m_cols < 0xc0 || (local_6460.m_rows < 0x30)))
          ) || (local_6460.m_cols < 0x20)) {
LAB_0078ef34:
        __function = 
        "Eigen::Block<Eigen::Matrix<double, -1, -1, 1>, 48, 32>::Block(XprType &, Index, Index) [XprType = Eigen::Matrix<double, -1, -1, 1>, BlockRows = 48, BlockCols = 32, InnerPanel = false]"
        ;
        goto LAB_0078ef10;
      }
      auVar76._8_8_ = local_63a0._8_8_;
      auVar76._0_8_ = local_63a0._0_8_;
      auVar77._8_8_ = local_63a0._16_8_;
      auVar77._0_8_ = local_63a0._8_8_;
      auVar78._8_8_ = local_63a0._24_8_;
      auVar78._0_8_ = local_63a0._16_8_;
      auVar79._8_8_ = local_63a0._32_8_;
      auVar79._0_8_ = local_63a0._24_8_;
      auVar80._8_8_ = local_63a0._40_8_;
      auVar80._0_8_ = local_63a0._32_8_;
      auVar113 = vbroadcastsd_avx512f(auVar76);
      auVar109 = vbroadcastsd_avx512f(auVar77);
      auVar110 = vbroadcastsd_avx512f(auVar78);
      auVar111 = vbroadcastsd_avx512f(auVar79);
      auVar112 = vbroadcastsd_avx512f(auVar80);
      auVar5._8_8_ = 0;
      auVar5._0_8_ = local_63a0._40_8_;
      auVar114 = vbroadcastsd_avx512f(auVar5);
      pauVar92 = (undefined1 (*) [64])(local_6460.m_data + 0x18);
      pauVar86 = (undefined1 (*) [64])(local_6440.m_data + 0xb8);
      lVar95 = local_6440.m_cols * 8;
      lVar91 = local_6460.m_cols * 8;
      lVar89 = 0x30;
      pauVar96 = pauVar86;
      do {
        auVar115 = vmulpd_avx512f(auVar113,pauVar96[-0x17]);
        auVar116 = vmulpd_avx512f(auVar109,pauVar96[-0x13]);
        auVar115 = vaddpd_avx512f(auVar115,auVar116);
        auVar116 = vmulpd_avx512f(auVar110,pauVar96[-0xf]);
        auVar115 = vaddpd_avx512f(auVar115,auVar116);
        auVar116 = vmulpd_avx512f(auVar111,pauVar96[-0xb]);
        auVar115 = vaddpd_avx512f(auVar115,auVar116);
        auVar116 = vmulpd_avx512f(auVar112,pauVar96[-7]);
        auVar115 = vaddpd_avx512f(auVar115,auVar116);
        auVar116 = vmulpd_avx512f(auVar114,pauVar96[-3]);
        auVar115 = vaddpd_avx512f(auVar115,auVar116);
        pauVar92[-3] = auVar115;
        auVar115 = vmulpd_avx512f(auVar113,pauVar96[-0x16]);
        auVar116 = vmulpd_avx512f(auVar109,pauVar96[-0x12]);
        auVar115 = vaddpd_avx512f(auVar115,auVar116);
        auVar116 = vmulpd_avx512f(auVar110,pauVar96[-0xe]);
        auVar115 = vaddpd_avx512f(auVar115,auVar116);
        auVar116 = vmulpd_avx512f(auVar111,pauVar96[-10]);
        auVar115 = vaddpd_avx512f(auVar115,auVar116);
        auVar116 = vmulpd_avx512f(auVar112,pauVar96[-6]);
        auVar115 = vaddpd_avx512f(auVar115,auVar116);
        auVar116 = vmulpd_avx512f(auVar114,pauVar96[-2]);
        auVar115 = vaddpd_avx512f(auVar115,auVar116);
        pauVar92[-2] = auVar115;
        auVar115 = vmulpd_avx512f(auVar113,pauVar96[-0x15]);
        auVar116 = vmulpd_avx512f(auVar109,pauVar96[-0x11]);
        auVar115 = vaddpd_avx512f(auVar115,auVar116);
        auVar116 = vmulpd_avx512f(auVar110,pauVar96[-0xd]);
        auVar115 = vaddpd_avx512f(auVar115,auVar116);
        auVar116 = vmulpd_avx512f(auVar111,pauVar96[-9]);
        auVar115 = vaddpd_avx512f(auVar115,auVar116);
        auVar116 = vmulpd_avx512f(auVar112,pauVar96[-5]);
        auVar115 = vaddpd_avx512f(auVar115,auVar116);
        auVar116 = vmulpd_avx512f(auVar114,pauVar96[-1]);
        auVar115 = vaddpd_avx512f(auVar115,auVar116);
        pauVar92[-1] = auVar115;
        auVar115 = vmulpd_avx512f(auVar113,pauVar96[-0x14]);
        auVar116 = vmulpd_avx512f(auVar109,pauVar96[-0x10]);
        auVar115 = vaddpd_avx512f(auVar115,auVar116);
        auVar116 = vmulpd_avx512f(auVar110,pauVar96[-0xc]);
        auVar115 = vaddpd_avx512f(auVar115,auVar116);
        auVar116 = vmulpd_avx512f(auVar111,pauVar96[-8]);
        auVar115 = vaddpd_avx512f(auVar115,auVar116);
        auVar116 = vmulpd_avx512f(auVar112,pauVar96[-4]);
        auVar115 = vaddpd_avx512f(auVar115,auVar116);
        auVar116 = vmulpd_avx512f(auVar114,*pauVar96);
        auVar115 = vaddpd_avx512f(auVar115,auVar116);
        *pauVar92 = auVar115;
        pauVar96 = (undefined1 (*) [64])(*pauVar96 + lVar95);
        pauVar92 = (undefined1 (*) [64])(*pauVar92 + lVar91);
        lVar89 = lVar89 + -1;
      } while (lVar89 != 0);
      if (local_6460.m_cols < 0x40) goto LAB_0078ef34;
      auVar6._8_8_ = 0;
      auVar6._0_8_ = local_63a0._48_8_;
      auVar113 = vbroadcastsd_avx512f(auVar6);
      auVar7._8_8_ = 0;
      auVar7._0_8_ = local_63a0._56_8_;
      auVar109 = vbroadcastsd_avx512f(auVar7);
      auVar8._8_8_ = 0;
      auVar8._0_8_ = local_63a0._64_8_;
      auVar110 = vbroadcastsd_avx512f(auVar8);
      auVar9._8_8_ = 0;
      auVar9._0_8_ = local_63a0._72_8_;
      auVar111 = vbroadcastsd_avx512f(auVar9);
      auVar10._8_8_ = 0;
      auVar10._0_8_ = local_63a0._80_8_;
      auVar112 = vbroadcastsd_avx512f(auVar10);
      auVar11._8_8_ = 0;
      auVar11._0_8_ = local_63a0._88_8_;
      auVar114 = vbroadcastsd_avx512f(auVar11);
      pauVar92 = (undefined1 (*) [64])(local_6460.m_data + 0x38);
      lVar89 = 0x30;
      pauVar96 = pauVar86;
      do {
        auVar115 = vmulpd_avx512f(auVar113,pauVar96[-0x17]);
        auVar116 = vmulpd_avx512f(auVar109,pauVar96[-0x13]);
        auVar115 = vaddpd_avx512f(auVar115,auVar116);
        auVar116 = vmulpd_avx512f(auVar110,pauVar96[-0xf]);
        auVar115 = vaddpd_avx512f(auVar115,auVar116);
        auVar116 = vmulpd_avx512f(auVar111,pauVar96[-0xb]);
        auVar115 = vaddpd_avx512f(auVar115,auVar116);
        auVar116 = vmulpd_avx512f(auVar112,pauVar96[-7]);
        auVar115 = vaddpd_avx512f(auVar115,auVar116);
        auVar116 = vmulpd_avx512f(auVar114,pauVar96[-3]);
        auVar115 = vaddpd_avx512f(auVar115,auVar116);
        pauVar92[-3] = auVar115;
        auVar115 = vmulpd_avx512f(auVar113,pauVar96[-0x16]);
        auVar116 = vmulpd_avx512f(auVar109,pauVar96[-0x12]);
        auVar115 = vaddpd_avx512f(auVar115,auVar116);
        auVar116 = vmulpd_avx512f(auVar110,pauVar96[-0xe]);
        auVar115 = vaddpd_avx512f(auVar115,auVar116);
        auVar116 = vmulpd_avx512f(auVar111,pauVar96[-10]);
        auVar115 = vaddpd_avx512f(auVar115,auVar116);
        auVar116 = vmulpd_avx512f(auVar112,pauVar96[-6]);
        auVar115 = vaddpd_avx512f(auVar115,auVar116);
        auVar116 = vmulpd_avx512f(auVar114,pauVar96[-2]);
        auVar115 = vaddpd_avx512f(auVar115,auVar116);
        pauVar92[-2] = auVar115;
        auVar115 = vmulpd_avx512f(auVar113,pauVar96[-0x15]);
        auVar116 = vmulpd_avx512f(auVar109,pauVar96[-0x11]);
        auVar115 = vaddpd_avx512f(auVar115,auVar116);
        auVar116 = vmulpd_avx512f(auVar110,pauVar96[-0xd]);
        auVar115 = vaddpd_avx512f(auVar115,auVar116);
        auVar116 = vmulpd_avx512f(auVar111,pauVar96[-9]);
        auVar115 = vaddpd_avx512f(auVar115,auVar116);
        auVar116 = vmulpd_avx512f(auVar112,pauVar96[-5]);
        auVar115 = vaddpd_avx512f(auVar115,auVar116);
        auVar116 = vmulpd_avx512f(auVar114,pauVar96[-1]);
        auVar115 = vaddpd_avx512f(auVar115,auVar116);
        pauVar92[-1] = auVar115;
        auVar115 = vmulpd_avx512f(auVar113,pauVar96[-0x14]);
        auVar116 = vmulpd_avx512f(auVar109,pauVar96[-0x10]);
        auVar115 = vaddpd_avx512f(auVar115,auVar116);
        auVar116 = vmulpd_avx512f(auVar110,pauVar96[-0xc]);
        auVar115 = vaddpd_avx512f(auVar115,auVar116);
        auVar116 = vmulpd_avx512f(auVar111,pauVar96[-8]);
        auVar115 = vaddpd_avx512f(auVar115,auVar116);
        auVar116 = vmulpd_avx512f(auVar112,pauVar96[-4]);
        auVar115 = vaddpd_avx512f(auVar115,auVar116);
        auVar116 = vmulpd_avx512f(auVar114,*pauVar96);
        auVar115 = vaddpd_avx512f(auVar115,auVar116);
        *pauVar92 = auVar115;
        pauVar96 = (undefined1 (*) [64])(*pauVar96 + lVar95);
        pauVar92 = (undefined1 (*) [64])(*pauVar92 + lVar91);
        lVar89 = lVar89 + -1;
      } while (lVar89 != 0);
      if (local_6460.m_cols < 0x60) goto LAB_0078ef34;
      auVar12._8_8_ = 0;
      auVar12._0_8_ = local_6340;
      auVar113 = vbroadcastsd_avx512f(auVar12);
      auVar13._8_8_ = 0;
      auVar13._0_8_ = local_6338;
      auVar109 = vbroadcastsd_avx512f(auVar13);
      auVar14._8_8_ = 0;
      auVar14._0_8_ = local_6330;
      auVar110 = vbroadcastsd_avx512f(auVar14);
      auVar15._8_8_ = 0;
      auVar15._0_8_ = local_6328;
      auVar111 = vbroadcastsd_avx512f(auVar15);
      auVar16._8_8_ = 0;
      auVar16._0_8_ = local_6320;
      auVar112 = vbroadcastsd_avx512f(auVar16);
      auVar17._8_8_ = 0;
      auVar17._0_8_ = local_6318;
      auVar114 = vbroadcastsd_avx512f(auVar17);
      pauVar92 = (undefined1 (*) [64])(local_6460.m_data + 0x58);
      lVar89 = 0x30;
      pauVar96 = pauVar86;
      do {
        auVar115 = vmulpd_avx512f(auVar113,pauVar96[-0x17]);
        auVar116 = vmulpd_avx512f(auVar109,pauVar96[-0x13]);
        auVar115 = vaddpd_avx512f(auVar115,auVar116);
        auVar116 = vmulpd_avx512f(auVar110,pauVar96[-0xf]);
        auVar115 = vaddpd_avx512f(auVar115,auVar116);
        auVar116 = vmulpd_avx512f(auVar111,pauVar96[-0xb]);
        auVar115 = vaddpd_avx512f(auVar115,auVar116);
        auVar116 = vmulpd_avx512f(auVar112,pauVar96[-7]);
        auVar115 = vaddpd_avx512f(auVar115,auVar116);
        auVar116 = vmulpd_avx512f(auVar114,pauVar96[-3]);
        auVar115 = vaddpd_avx512f(auVar115,auVar116);
        pauVar92[-3] = auVar115;
        auVar115 = vmulpd_avx512f(auVar113,pauVar96[-0x16]);
        auVar116 = vmulpd_avx512f(auVar109,pauVar96[-0x12]);
        auVar115 = vaddpd_avx512f(auVar115,auVar116);
        auVar116 = vmulpd_avx512f(auVar110,pauVar96[-0xe]);
        auVar115 = vaddpd_avx512f(auVar115,auVar116);
        auVar116 = vmulpd_avx512f(auVar111,pauVar96[-10]);
        auVar115 = vaddpd_avx512f(auVar115,auVar116);
        auVar116 = vmulpd_avx512f(auVar112,pauVar96[-6]);
        auVar115 = vaddpd_avx512f(auVar115,auVar116);
        auVar116 = vmulpd_avx512f(auVar114,pauVar96[-2]);
        auVar115 = vaddpd_avx512f(auVar115,auVar116);
        pauVar92[-2] = auVar115;
        auVar115 = vmulpd_avx512f(auVar113,pauVar96[-0x15]);
        auVar116 = vmulpd_avx512f(auVar109,pauVar96[-0x11]);
        auVar115 = vaddpd_avx512f(auVar115,auVar116);
        auVar116 = vmulpd_avx512f(auVar110,pauVar96[-0xd]);
        auVar115 = vaddpd_avx512f(auVar115,auVar116);
        auVar116 = vmulpd_avx512f(auVar111,pauVar96[-9]);
        auVar115 = vaddpd_avx512f(auVar115,auVar116);
        auVar116 = vmulpd_avx512f(auVar112,pauVar96[-5]);
        auVar115 = vaddpd_avx512f(auVar115,auVar116);
        auVar116 = vmulpd_avx512f(auVar114,pauVar96[-1]);
        auVar115 = vaddpd_avx512f(auVar115,auVar116);
        pauVar92[-1] = auVar115;
        auVar115 = vmulpd_avx512f(auVar113,pauVar96[-0x14]);
        auVar116 = vmulpd_avx512f(auVar109,pauVar96[-0x10]);
        auVar115 = vaddpd_avx512f(auVar115,auVar116);
        auVar116 = vmulpd_avx512f(auVar110,pauVar96[-0xc]);
        auVar115 = vaddpd_avx512f(auVar115,auVar116);
        auVar116 = vmulpd_avx512f(auVar111,pauVar96[-8]);
        auVar115 = vaddpd_avx512f(auVar115,auVar116);
        auVar116 = vmulpd_avx512f(auVar112,pauVar96[-4]);
        auVar115 = vaddpd_avx512f(auVar115,auVar116);
        auVar116 = vmulpd_avx512f(auVar114,*pauVar96);
        auVar115 = vaddpd_avx512f(auVar115,auVar116);
        *pauVar92 = auVar115;
        pauVar96 = (undefined1 (*) [64])(*pauVar96 + lVar95);
        pauVar92 = (undefined1 (*) [64])(*pauVar92 + lVar91);
        lVar89 = lVar89 + -1;
      } while (lVar89 != 0);
      if (local_6460.m_cols < 0x80) goto LAB_0078ef34;
      auVar18._8_8_ = 0;
      auVar18._0_8_ = local_6310;
      auVar113 = vbroadcastsd_avx512f(auVar18);
      auVar19._8_8_ = 0;
      auVar19._0_8_ = local_6308;
      auVar109 = vbroadcastsd_avx512f(auVar19);
      auVar20._8_8_ = 0;
      auVar20._0_8_ = local_6300;
      auVar110 = vbroadcastsd_avx512f(auVar20);
      auVar21._8_8_ = 0;
      auVar21._0_8_ = local_62f8;
      auVar111 = vbroadcastsd_avx512f(auVar21);
      auVar22._8_8_ = 0;
      auVar22._0_8_ = local_62f0;
      auVar112 = vbroadcastsd_avx512f(auVar22);
      auVar23._8_8_ = 0;
      auVar23._0_8_ = local_62e8;
      auVar114 = vbroadcastsd_avx512f(auVar23);
      pauVar92 = (undefined1 (*) [64])(local_6460.m_data + 0x78);
      lVar89 = 0x30;
      pauVar96 = pauVar86;
      do {
        auVar115 = vmulpd_avx512f(auVar113,pauVar96[-0x17]);
        auVar116 = vmulpd_avx512f(auVar109,pauVar96[-0x13]);
        auVar115 = vaddpd_avx512f(auVar115,auVar116);
        auVar116 = vmulpd_avx512f(auVar110,pauVar96[-0xf]);
        auVar115 = vaddpd_avx512f(auVar115,auVar116);
        auVar116 = vmulpd_avx512f(auVar111,pauVar96[-0xb]);
        auVar115 = vaddpd_avx512f(auVar115,auVar116);
        auVar116 = vmulpd_avx512f(auVar112,pauVar96[-7]);
        auVar115 = vaddpd_avx512f(auVar115,auVar116);
        auVar116 = vmulpd_avx512f(auVar114,pauVar96[-3]);
        auVar115 = vaddpd_avx512f(auVar115,auVar116);
        pauVar92[-3] = auVar115;
        auVar115 = vmulpd_avx512f(auVar113,pauVar96[-0x16]);
        auVar116 = vmulpd_avx512f(auVar109,pauVar96[-0x12]);
        auVar115 = vaddpd_avx512f(auVar115,auVar116);
        auVar116 = vmulpd_avx512f(auVar110,pauVar96[-0xe]);
        auVar115 = vaddpd_avx512f(auVar115,auVar116);
        auVar116 = vmulpd_avx512f(auVar111,pauVar96[-10]);
        auVar115 = vaddpd_avx512f(auVar115,auVar116);
        auVar116 = vmulpd_avx512f(auVar112,pauVar96[-6]);
        auVar115 = vaddpd_avx512f(auVar115,auVar116);
        auVar116 = vmulpd_avx512f(auVar114,pauVar96[-2]);
        auVar115 = vaddpd_avx512f(auVar115,auVar116);
        pauVar92[-2] = auVar115;
        auVar115 = vmulpd_avx512f(auVar113,pauVar96[-0x15]);
        auVar116 = vmulpd_avx512f(auVar109,pauVar96[-0x11]);
        auVar115 = vaddpd_avx512f(auVar115,auVar116);
        auVar116 = vmulpd_avx512f(auVar110,pauVar96[-0xd]);
        auVar115 = vaddpd_avx512f(auVar115,auVar116);
        auVar116 = vmulpd_avx512f(auVar111,pauVar96[-9]);
        auVar115 = vaddpd_avx512f(auVar115,auVar116);
        auVar116 = vmulpd_avx512f(auVar112,pauVar96[-5]);
        auVar115 = vaddpd_avx512f(auVar115,auVar116);
        auVar116 = vmulpd_avx512f(auVar114,pauVar96[-1]);
        auVar115 = vaddpd_avx512f(auVar115,auVar116);
        pauVar92[-1] = auVar115;
        auVar115 = vmulpd_avx512f(auVar113,pauVar96[-0x14]);
        auVar116 = vmulpd_avx512f(auVar109,pauVar96[-0x10]);
        auVar115 = vaddpd_avx512f(auVar115,auVar116);
        auVar116 = vmulpd_avx512f(auVar110,pauVar96[-0xc]);
        auVar115 = vaddpd_avx512f(auVar115,auVar116);
        auVar116 = vmulpd_avx512f(auVar111,pauVar96[-8]);
        auVar115 = vaddpd_avx512f(auVar115,auVar116);
        auVar116 = vmulpd_avx512f(auVar112,pauVar96[-4]);
        auVar115 = vaddpd_avx512f(auVar115,auVar116);
        auVar116 = vmulpd_avx512f(auVar114,*pauVar96);
        auVar115 = vaddpd_avx512f(auVar115,auVar116);
        *pauVar92 = auVar115;
        pauVar96 = (undefined1 (*) [64])(*pauVar96 + lVar95);
        pauVar92 = (undefined1 (*) [64])(*pauVar92 + lVar91);
        lVar89 = lVar89 + -1;
      } while (lVar89 != 0);
      if (local_6460.m_cols < 0xa0) goto LAB_0078ef34;
      auVar24._8_8_ = 0;
      auVar24._0_8_ = local_62e0;
      auVar113 = vbroadcastsd_avx512f(auVar24);
      auVar25._8_8_ = 0;
      auVar25._0_8_ = local_62d8;
      auVar109 = vbroadcastsd_avx512f(auVar25);
      auVar26._8_8_ = 0;
      auVar26._0_8_ = local_62d0;
      auVar110 = vbroadcastsd_avx512f(auVar26);
      auVar27._8_8_ = 0;
      auVar27._0_8_ = local_62c8;
      auVar111 = vbroadcastsd_avx512f(auVar27);
      auVar28._8_8_ = 0;
      auVar28._0_8_ = local_62c0;
      auVar112 = vbroadcastsd_avx512f(auVar28);
      auVar29._8_8_ = 0;
      auVar29._0_8_ = local_62b8;
      auVar114 = vbroadcastsd_avx512f(auVar29);
      pauVar92 = (undefined1 (*) [64])(local_6460.m_data + 0x98);
      lVar89 = 0x30;
      pauVar96 = pauVar86;
      do {
        auVar115 = vmulpd_avx512f(auVar113,pauVar96[-0x17]);
        auVar116 = vmulpd_avx512f(auVar109,pauVar96[-0x13]);
        auVar115 = vaddpd_avx512f(auVar115,auVar116);
        auVar116 = vmulpd_avx512f(auVar110,pauVar96[-0xf]);
        auVar115 = vaddpd_avx512f(auVar115,auVar116);
        auVar116 = vmulpd_avx512f(auVar111,pauVar96[-0xb]);
        auVar115 = vaddpd_avx512f(auVar115,auVar116);
        auVar116 = vmulpd_avx512f(auVar112,pauVar96[-7]);
        auVar115 = vaddpd_avx512f(auVar115,auVar116);
        auVar116 = vmulpd_avx512f(auVar114,pauVar96[-3]);
        auVar115 = vaddpd_avx512f(auVar115,auVar116);
        pauVar92[-3] = auVar115;
        auVar115 = vmulpd_avx512f(auVar113,pauVar96[-0x16]);
        auVar116 = vmulpd_avx512f(auVar109,pauVar96[-0x12]);
        auVar115 = vaddpd_avx512f(auVar115,auVar116);
        auVar116 = vmulpd_avx512f(auVar110,pauVar96[-0xe]);
        auVar115 = vaddpd_avx512f(auVar115,auVar116);
        auVar116 = vmulpd_avx512f(auVar111,pauVar96[-10]);
        auVar115 = vaddpd_avx512f(auVar115,auVar116);
        auVar116 = vmulpd_avx512f(auVar112,pauVar96[-6]);
        auVar115 = vaddpd_avx512f(auVar115,auVar116);
        auVar116 = vmulpd_avx512f(auVar114,pauVar96[-2]);
        auVar115 = vaddpd_avx512f(auVar115,auVar116);
        pauVar92[-2] = auVar115;
        auVar115 = vmulpd_avx512f(auVar113,pauVar96[-0x15]);
        auVar116 = vmulpd_avx512f(auVar109,pauVar96[-0x11]);
        auVar115 = vaddpd_avx512f(auVar115,auVar116);
        auVar116 = vmulpd_avx512f(auVar110,pauVar96[-0xd]);
        auVar115 = vaddpd_avx512f(auVar115,auVar116);
        auVar116 = vmulpd_avx512f(auVar111,pauVar96[-9]);
        auVar115 = vaddpd_avx512f(auVar115,auVar116);
        auVar116 = vmulpd_avx512f(auVar112,pauVar96[-5]);
        auVar115 = vaddpd_avx512f(auVar115,auVar116);
        auVar116 = vmulpd_avx512f(auVar114,pauVar96[-1]);
        auVar115 = vaddpd_avx512f(auVar115,auVar116);
        pauVar92[-1] = auVar115;
        auVar115 = vmulpd_avx512f(auVar113,pauVar96[-0x14]);
        auVar116 = vmulpd_avx512f(auVar109,pauVar96[-0x10]);
        auVar115 = vaddpd_avx512f(auVar115,auVar116);
        auVar116 = vmulpd_avx512f(auVar110,pauVar96[-0xc]);
        auVar115 = vaddpd_avx512f(auVar115,auVar116);
        auVar116 = vmulpd_avx512f(auVar111,pauVar96[-8]);
        auVar115 = vaddpd_avx512f(auVar115,auVar116);
        auVar116 = vmulpd_avx512f(auVar112,pauVar96[-4]);
        auVar115 = vaddpd_avx512f(auVar115,auVar116);
        auVar116 = vmulpd_avx512f(auVar114,*pauVar96);
        auVar115 = vaddpd_avx512f(auVar115,auVar116);
        *pauVar92 = auVar115;
        pauVar96 = (undefined1 (*) [64])(*pauVar96 + lVar95);
        pauVar92 = (undefined1 (*) [64])(*pauVar92 + lVar91);
        lVar89 = lVar89 + -1;
      } while (lVar89 != 0);
      if ((local_6460.m_rows < 0x30) || (local_6460.m_cols < 0xc0)) goto LAB_0078ef34;
      auVar30._8_8_ = 0;
      auVar30._0_8_ = local_62b0;
      auVar113 = vbroadcastsd_avx512f(auVar30);
      auVar31._8_8_ = 0;
      auVar31._0_8_ = local_62a8;
      auVar109 = vbroadcastsd_avx512f(auVar31);
      auVar32._8_8_ = 0;
      auVar32._0_8_ = local_62a0;
      auVar110 = vbroadcastsd_avx512f(auVar32);
      auVar33._8_8_ = 0;
      auVar33._0_8_ = local_6298;
      auVar111 = vbroadcastsd_avx512f(auVar33);
      auVar34._8_8_ = 0;
      auVar34._0_8_ = local_6290;
      auVar112 = vbroadcastsd_avx512f(auVar34);
      auVar35._8_8_ = 0;
      auVar35._0_8_ = local_6288;
      auVar114 = vbroadcastsd_avx512f(auVar35);
      pauVar92 = (undefined1 (*) [64])(local_6460.m_data + 0xb8);
      lVar91 = 0x30;
      do {
        auVar115 = vmulpd_avx512f(auVar113,pauVar86[-0x17]);
        auVar116 = vmulpd_avx512f(auVar109,pauVar86[-0x13]);
        auVar115 = vaddpd_avx512f(auVar115,auVar116);
        auVar116 = vmulpd_avx512f(auVar110,pauVar86[-0xf]);
        auVar115 = vaddpd_avx512f(auVar115,auVar116);
        auVar116 = vmulpd_avx512f(auVar111,pauVar86[-0xb]);
        auVar115 = vaddpd_avx512f(auVar115,auVar116);
        auVar116 = vmulpd_avx512f(auVar112,pauVar86[-7]);
        auVar115 = vaddpd_avx512f(auVar115,auVar116);
        auVar116 = vmulpd_avx512f(auVar114,pauVar86[-3]);
        auVar115 = vaddpd_avx512f(auVar115,auVar116);
        pauVar92[-3] = auVar115;
        auVar115 = vmulpd_avx512f(auVar113,pauVar86[-0x16]);
        auVar116 = vmulpd_avx512f(auVar109,pauVar86[-0x12]);
        auVar115 = vaddpd_avx512f(auVar115,auVar116);
        auVar116 = vmulpd_avx512f(auVar110,pauVar86[-0xe]);
        auVar115 = vaddpd_avx512f(auVar115,auVar116);
        auVar116 = vmulpd_avx512f(auVar111,pauVar86[-10]);
        auVar115 = vaddpd_avx512f(auVar115,auVar116);
        auVar116 = vmulpd_avx512f(auVar112,pauVar86[-6]);
        auVar115 = vaddpd_avx512f(auVar115,auVar116);
        auVar116 = vmulpd_avx512f(auVar114,pauVar86[-2]);
        auVar115 = vaddpd_avx512f(auVar115,auVar116);
        pauVar92[-2] = auVar115;
        auVar115 = vmulpd_avx512f(auVar113,pauVar86[-0x15]);
        auVar116 = vmulpd_avx512f(auVar109,pauVar86[-0x11]);
        auVar115 = vaddpd_avx512f(auVar115,auVar116);
        auVar116 = vmulpd_avx512f(auVar110,pauVar86[-0xd]);
        auVar115 = vaddpd_avx512f(auVar115,auVar116);
        auVar116 = vmulpd_avx512f(auVar111,pauVar86[-9]);
        auVar115 = vaddpd_avx512f(auVar115,auVar116);
        auVar116 = vmulpd_avx512f(auVar112,pauVar86[-5]);
        auVar115 = vaddpd_avx512f(auVar115,auVar116);
        auVar116 = vmulpd_avx512f(auVar114,pauVar86[-1]);
        auVar115 = vaddpd_avx512f(auVar115,auVar116);
        pauVar92[-1] = auVar115;
        auVar115 = vmulpd_avx512f(auVar113,pauVar86[-0x14]);
        auVar116 = vmulpd_avx512f(auVar109,pauVar86[-0x10]);
        auVar115 = vaddpd_avx512f(auVar115,auVar116);
        auVar116 = vmulpd_avx512f(auVar110,pauVar86[-0xc]);
        auVar115 = vaddpd_avx512f(auVar115,auVar116);
        auVar116 = vmulpd_avx512f(auVar111,pauVar86[-8]);
        auVar115 = vaddpd_avx512f(auVar115,auVar116);
        auVar116 = vmulpd_avx512f(auVar112,pauVar86[-4]);
        auVar115 = vaddpd_avx512f(auVar115,auVar116);
        auVar116 = vmulpd_avx512f(auVar114,*pauVar86);
        auVar115 = vaddpd_avx512f(auVar115,auVar116);
        *pauVar92 = auVar115;
        pauVar86 = (undefined1 (*) [64])(*pauVar86 + local_6440.m_cols * 8);
        pauVar92 = (undefined1 (*) [64])(*pauVar92 + local_6460.m_cols * 8);
        lVar91 = lVar91 + -1;
      } while (lVar91 != 0);
      if (local_6420.m_cols != local_6460.m_cols) {
        __assert_fail("lhs.cols() == rhs.rows() && \"invalid matrix product\" && \"if you wanted a coeff-wise or a dot product use the respective explicit functions\""
                      ,"/usr/include/eigen3/Eigen/src/Core/Product.h",0x62,
                      "Eigen::Product<Eigen::Matrix<double, -1, -1, 1>, Eigen::Transpose<Eigen::Matrix<double, -1, -1, 1>>>::Product(const Lhs &, const Rhs &) [Lhs = Eigen::Matrix<double, -1, -1, 1>, Rhs = Eigen::Transpose<Eigen::Matrix<double, -1, -1, 1>>, Option = 0]"
                     );
      }
      local_3080 = (undefined1  [8])&local_6420;
      TStack_3078.m_matrix = (non_const_type)&local_6460;
      if (((H->
           super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
           ).
           super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
           .
           super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
           .m_rows.m_value != local_6420.m_rows) ||
         ((H->
          super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
          ).
          super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
          .
          super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
          .m_cols.m_value != local_6460.m_rows)) {
        __assert_fail("dst.rows() == src.rows() && dst.cols() == src.cols()",
                      "/usr/include/eigen3/Eigen/src/Core/ProductEvaluators.h",0xa1,
                      "static void Eigen::internal::Assignment<Eigen::Ref<Eigen::Matrix<double, -1, -1, 1>>, Eigen::Product<Eigen::Matrix<double, -1, -1, 1>, Eigen::Transpose<Eigen::Matrix<double, -1, -1, 1>>>, Eigen::internal::add_assign_op<double, double>>::run(DstXprType &, const SrcXprType &, const internal::add_assign_op<Scalar, Scalar> &) [DstXprType = Eigen::Ref<Eigen::Matrix<double, -1, -1, 1>>, SrcXprType = Eigen::Product<Eigen::Matrix<double, -1, -1, 1>, Eigen::Transpose<Eigen::Matrix<double, -1, -1, 1>>>, Functor = Eigen::internal::add_assign_op<double, double>, Kind = Eigen::internal::Dense2Dense, EnableIf = void]"
                     );
      }
      Eigen::internal::
      generic_product_impl<Eigen::Matrix<double,-1,-1,1,-1,-1>,Eigen::Transpose<Eigen::Matrix<double,-1,-1,1,-1,-1>>,Eigen::DenseShape,Eigen::DenseShape,8>
      ::addTo<Eigen::Ref<Eigen::Matrix<double,_1,_1,1,_1,_1>,0,Eigen::OuterStride<_1>>>
                (H,(Matrix<double,__1,__1,_1,__1,__1> *)&local_6420,&TStack_3078);
      if (((this->m_kGQ).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
           m_rows < (long)local_6200._0_8_) ||
         ((this->m_kGQ).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
          m_cols < 1)) goto LAB_0078ef4b;
      lVar91 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
               m_storage.m_cols;
      iVar82 = auVar117._0_4_ + 0x20;
      lVar95 = (long)iVar82 + 0x20;
      iVar88 = auVar117._0_4_ + 0x40;
      lVar89 = (long)iVar88 + 0x20;
      if (lVar91 < lVar85) {
LAB_0078eefb:
        __function = 
        "Eigen::Block<Eigen::Matrix<double, -1, -1, 1>, 1, 32>::Block(XprType &, Index, Index) [XprType = Eigen::Matrix<double, -1, -1, 1>, BlockRows = 1, BlockCols = 32, InnerPanel = false]"
        ;
        goto LAB_0078ef10;
      }
      local_3800._8_8_ = local_4e00._8_8_;
      local_3800._0_8_ = local_4e00._0_8_;
      local_3800._16_8_ = local_4e00._16_8_;
      local_3800._24_40_ = local_4e00._24_40_;
      auVar117 = vmulpd_avx512f(local_4d40,local_4d40);
      local_34c0 = local_4d40;
      auVar113 = vmulpd_avx512f(local_4a40,local_4a40);
      local_3500 = local_4a40;
      auVar117 = vaddpd_avx512f(auVar117,auVar113);
      auVar113 = vmulpd_avx512f(local_4740,local_4740);
      local_3540 = local_4740;
      auVar117 = vaddpd_avx512f(auVar117,auVar113);
      auVar113 = vbroadcastsd_avx512f(ZEXT816(0xbff0000000000000));
      auVar117 = vaddpd_avx512f(auVar117,auVar113);
      auVar109 = vbroadcastsd_avx512f(ZEXT816(0x3fe0000000000000));
      auVar117 = vmulpd_avx512f(auVar117,auVar109);
      auVar36._8_8_ = 0;
      auVar36._0_8_ = this->m_Alpha;
      auVar111 = vbroadcastsd_avx512f(auVar36);
      auVar110 = vmulpd_avx512f(local_4d40,local_4440);
      auVar112 = vmulpd_avx512f(local_4a40,local_4140);
      auVar110 = vaddpd_avx512f(auVar110,auVar112);
      auVar112 = vmulpd_avx512f(local_4740,local_3e40);
      auVar110 = vaddpd_avx512f(auVar110,auVar112);
      auVar110 = vmulpd_avx512f(auVar111,auVar110);
      local_33c0 = vaddpd_avx512f(auVar117,auVar110);
      local_3580 = local_4d80;
      auVar117 = vmulpd_avx512f(local_4d80,local_4d80);
      auVar110 = vmulpd_avx512f(local_4a80,local_4a80);
      local_35c0 = local_4a80;
      auVar117 = vaddpd_avx512f(auVar117,auVar110);
      auVar110 = vmulpd_avx512f(local_4780,local_4780);
      local_3600 = local_4780;
      auVar117 = vaddpd_avx512f(auVar117,auVar110);
      auVar117 = vaddpd_avx512f(auVar117,auVar113);
      auVar117 = vmulpd_avx512f(auVar117,auVar109);
      auVar110 = vmulpd_avx512f(local_4d80,local_4480);
      auVar112 = vmulpd_avx512f(local_4a80,local_4180);
      auVar110 = vaddpd_avx512f(auVar110,auVar112);
      auVar112 = vmulpd_avx512f(local_4780,local_3e80);
      auVar110 = vaddpd_avx512f(auVar110,auVar112);
      auVar110 = vmulpd_avx512f(auVar111,auVar110);
      local_3400 = vaddpd_avx512f(auVar117,auVar110);
      local_3740 = local_4dc0;
      auVar117 = vmulpd_avx512f(local_4dc0,local_4dc0);
      auVar110 = vmulpd_avx512f(local_4ac0,local_4ac0);
      local_3780 = local_4ac0;
      auVar117 = vaddpd_avx512f(auVar117,auVar110);
      auVar110 = vmulpd_avx512f(local_47c0,local_47c0);
      local_37c0 = local_47c0;
      auVar117 = vaddpd_avx512f(auVar117,auVar110);
      auVar117 = vaddpd_avx512f(auVar117,auVar113);
      auVar117 = vmulpd_avx512f(auVar117,auVar109);
      auVar110 = vmulpd_avx512f(local_4dc0,local_44c0);
      auVar112 = vmulpd_avx512f(local_4ac0,local_41c0);
      auVar110 = vaddpd_avx512f(auVar110,auVar112);
      auVar112 = vmulpd_avx512f(local_47c0,local_3ec0);
      auVar110 = vaddpd_avx512f(auVar110,auVar112);
      auVar110 = vmulpd_avx512f(auVar111,auVar110);
      local_3440 = vaddpd_avx512f(auVar117,auVar110);
      auVar117 = vmulpd_avx512f(local_3800,local_3800);
      auVar110 = vmulpd_avx512f(local_4b00,local_4b00);
      local_3840 = local_4b00;
      auVar117 = vaddpd_avx512f(auVar117,auVar110);
      auVar110 = vmulpd_avx512f(local_4800,local_4800);
      local_3880 = local_4800;
      auVar117 = vaddpd_avx512f(auVar117,auVar110);
      auVar117 = vaddpd_avx512f(auVar117,auVar113);
      auVar117 = vmulpd_avx512f(auVar117,auVar109);
      auVar110 = vmulpd_avx512f(local_3800,local_4500);
      auVar112 = vmulpd_avx512f(local_4b00,local_4200);
      auVar110 = vaddpd_avx512f(auVar110,auVar112);
      auVar112 = vmulpd_avx512f(local_4800,local_3f00);
      auVar110 = vaddpd_avx512f(auVar110,auVar112);
      auVar110 = vmulpd_avx512f(auVar111,auVar110);
      local_3480 = vaddpd_avx512f(auVar117,auVar110);
      auVar117 = vmulpd_avx512f(local_4d00,local_4400);
      local_5140 = local_4d00;
      auVar110 = vmulpd_avx512f(local_4a00,local_4100);
      local_50c0 = local_4a00;
      auVar117 = vaddpd_avx512f(auVar117,auVar110);
      auVar110 = vmulpd_avx512f(local_4700,local_3e00);
      local_5100 = local_4700;
      auVar117 = vaddpd_avx512f(auVar117,auVar110);
      auVar110 = vmulpd_avx512f(local_4cc0,local_43c0);
      local_5080 = local_4cc0;
      auVar112 = vmulpd_avx512f(local_49c0,local_40c0);
      local_5040 = local_49c0;
      auVar110 = vaddpd_avx512f(auVar110,auVar112);
      auVar112 = vmulpd_avx512f(local_46c0,local_3dc0);
      local_51c0 = local_46c0;
      auVar110 = vaddpd_avx512f(auVar110,auVar112);
      auVar112 = vmulpd_avx512f(local_4c80,local_4380);
      local_5000 = local_4c80;
      auVar114 = vmulpd_avx512f(local_4980,local_4080);
      local_4f80 = local_4980;
      auVar112 = vaddpd_avx512f(auVar112,auVar114);
      auVar114 = vmulpd_avx512f(local_4680,local_3d80);
      local_4fc0 = local_4680;
      auVar112 = vaddpd_avx512f(auVar112,auVar114);
      auVar114 = vmulpd_avx512f(local_4c40,local_4340);
      local_4f40 = local_4c40;
      auVar115 = vmulpd_avx512f(local_4940,local_4040);
      local_4f00 = local_4940;
      auVar114 = vaddpd_avx512f(auVar114,auVar115);
      local_4e40 = local_3d40;
      auVar115 = vmulpd_avx512f(local_4640,local_3d40);
      local_4ec0 = local_4640;
      auVar114 = vaddpd_avx512f(auVar114,auVar115);
      auVar115 = vmulpd_avx512f(local_4d00,local_4d00);
      auVar116 = vmulpd_avx512f(local_4a00,local_4a00);
      auVar115 = vaddpd_avx512f(auVar115,auVar116);
      auVar116 = vmulpd_avx512f(local_4700,local_4700);
      auVar115 = vaddpd_avx512f(auVar115,auVar116);
      auVar116 = vmulpd_avx512f(local_4cc0,local_4cc0);
      auVar118 = vmulpd_avx512f(local_49c0,local_49c0);
      auVar116 = vaddpd_avx512f(auVar116,auVar118);
      auVar118 = vmulpd_avx512f(local_46c0,local_46c0);
      auVar116 = vaddpd_avx512f(auVar116,auVar118);
      auVar118 = vmulpd_avx512f(local_4c80,local_4c80);
      auVar119 = vmulpd_avx512f(local_4980,local_4980);
      auVar118 = vaddpd_avx512f(auVar118,auVar119);
      auVar119 = vmulpd_avx512f(local_4680,local_4680);
      auVar118 = vaddpd_avx512f(auVar118,auVar119);
      auVar119 = vmulpd_avx512f(local_4c40,local_4c40);
      auVar120 = vmulpd_avx512f(local_4940,local_4940);
      auVar119 = vaddpd_avx512f(auVar119,auVar120);
      auVar120 = vmulpd_avx512f(local_4640,local_4640);
      auVar119 = vaddpd_avx512f(auVar119,auVar120);
      auVar115 = vaddpd_avx512f(auVar115,auVar113);
      auVar115 = vmulpd_avx512f(auVar115,auVar109);
      auVar117 = vmulpd_avx512f(auVar111,auVar117);
      local_3640 = vaddpd_avx512f(auVar115,auVar117);
      auVar117 = vaddpd_avx512f(auVar116,auVar113);
      auVar117 = vmulpd_avx512f(auVar117,auVar109);
      auVar110 = vmulpd_avx512f(auVar111,auVar110);
      local_3680 = vaddpd_avx512f(auVar117,auVar110);
      auVar117 = vaddpd_avx512f(auVar118,auVar113);
      auVar117 = vmulpd_avx512f(auVar117,auVar109);
      auVar110 = vmulpd_avx512f(auVar111,auVar112);
      local_36c0 = vaddpd_avx512f(auVar117,auVar110);
      auVar117 = vaddpd_avx512f(auVar119,auVar113);
      auVar117 = vmulpd_avx512f(auVar117,auVar109);
      auVar110 = vmulpd_avx512f(auVar111,auVar114);
      local_3700 = vaddpd_avx512f(auVar117,auVar110);
      auVar117 = vmulpd_avx512f(local_4c00,local_4300);
      local_3b00 = local_4300;
      auVar110 = vmulpd_avx512f(local_4900,local_4000);
      local_3b80 = local_4000;
      auVar117 = vaddpd_avx512f(auVar117,auVar110);
      auVar110 = vmulpd_avx512f(local_4600,local_3d00);
      auVar117 = vaddpd_avx512f(auVar117,auVar110);
      auVar110 = vmulpd_avx512f(local_4bc0,local_42c0);
      local_3b40 = local_42c0;
      auVar112 = vmulpd_avx512f(local_48c0,local_3fc0);
      local_3bc0 = local_3fc0;
      auVar110 = vaddpd_avx512f(auVar110,auVar112);
      local_3ac0 = local_3cc0;
      auVar112 = vmulpd_avx512f(local_45c0,local_3cc0);
      auVar110 = vaddpd_avx512f(auVar110,auVar112);
      auVar112 = vmulpd_avx512f(local_4b80,local_4280);
      local_3a80 = local_3f80;
      auVar114 = vmulpd_avx512f(local_4880,local_3f80);
      auVar112 = vaddpd_avx512f(auVar112,auVar114);
      auVar114 = vmulpd_avx512f(local_4580,local_3c80);
      auVar112 = vaddpd_avx512f(auVar112,auVar114);
      local_5180 = local_4240;
      auVar114 = vmulpd_avx512f(local_4b40,local_4240);
      auVar115 = vmulpd_avx512f(local_4840,local_3f40);
      auVar114 = vaddpd_avx512f(auVar114,auVar115);
      local_4e80 = local_3c40;
      auVar115 = vmulpd_avx512f(local_4540,local_3c40);
      auVar114 = vaddpd_avx512f(auVar114,auVar115);
      auVar115 = vmulpd_avx512f(local_4c00,local_4c00);
      auVar116 = vmulpd_avx512f(local_4900,local_4900);
      auVar115 = vaddpd_avx512f(auVar115,auVar116);
      auVar116 = vmulpd_avx512f(local_4600,local_4600);
      auVar115 = vaddpd_avx512f(auVar115,auVar116);
      auVar116 = vmulpd_avx512f(local_4bc0,local_4bc0);
      auVar118 = vmulpd_avx512f(local_48c0,local_48c0);
      auVar116 = vaddpd_avx512f(auVar116,auVar118);
      auVar118 = vmulpd_avx512f(local_45c0,local_45c0);
      auVar116 = vaddpd_avx512f(auVar116,auVar118);
      auVar118 = vmulpd_avx512f(local_4b80,local_4b80);
      auVar119 = vmulpd_avx512f(local_4880,local_4880);
      auVar118 = vaddpd_avx512f(auVar118,auVar119);
      auVar119 = vmulpd_avx512f(local_4580,local_4580);
      auVar118 = vaddpd_avx512f(auVar118,auVar119);
      auVar119 = vmulpd_avx512f(local_4b40,local_4b40);
      auVar120 = vmulpd_avx512f(local_4840,local_4840);
      auVar119 = vaddpd_avx512f(auVar119,auVar120);
      auVar120 = vmulpd_avx512f(local_4540,local_4540);
      auVar119 = vaddpd_avx512f(auVar119,auVar120);
      auVar115 = vaddpd_avx512f(auVar115,auVar113);
      auVar115 = vmulpd_avx512f(auVar115,auVar109);
      auVar117 = vmulpd_avx512f(auVar111,auVar117);
      local_38c0 = vaddpd_avx512f(auVar115,auVar117);
      auVar117 = vaddpd_avx512f(auVar116,auVar113);
      auVar117 = vmulpd_avx512f(auVar117,auVar109);
      auVar110 = vmulpd_avx512f(auVar111,auVar110);
      local_3900 = vaddpd_avx512f(auVar117,auVar110);
      auVar117 = vaddpd_avx512f(auVar118,auVar113);
      auVar117 = vmulpd_avx512f(auVar117,auVar109);
      auVar110 = vmulpd_avx512f(auVar111,auVar112);
      local_3940 = vaddpd_avx512f(auVar117,auVar110);
      auVar117 = vaddpd_avx512f(auVar119,auVar113);
      auVar117 = vmulpd_avx512f(auVar117,auVar109);
      auVar113 = vmulpd_avx512f(auVar111,auVar114);
      local_3980 = vaddpd_avx512f(auVar117,auVar113);
      auVar117 = vmulpd_avx512f(local_4c00,local_4400);
      auVar113 = vmulpd_avx512f(local_4900,local_4100);
      auVar117 = vaddpd_avx512f(auVar117,auVar113);
      auVar113 = vmulpd_avx512f(local_4600,local_3e00);
      auVar117 = vaddpd_avx512f(auVar117,auVar113);
      auVar113 = vmulpd_avx512f(local_4d00,local_4300);
      auVar117 = vaddpd_avx512f(auVar113,auVar117);
      auVar113 = vmulpd_avx512f(local_4a00,local_4000);
      auVar117 = vaddpd_avx512f(auVar113,auVar117);
      auVar113 = vmulpd_avx512f(local_4700,local_3d00);
      auVar117 = vaddpd_avx512f(auVar113,auVar117);
      auVar113 = vmulpd_avx512f(local_4bc0,local_43c0);
      auVar109 = vmulpd_avx512f(local_48c0,local_40c0);
      auVar113 = vaddpd_avx512f(auVar113,auVar109);
      auVar109 = vmulpd_avx512f(local_45c0,local_3dc0);
      auVar113 = vaddpd_avx512f(auVar113,auVar109);
      auVar109 = vmulpd_avx512f(local_4cc0,local_42c0);
      auVar113 = vaddpd_avx512f(auVar109,auVar113);
      auVar109 = vmulpd_avx512f(local_49c0,local_3fc0);
      auVar113 = vaddpd_avx512f(auVar109,auVar113);
      auVar109 = vmulpd_avx512f(local_46c0,local_3cc0);
      auVar113 = vaddpd_avx512f(auVar109,auVar113);
      auVar109 = vmulpd_avx512f(local_4b80,local_4380);
      auVar110 = vmulpd_avx512f(local_4880,local_4080);
      auVar109 = vaddpd_avx512f(auVar109,auVar110);
      auVar110 = vmulpd_avx512f(local_4580,local_3d80);
      auVar109 = vaddpd_avx512f(auVar109,auVar110);
      auVar110 = vmulpd_avx512f(local_4c80,local_4280);
      auVar109 = vaddpd_avx512f(auVar110,auVar109);
      auVar110 = vmulpd_avx512f(local_4980,local_3f80);
      auVar109 = vaddpd_avx512f(auVar110,auVar109);
      auVar110 = vmulpd_avx512f(local_4680,local_3c80);
      auVar109 = vaddpd_avx512f(auVar110,auVar109);
      auVar110 = vmulpd_avx512f(local_4b40,local_4340);
      auVar112 = vmulpd_avx512f(local_4840,local_4040);
      auVar110 = vaddpd_avx512f(auVar110,auVar112);
      auVar112 = vmulpd_avx512f(local_4540,local_3d40);
      auVar110 = vaddpd_avx512f(auVar110,auVar112);
      auVar112 = vmulpd_avx512f(local_4c40,local_4240);
      auVar110 = vaddpd_avx512f(auVar112,auVar110);
      auVar112 = vmulpd_avx512f(local_4940,local_3f40);
      auVar110 = vaddpd_avx512f(auVar112,auVar110);
      auVar112 = vmulpd_avx512f(local_4640,local_3c40);
      auVar110 = vaddpd_avx512f(auVar112,auVar110);
      auVar112 = vmulpd_avx512f(local_4d00,local_4c00);
      auVar114 = vmulpd_avx512f(local_4a00,local_4900);
      auVar112 = vaddpd_avx512f(auVar112,auVar114);
      auVar114 = vmulpd_avx512f(local_4700,local_4600);
      auVar112 = vaddpd_avx512f(auVar112,auVar114);
      auVar114 = vmulpd_avx512f(local_4cc0,local_4bc0);
      auVar115 = vmulpd_avx512f(local_49c0,local_48c0);
      auVar114 = vaddpd_avx512f(auVar114,auVar115);
      auVar115 = vmulpd_avx512f(local_46c0,local_45c0);
      auVar114 = vaddpd_avx512f(auVar114,auVar115);
      auVar115 = vmulpd_avx512f(local_4c80,local_4b80);
      auVar116 = vmulpd_avx512f(local_4980,local_4880);
      auVar115 = vaddpd_avx512f(auVar115,auVar116);
      auVar116 = vmulpd_avx512f(local_4680,local_4580);
      auVar115 = vaddpd_avx512f(auVar115,auVar116);
      auVar116 = vmulpd_avx512f(local_4c40,local_4b40);
      auVar118 = vmulpd_avx512f(local_4940,local_4840);
      auVar116 = vaddpd_avx512f(auVar116,auVar118);
      auVar118 = vmulpd_avx512f(local_4640,local_4540);
      auVar116 = vaddpd_avx512f(auVar116,auVar118);
      auVar117 = vmulpd_avx512f(auVar111,auVar117);
      local_5200 = vaddpd_avx512f(auVar112,auVar117);
      auVar117 = vmulpd_avx512f(auVar111,auVar113);
      local_39c0 = vaddpd_avx512f(auVar114,auVar117);
      auVar117 = vmulpd_avx512f(auVar111,auVar109);
      local_3a00 = vaddpd_avx512f(auVar115,auVar117);
      auVar117 = vmulpd_avx512f(auVar111,auVar110);
      local_3a40 = vaddpd_avx512f(auVar116,auVar117);
      auVar117 = vmulpd_avx512f(local_4c00,local_4500);
      auVar113 = vmulpd_avx512f(local_4900,local_4200);
      auVar117 = vaddpd_avx512f(auVar117,auVar113);
      auVar113 = vmulpd_avx512f(local_4600,local_3f00);
      auVar117 = vaddpd_avx512f(auVar117,auVar113);
      auVar113 = vmulpd_avx512f(local_3800,local_4300);
      auVar117 = vaddpd_avx512f(auVar113,auVar117);
      auVar113 = vmulpd_avx512f(local_4b00,local_4000);
      auVar117 = vaddpd_avx512f(auVar113,auVar117);
      auVar113 = vmulpd_avx512f(local_4800,local_3d00);
      auVar117 = vaddpd_avx512f(auVar113,auVar117);
      auVar113 = vmulpd_avx512f(local_4bc0,local_44c0);
      auVar109 = vmulpd_avx512f(local_48c0,local_41c0);
      auVar113 = vaddpd_avx512f(auVar113,auVar109);
      auVar109 = vmulpd_avx512f(local_45c0,local_3ec0);
      auVar113 = vaddpd_avx512f(auVar113,auVar109);
      auVar109 = vmulpd_avx512f(local_4dc0,local_42c0);
      auVar113 = vaddpd_avx512f(auVar109,auVar113);
      auVar109 = vmulpd_avx512f(local_4ac0,local_3fc0);
      auVar113 = vaddpd_avx512f(auVar109,auVar113);
      auVar109 = vmulpd_avx512f(local_47c0,local_3cc0);
      local_5240 = vaddpd_avx512f(auVar109,auVar113);
      auVar113 = vmulpd_avx512f(local_4b80,local_4480);
      auVar109 = vmulpd_avx512f(local_4880,local_4180);
      auVar113 = vaddpd_avx512f(auVar113,auVar109);
      auVar109 = vmulpd_avx512f(local_4580,local_3e80);
      auVar113 = vaddpd_avx512f(auVar113,auVar109);
      auVar109 = vmulpd_avx512f(local_4d80,local_4280);
      auVar113 = vaddpd_avx512f(auVar109,auVar113);
      auVar109 = vmulpd_avx512f(local_4a80,local_3f80);
      auVar113 = vaddpd_avx512f(auVar109,auVar113);
      auVar109 = vmulpd_avx512f(local_4780,local_3c80);
      auVar113 = vaddpd_avx512f(auVar109,auVar113);
      auVar109 = vmulpd_avx512f(local_4b40,local_4440);
      auVar110 = vmulpd_avx512f(local_4840,local_4140);
      auVar109 = vaddpd_avx512f(auVar109,auVar110);
      auVar110 = vmulpd_avx512f(local_4540,local_3e40);
      auVar109 = vaddpd_avx512f(auVar109,auVar110);
      auVar110 = vmulpd_avx512f(local_4d40,local_4240);
      auVar109 = vaddpd_avx512f(auVar110,auVar109);
      auVar110 = vmulpd_avx512f(local_4a40,local_3f40);
      auVar109 = vaddpd_avx512f(auVar110,auVar109);
      auVar110 = vmulpd_avx512f(local_4740,local_3c40);
      auVar109 = vaddpd_avx512f(auVar110,auVar109);
      auVar110 = vmulpd_avx512f(local_3800,local_4c00);
      auVar112 = vmulpd_avx512f(local_4b00,local_4900);
      auVar110 = vaddpd_avx512f(auVar110,auVar112);
      auVar112 = vmulpd_avx512f(local_4800,local_4600);
      auVar110 = vaddpd_avx512f(auVar110,auVar112);
      auVar112 = vmulpd_avx512f(local_4dc0,local_4bc0);
      auVar114 = vmulpd_avx512f(local_4ac0,local_48c0);
      auVar112 = vaddpd_avx512f(auVar112,auVar114);
      auVar114 = vmulpd_avx512f(local_47c0,local_45c0);
      auVar112 = vaddpd_avx512f(auVar112,auVar114);
      auVar114 = vmulpd_avx512f(local_4d80,local_4b80);
      auVar115 = vmulpd_avx512f(local_4a80,local_4880);
      auVar114 = vaddpd_avx512f(auVar114,auVar115);
      auVar115 = vmulpd_avx512f(local_4780,local_4580);
      auVar114 = vaddpd_avx512f(auVar114,auVar115);
      auVar115 = vmulpd_avx512f(local_4d40,local_4b40);
      auVar116 = vmulpd_avx512f(local_4a40,local_4840);
      auVar115 = vaddpd_avx512f(auVar115,auVar116);
      auVar116 = vmulpd_avx512f(local_4740,local_4540);
      auVar115 = vaddpd_avx512f(auVar115,auVar116);
      auVar117 = vmulpd_avx512f(auVar111,auVar117);
      local_5b80 = vaddpd_avx512f(auVar110,auVar117);
      auVar117 = vmulpd_avx512f(auVar111,local_5240);
      local_5bc0 = vaddpd_avx512f(auVar112,auVar117);
      auVar117 = vmulpd_avx512f(auVar111,auVar113);
      local_5c00 = vaddpd_avx512f(auVar114,auVar117);
      auVar117 = vmulpd_avx512f(auVar111,auVar109);
      auVar112 = vaddpd_avx512f(auVar115,auVar117);
      auVar117 = vmulpd_avx512f(local_4d00,local_4500);
      auVar113 = vmulpd_avx512f(local_4a00,local_4200);
      auVar117 = vaddpd_avx512f(auVar117,auVar113);
      auVar113 = vmulpd_avx512f(local_4700,local_3f00);
      auVar117 = vaddpd_avx512f(auVar117,auVar113);
      auVar113 = vmulpd_avx512f(local_3800,local_4400);
      auVar117 = vaddpd_avx512f(auVar113,auVar117);
      auVar113 = vmulpd_avx512f(local_4b00,local_4100);
      auVar117 = vaddpd_avx512f(auVar113,auVar117);
      auVar113 = vmulpd_avx512f(local_4800,local_3e00);
      auVar110 = vaddpd_avx512f(auVar113,auVar117);
      auVar117 = vmulpd_avx512f(local_4cc0,local_44c0);
      auVar113 = vmulpd_avx512f(local_49c0,local_41c0);
      auVar117 = vaddpd_avx512f(auVar117,auVar113);
      auVar113 = vmulpd_avx512f(local_46c0,local_3ec0);
      auVar117 = vaddpd_avx512f(auVar117,auVar113);
      auVar113 = vmulpd_avx512f(local_4dc0,local_43c0);
      auVar117 = vaddpd_avx512f(auVar113,auVar117);
      auVar113 = vmulpd_avx512f(local_4ac0,local_40c0);
      auVar117 = vaddpd_avx512f(auVar113,auVar117);
      auVar113 = vmulpd_avx512f(local_47c0,local_3dc0);
      auVar114 = vaddpd_avx512f(auVar113,auVar117);
      auVar117 = vmulpd_avx512f(local_4c80,local_4480);
      auVar113 = vmulpd_avx512f(local_4980,local_4180);
      auVar117 = vaddpd_avx512f(auVar117,auVar113);
      auVar113 = vmulpd_avx512f(local_4680,local_3e80);
      auVar117 = vaddpd_avx512f(auVar117,auVar113);
      auVar113 = vmulpd_avx512f(local_4d80,local_4380);
      auVar117 = vaddpd_avx512f(auVar113,auVar117);
      auVar113 = vmulpd_avx512f(local_4a80,local_4080);
      auVar117 = vaddpd_avx512f(auVar113,auVar117);
      auVar113 = vmulpd_avx512f(local_4780,local_3d80);
      auVar115 = vaddpd_avx512f(auVar113,auVar117);
      auVar117 = vmulpd_avx512f(local_4c40,local_4440);
      auVar113 = vmulpd_avx512f(local_4940,local_4140);
      auVar117 = vaddpd_avx512f(auVar117,auVar113);
      auVar113 = vmulpd_avx512f(local_4640,local_3e40);
      auVar117 = vaddpd_avx512f(auVar117,auVar113);
      auVar113 = vmulpd_avx512f(local_4d40,local_4340);
      auVar117 = vaddpd_avx512f(auVar113,auVar117);
      auVar113 = vmulpd_avx512f(local_4a40,local_4040);
      auVar117 = vaddpd_avx512f(auVar113,auVar117);
      auVar113 = vmulpd_avx512f(local_4740,local_3d40);
      auVar116 = vaddpd_avx512f(auVar113,auVar117);
      auVar117 = vmulpd_avx512f(local_3800,local_4d00);
      auVar113 = vmulpd_avx512f(local_4b00,local_4a00);
      auVar117 = vaddpd_avx512f(auVar117,auVar113);
      auVar113 = vmulpd_avx512f(local_4800,local_4700);
      auVar118 = vaddpd_avx512f(auVar117,auVar113);
      auVar117 = vmulpd_avx512f(local_4dc0,local_4cc0);
      auVar113 = vmulpd_avx512f(local_4ac0,local_49c0);
      auVar117 = vaddpd_avx512f(auVar117,auVar113);
      auVar113 = vmulpd_avx512f(local_47c0,local_46c0);
      auVar119 = vaddpd_avx512f(auVar117,auVar113);
      auVar117 = vmulpd_avx512f(local_4d80,local_4c80);
      auVar113 = vmulpd_avx512f(local_4a80,local_4980);
      auVar117 = vaddpd_avx512f(auVar117,auVar113);
      auVar113 = vmulpd_avx512f(local_4780,local_4680);
      auVar120 = vaddpd_avx512f(auVar117,auVar113);
      auVar117 = vmulpd_avx512f(local_4d40,local_4c40);
      auVar113 = vmulpd_avx512f(local_4a40,local_4940);
      pdVar100 = (this->m_kGQ).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_data;
      auVar109 = vaddpd_avx512f(auVar117,auVar113);
      auVar117 = *(undefined1 (*) [64])(pdVar100 + local_61c0._0_8_);
      local_5dc0 = vmulpd_avx512f(auVar117,local_3480);
      auVar121 = vmulpd_avx512f(local_4740,local_4640);
      auVar113 = *(undefined1 (*) [64])(pdVar100 + local_61c0._0_8_ + 8);
      local_5c80 = vmulpd_avx512f(auVar113,local_3440);
      auVar121 = vaddpd_avx512f(auVar109,auVar121);
      auVar109 = *(undefined1 (*) [64])(pdVar100 + local_61c0._0_8_ + 0x10);
      local_5c40 = vmulpd_avx512f(auVar109,local_3400);
      auVar110 = vmulpd_avx512f(auVar111,auVar110);
      auVar118 = vaddpd_avx512f(auVar118,auVar110);
      auVar110 = *(undefined1 (*) [64])(pdVar100 + local_61c0._0_8_ + 0x18);
      local_6200 = vmulpd_avx512f(auVar110,local_33c0);
      local_5e00 = vmulpd_avx512f(auVar117,local_3640);
      local_5f40 = vmulpd_avx512f(auVar113,local_3680);
      local_5d80 = vmulpd_avx512f(auVar109,local_36c0);
      local_6280 = vmulpd_avx512f(auVar110,local_3700);
      local_5e80 = vmulpd_avx512f(auVar117,local_38c0);
      local_5f80 = vmulpd_avx512f(auVar113,local_3900);
      local_5e40 = vmulpd_avx512f(auVar109,local_3940);
      local_61c0 = vmulpd_avx512f(auVar110,local_3980);
      local_5d00 = vmulpd_avx512f(auVar117,local_5200);
      local_5fc0 = vmulpd_avx512f(auVar113,local_39c0);
      local_6140 = vmulpd_avx512f(auVar109,local_3a00);
      local_5d40 = vmulpd_avx512f(auVar110,local_3a40);
      local_5f00 = vmulpd_avx512f(auVar117,local_5b80);
      local_6000 = vmulpd_avx512f(auVar113,local_5bc0);
      local_6400 = vmulpd_avx512f(auVar109,local_5c00);
      local_5cc0 = vmulpd_avx512f(auVar110,auVar112);
      auVar112 = vmulpd_avx512f(auVar111,auVar114);
      auVar112 = vaddpd_avx512f(auVar119,auVar112);
      auVar114 = vmulpd_avx512f(auVar111,auVar115);
      auVar114 = vaddpd_avx512f(auVar120,auVar114);
      auVar111 = vmulpd_avx512f(auVar111,auVar116);
      auVar111 = vaddpd_avx512f(auVar121,auVar111);
      local_6040 = vmulpd_avx512f(auVar117,auVar118);
      local_5ec0 = vmulpd_avx512f(auVar113,auVar112);
      local_6100 = vmulpd_avx512f(auVar109,auVar114);
      local_60c0._0_64_ = vmulpd_avx512f(auVar110,auVar111);
      auVar37._8_8_ = 0;
      auVar37._0_8_ = local_63a0._0_8_;
      auVar117 = vbroadcastsd_avx512f(auVar37);
      auVar113 = vmulpd_avx512f(local_5dc0,auVar117);
      auVar38._8_8_ = 0;
      auVar38._0_8_ = local_63a0._8_8_;
      auVar109 = vbroadcastsd_avx512f(auVar38);
      auVar39._8_8_ = 0;
      auVar39._0_8_ = local_63a0._16_8_;
      auVar110 = vbroadcastsd_avx512f(auVar39);
      auVar111 = vmulpd_avx512f(local_5e00,auVar109);
      auVar113 = vaddpd_avx512f(auVar113,auVar111);
      auVar111 = vmulpd_avx512f(local_5e80,auVar110);
      auVar40._8_8_ = 0;
      auVar40._0_8_ = local_63a0._24_8_;
      auVar112 = vbroadcastsd_avx512f(auVar40);
      auVar113 = vaddpd_avx512f(auVar113,auVar111);
      auVar111 = vmulpd_avx512f(local_5d00,auVar112);
      auVar113 = vaddpd_avx512f(auVar113,auVar111);
      auVar41._8_8_ = 0;
      auVar41._0_8_ = local_63a0._32_8_;
      auVar111 = vbroadcastsd_avx512f(auVar41);
      auVar114 = vmulpd_avx512f(local_5f00,auVar111);
      auVar113 = vaddpd_avx512f(auVar113,auVar114);
      auVar42._8_8_ = 0;
      auVar42._0_8_ = local_63a0._40_8_;
      auVar114 = vbroadcastsd_avx512f(auVar42);
      auVar115 = vmulpd_avx512f(local_6040,auVar114);
      auVar113 = vaddpd_avx512f(auVar113,auVar115);
      auVar115 = vmulpd_avx512f(local_5c80,auVar117);
      auVar116 = vmulpd_avx512f(local_5f40,auVar109);
      auVar115 = vaddpd_avx512f(auVar115,auVar116);
      auVar116 = vmulpd_avx512f(local_5f80,auVar110);
      auVar115 = vaddpd_avx512f(auVar115,auVar116);
      auVar116 = vmulpd_avx512f(local_5fc0,auVar112);
      auVar115 = vaddpd_avx512f(auVar115,auVar116);
      auVar116 = vmulpd_avx512f(local_6000,auVar111);
      auVar115 = vaddpd_avx512f(auVar115,auVar116);
      auVar116 = vmulpd_avx512f(local_5ec0,auVar114);
      auVar115 = vaddpd_avx512f(auVar115,auVar116);
      auVar116 = vmulpd_avx512f(local_5c40,auVar117);
      auVar118 = vmulpd_avx512f(local_5d80,auVar109);
      auVar116 = vaddpd_avx512f(auVar116,auVar118);
      auVar118 = vmulpd_avx512f(local_5e40,auVar110);
      auVar116 = vaddpd_avx512f(auVar116,auVar118);
      auVar118 = vmulpd_avx512f(local_6140,auVar112);
      auVar116 = vaddpd_avx512f(auVar116,auVar118);
      auVar118 = vmulpd_avx512f(local_6400,auVar111);
      auVar116 = vaddpd_avx512f(auVar116,auVar118);
      auVar118 = vmulpd_avx512f(local_6100,auVar114);
      auVar116 = vaddpd_avx512f(auVar116,auVar118);
      auVar117 = vmulpd_avx512f(local_6200,auVar117);
      auVar109 = vmulpd_avx512f(local_6280,auVar109);
      auVar117 = vaddpd_avx512f(auVar117,auVar109);
      auVar109 = vmulpd_avx512f(local_61c0,auVar110);
      auVar117 = vaddpd_avx512f(auVar117,auVar109);
      auVar109 = vmulpd_avx512f(auVar112,local_5d40);
      auVar117 = vaddpd_avx512f(auVar117,auVar109);
      auVar109 = vmulpd_avx512f(local_5cc0,auVar111);
      auVar117 = vaddpd_avx512f(auVar117,auVar109);
      auVar109 = vmulpd_avx512f(local_60c0._0_64_,auVar114);
      auVar43._8_8_ = 0;
      auVar43._0_8_ = local_63a0._48_8_;
      auVar110 = vbroadcastsd_avx512f(auVar43);
      auVar117 = vaddpd_avx512f(auVar117,auVar109);
      auVar109 = vmulpd_avx512f(local_5dc0,auVar110);
      auVar44._8_8_ = 0;
      auVar44._0_8_ = local_63a0._56_8_;
      auVar111 = vbroadcastsd_avx512f(auVar44);
      auVar112 = vmulpd_avx512f(local_5e00,auVar111);
      auVar109 = vaddpd_avx512f(auVar109,auVar112);
      auVar45._8_8_ = 0;
      auVar45._0_8_ = local_63a0._64_8_;
      auVar112 = vbroadcastsd_avx512f(auVar45);
      auVar114 = vmulpd_avx512f(local_5e80,auVar112);
      auVar109 = vaddpd_avx512f(auVar109,auVar114);
      auVar46._8_8_ = 0;
      auVar46._0_8_ = local_63a0._72_8_;
      auVar114 = vbroadcastsd_avx512f(auVar46);
      auVar47._8_8_ = 0;
      auVar47._0_8_ = local_63a0._80_8_;
      auVar118 = vbroadcastsd_avx512f(auVar47);
      auVar119 = vmulpd_avx512f(local_5d00,auVar114);
      auVar109 = vaddpd_avx512f(auVar109,auVar119);
      auVar119 = vmulpd_avx512f(local_5f00,auVar118);
      auVar48._8_8_ = 0;
      auVar48._0_8_ = local_63a0._88_8_;
      auVar120 = vbroadcastsd_avx512f(auVar48);
      auVar109 = vaddpd_avx512f(auVar109,auVar119);
      auVar119 = vmulpd_avx512f(local_6040,auVar120);
      auVar109 = vaddpd_avx512f(auVar109,auVar119);
      auVar119 = vmulpd_avx512f(local_5c80,auVar110);
      auVar121 = vmulpd_avx512f(local_5f40,auVar111);
      auVar119 = vaddpd_avx512f(auVar119,auVar121);
      auVar121 = vmulpd_avx512f(local_5f80,auVar112);
      auVar119 = vaddpd_avx512f(auVar119,auVar121);
      auVar121 = vmulpd_avx512f(local_5fc0,auVar114);
      auVar119 = vaddpd_avx512f(auVar119,auVar121);
      auVar121 = vmulpd_avx512f(local_6000,auVar118);
      auVar119 = vaddpd_avx512f(auVar119,auVar121);
      auVar121 = vmulpd_avx512f(local_5ec0,auVar120);
      auVar119 = vaddpd_avx512f(auVar119,auVar121);
      auVar121 = vmulpd_avx512f(local_5c40,auVar110);
      auVar122 = vmulpd_avx512f(local_5d80,auVar111);
      auVar121 = vaddpd_avx512f(auVar121,auVar122);
      auVar122 = vmulpd_avx512f(local_5e40,auVar112);
      auVar121 = vaddpd_avx512f(auVar121,auVar122);
      auVar122 = vmulpd_avx512f(local_6140,auVar114);
      auVar121 = vaddpd_avx512f(auVar121,auVar122);
      auVar122 = vmulpd_avx512f(local_6400,auVar118);
      auVar121 = vaddpd_avx512f(auVar121,auVar122);
      auVar122 = vmulpd_avx512f(local_6100,auVar120);
      auVar121 = vaddpd_avx512f(auVar121,auVar122);
      auVar110 = vmulpd_avx512f(local_6200,auVar110);
      auVar111 = vmulpd_avx512f(local_6280,auVar111);
      auVar110 = vaddpd_avx512f(auVar110,auVar111);
      auVar111 = vmulpd_avx512f(local_61c0,auVar112);
      auVar110 = vaddpd_avx512f(auVar110,auVar111);
      auVar111 = vmulpd_avx512f(local_5d40,auVar114);
      auVar110 = vaddpd_avx512f(auVar110,auVar111);
      auVar111 = vmulpd_avx512f(local_5cc0,auVar118);
      auVar110 = vaddpd_avx512f(auVar110,auVar111);
      auVar111 = vmulpd_avx512f(local_60c0._0_64_,auVar120);
      auVar110 = vaddpd_avx512f(auVar110,auVar111);
      auVar49._8_8_ = 0;
      auVar49._0_8_ = local_6340;
      auVar111 = vbroadcastsd_avx512f(auVar49);
      auVar50._8_8_ = 0;
      auVar50._0_8_ = local_6338;
      auVar112 = vbroadcastsd_avx512f(auVar50);
      auVar114 = vmulpd_avx512f(local_5dc0,auVar111);
      auVar118 = vmulpd_avx512f(auVar112,local_5e00);
      auVar114 = vaddpd_avx512f(auVar114,auVar118);
      auVar51._8_8_ = 0;
      auVar51._0_8_ = local_6330;
      auVar118 = vbroadcastsd_avx512f(auVar51);
      auVar120 = vmulpd_avx512f(auVar118,local_5e80);
      auVar114 = vaddpd_avx512f(auVar114,auVar120);
      auVar52._8_8_ = 0;
      auVar52._0_8_ = local_6328;
      auVar120 = vbroadcastsd_avx512f(auVar52);
      auVar122 = vmulpd_avx512f(local_5d00,auVar120);
      auVar114 = vaddpd_avx512f(auVar114,auVar122);
      auVar53._8_8_ = 0;
      auVar53._0_8_ = local_6320;
      auVar122 = vbroadcastsd_avx512f(auVar53);
      auVar123 = vmulpd_avx512f(auVar122,local_5f00);
      auVar114 = vaddpd_avx512f(auVar114,auVar123);
      auVar54._8_8_ = 0;
      auVar54._0_8_ = local_6318;
      auVar123 = vbroadcastsd_avx512f(auVar54);
      auVar124 = vmulpd_avx512f(auVar123,local_6040);
      auVar114 = vaddpd_avx512f(auVar114,auVar124);
      auVar124 = vmulpd_avx512f(local_5c80,auVar111);
      auVar125 = vmulpd_avx512f(auVar112,local_5f40);
      auVar124 = vaddpd_avx512f(auVar124,auVar125);
      auVar125 = vmulpd_avx512f(auVar118,local_5f80);
      auVar124 = vaddpd_avx512f(auVar124,auVar125);
      auVar125 = vmulpd_avx512f(auVar120,local_5fc0);
      auVar124 = vaddpd_avx512f(auVar124,auVar125);
      auVar125 = vmulpd_avx512f(auVar122,local_6000);
      auVar124 = vaddpd_avx512f(auVar124,auVar125);
      auVar125 = vmulpd_avx512f(local_5ec0,auVar123);
      auVar124 = vaddpd_avx512f(auVar124,auVar125);
      auVar125 = vmulpd_avx512f(local_5c40,auVar111);
      auVar126 = vmulpd_avx512f(local_5d80,auVar112);
      auVar125 = vaddpd_avx512f(auVar125,auVar126);
      auVar126 = vmulpd_avx512f(local_5e40,auVar118);
      auVar125 = vaddpd_avx512f(auVar125,auVar126);
      auVar126 = vmulpd_avx512f(local_6140,auVar120);
      auVar125 = vaddpd_avx512f(auVar125,auVar126);
      auVar126 = vmulpd_avx512f(local_6400,auVar122);
      auVar125 = vaddpd_avx512f(auVar125,auVar126);
      auVar126 = vmulpd_avx512f(local_6100,auVar123);
      auVar125 = vaddpd_avx512f(auVar125,auVar126);
      auVar111 = vmulpd_avx512f(auVar111,local_6200);
      auVar112 = vmulpd_avx512f(local_6280,auVar112);
      auVar111 = vaddpd_avx512f(auVar111,auVar112);
      auVar112 = vmulpd_avx512f(local_61c0,auVar118);
      auVar111 = vaddpd_avx512f(auVar111,auVar112);
      auVar112 = vmulpd_avx512f(local_5d40,auVar120);
      auVar111 = vaddpd_avx512f(auVar111,auVar112);
      auVar112 = vmulpd_avx512f(local_5cc0,auVar122);
      auVar111 = vaddpd_avx512f(auVar111,auVar112);
      auVar112 = vmulpd_avx512f(local_60c0._0_64_,auVar123);
      auVar111 = vaddpd_avx512f(auVar111,auVar112);
      auVar55._8_8_ = 0;
      auVar55._0_8_ = local_6310;
      auVar112 = vbroadcastsd_avx512f(auVar55);
      auVar118 = vmulpd_avx512f(local_5dc0,auVar112);
      auVar56._8_8_ = 0;
      auVar56._0_8_ = local_6308;
      auVar120 = vbroadcastsd_avx512f(auVar56);
      auVar57._8_8_ = 0;
      auVar57._0_8_ = local_6300;
      auVar122 = vbroadcastsd_avx512f(auVar57);
      auVar123 = vmulpd_avx512f(local_5e00,auVar120);
      auVar118 = vaddpd_avx512f(auVar118,auVar123);
      auVar123 = vmulpd_avx512f(local_5e80,auVar122);
      auVar58._8_8_ = 0;
      auVar58._0_8_ = local_62f8;
      auVar126 = vbroadcastsd_avx512f(auVar58);
      auVar118 = vaddpd_avx512f(auVar118,auVar123);
      auVar123 = vmulpd_avx512f(local_5d00,auVar126);
      auVar118 = vaddpd_avx512f(auVar118,auVar123);
      auVar59._8_8_ = 0;
      auVar59._0_8_ = local_62f0;
      auVar123 = vbroadcastsd_avx512f(auVar59);
      auVar127 = vmulpd_avx512f(local_5f00,auVar123);
      auVar118 = vaddpd_avx512f(auVar118,auVar127);
      auVar60._8_8_ = 0;
      auVar60._0_8_ = local_62e8;
      auVar127 = vbroadcastsd_avx512f(auVar60);
      auVar128 = vmulpd_avx512f(local_6040,auVar127);
      auVar118 = vaddpd_avx512f(auVar118,auVar128);
      auVar128 = vmulpd_avx512f(local_5c80,auVar112);
      auVar129 = vmulpd_avx512f(local_5f40,auVar120);
      auVar128 = vaddpd_avx512f(auVar128,auVar129);
      auVar129 = vmulpd_avx512f(local_5f80,auVar122);
      auVar128 = vaddpd_avx512f(auVar128,auVar129);
      auVar129 = vmulpd_avx512f(local_5fc0,auVar126);
      auVar128 = vaddpd_avx512f(auVar128,auVar129);
      auVar129 = vmulpd_avx512f(local_6000,auVar123);
      auVar128 = vaddpd_avx512f(auVar128,auVar129);
      auVar129 = vmulpd_avx512f(local_5ec0,auVar127);
      auVar128 = vaddpd_avx512f(auVar128,auVar129);
      auVar129 = vmulpd_avx512f(auVar112,local_5c40);
      auVar130 = vmulpd_avx512f(auVar120,local_5d80);
      auVar129 = vaddpd_avx512f(auVar129,auVar130);
      auVar130 = vmulpd_avx512f(auVar122,local_5e40);
      auVar129 = vaddpd_avx512f(auVar129,auVar130);
      auVar130 = vmulpd_avx512f(auVar126,local_6140);
      auVar129 = vaddpd_avx512f(auVar129,auVar130);
      auVar130 = vmulpd_avx512f(auVar123,local_6400);
      auVar129 = vaddpd_avx512f(auVar129,auVar130);
      auVar130 = vmulpd_avx512f(auVar127,local_6100);
      auVar129 = vaddpd_avx512f(auVar129,auVar130);
      auVar112 = vmulpd_avx512f(auVar112,local_6200);
      auVar120 = vmulpd_avx512f(auVar120,local_6280);
      auVar112 = vaddpd_avx512f(auVar112,auVar120);
      auVar120 = vmulpd_avx512f(auVar122,local_61c0);
      auVar112 = vaddpd_avx512f(auVar112,auVar120);
      auVar120 = vmulpd_avx512f(auVar126,local_5d40);
      auVar112 = vaddpd_avx512f(auVar112,auVar120);
      auVar120 = vmulpd_avx512f(local_5cc0,auVar123);
      auVar112 = vaddpd_avx512f(auVar112,auVar120);
      auVar120 = vmulpd_avx512f(auVar127,local_60c0._0_64_);
      auVar61._8_8_ = 0;
      auVar61._0_8_ = local_62e0;
      auVar122 = vbroadcastsd_avx512f(auVar61);
      auVar112 = vaddpd_avx512f(auVar112,auVar120);
      auVar120 = vmulpd_avx512f(auVar122,local_5dc0);
      auVar62._8_8_ = 0;
      auVar62._0_8_ = local_62d8;
      auVar123 = vbroadcastsd_avx512f(auVar62);
      auVar126 = vmulpd_avx512f(local_5e00,auVar123);
      auVar120 = vaddpd_avx512f(auVar120,auVar126);
      auVar63._8_8_ = 0;
      auVar63._0_8_ = local_62d0;
      auVar126 = vbroadcastsd_avx512f(auVar63);
      auVar127 = vmulpd_avx512f(local_5e80,auVar126);
      auVar120 = vaddpd_avx512f(auVar120,auVar127);
      auVar64._8_8_ = 0;
      auVar64._0_8_ = local_62c8;
      auVar127 = vbroadcastsd_avx512f(auVar64);
      auVar65._8_8_ = 0;
      auVar65._0_8_ = local_62c0;
      auVar130 = vbroadcastsd_avx512f(auVar65);
      auVar131 = vmulpd_avx512f(local_5d00,auVar127);
      auVar120 = vaddpd_avx512f(auVar120,auVar131);
      auVar131 = vmulpd_avx512f(local_5f00,auVar130);
      auVar66._8_8_ = 0;
      auVar66._0_8_ = local_62b8;
      auVar132 = vbroadcastsd_avx512f(auVar66);
      auVar120 = vaddpd_avx512f(auVar120,auVar131);
      auVar131 = vmulpd_avx512f(local_6040,auVar132);
      auVar120 = vaddpd_avx512f(auVar120,auVar131);
      auVar131 = vmulpd_avx512f(auVar122,local_5c80);
      auVar133 = vmulpd_avx512f(local_5f40,auVar123);
      auVar131 = vaddpd_avx512f(auVar131,auVar133);
      auVar133 = vmulpd_avx512f(local_5f80,auVar126);
      auVar131 = vaddpd_avx512f(auVar131,auVar133);
      auVar133 = vmulpd_avx512f(local_5fc0,auVar127);
      auVar131 = vaddpd_avx512f(auVar131,auVar133);
      auVar133 = vmulpd_avx512f(local_6000,auVar130);
      auVar131 = vaddpd_avx512f(auVar131,auVar133);
      auVar133 = vmulpd_avx512f(auVar132,local_5ec0);
      auVar131 = vaddpd_avx512f(auVar131,auVar133);
      auVar133 = vmulpd_avx512f(local_5c40,auVar122);
      auVar134 = vmulpd_avx512f(auVar123,local_5d80);
      auVar133 = vaddpd_avx512f(auVar133,auVar134);
      auVar134 = vmulpd_avx512f(local_5e40,auVar126);
      auVar133 = vaddpd_avx512f(auVar133,auVar134);
      auVar134 = vmulpd_avx512f(auVar127,local_6140);
      auVar133 = vaddpd_avx512f(auVar133,auVar134);
      auVar134 = vmulpd_avx512f(auVar130,local_6400);
      auVar133 = vaddpd_avx512f(auVar133,auVar134);
      auVar134 = vmulpd_avx512f(auVar132,local_6100);
      auVar133 = vaddpd_avx512f(auVar133,auVar134);
      auVar122 = vmulpd_avx512f(local_6200,auVar122);
      auVar123 = vmulpd_avx512f(auVar123,local_6280);
      auVar122 = vaddpd_avx512f(auVar122,auVar123);
      auVar123 = vmulpd_avx512f(auVar126,local_61c0);
      auVar122 = vaddpd_avx512f(auVar122,auVar123);
      auVar123 = vmulpd_avx512f(auVar127,local_5d40);
      auVar122 = vaddpd_avx512f(auVar122,auVar123);
      auVar123 = vmulpd_avx512f(auVar130,local_5cc0);
      auVar122 = vaddpd_avx512f(auVar122,auVar123);
      auVar123 = vmulpd_avx512f(auVar132,local_60c0._0_64_);
      auVar122 = vaddpd_avx512f(auVar122,auVar123);
      auVar67._8_8_ = 0;
      auVar67._0_8_ = local_62b0;
      auVar123 = vbroadcastsd_avx512f(auVar67);
      auVar68._8_8_ = 0;
      auVar68._0_8_ = local_62a8;
      auVar126 = vbroadcastsd_avx512f(auVar68);
      auVar127 = vmulpd_avx512f(auVar123,local_5dc0);
      auVar130 = vmulpd_avx512f(auVar126,local_5e00);
      auVar127 = vaddpd_avx512f(auVar127,auVar130);
      auVar69._8_8_ = 0;
      auVar69._0_8_ = local_62a0;
      auVar130 = vbroadcastsd_avx512f(auVar69);
      auVar132 = vmulpd_avx512f(auVar130,local_5e80);
      auVar127 = vaddpd_avx512f(auVar127,auVar132);
      auVar70._8_8_ = 0;
      auVar70._0_8_ = local_6298;
      auVar132 = vbroadcastsd_avx512f(auVar70);
      auVar134 = vmulpd_avx512f(local_5d00,auVar132);
      auVar127 = vaddpd_avx512f(auVar127,auVar134);
      auVar71._8_8_ = 0;
      auVar71._0_8_ = local_6290;
      auVar134 = vbroadcastsd_avx512f(auVar71);
      auVar135 = vmulpd_avx512f(auVar134,local_5f00);
      auVar127 = vaddpd_avx512f(auVar127,auVar135);
      auVar72._8_8_ = 0;
      auVar72._0_8_ = local_6288;
      auVar135 = vbroadcastsd_avx512f(auVar72);
      auVar136 = vmulpd_avx512f(auVar135,local_6040);
      auVar127 = vaddpd_avx512f(auVar127,auVar136);
      auVar136 = vmulpd_avx512f(auVar123,local_5c80);
      auVar137 = vmulpd_avx512f(auVar126,local_5f40);
      auVar136 = vaddpd_avx512f(auVar136,auVar137);
      auVar137 = vmulpd_avx512f(auVar130,local_5f80);
      auVar136 = vaddpd_avx512f(auVar136,auVar137);
      auVar137 = vmulpd_avx512f(auVar132,local_5fc0);
      auVar136 = vaddpd_avx512f(auVar136,auVar137);
      auVar137 = vmulpd_avx512f(auVar134,local_6000);
      auVar136 = vaddpd_avx512f(auVar136,auVar137);
      auVar137 = vmulpd_avx512f(auVar135,local_5ec0);
      auVar136 = vaddpd_avx512f(auVar136,auVar137);
      auVar137 = vmulpd_avx512f(local_5c40,auVar123);
      auVar138 = vmulpd_avx512f(auVar126,local_5d80);
      auVar137 = vaddpd_avx512f(auVar137,auVar138);
      auVar138 = vmulpd_avx512f(local_5e40,auVar130);
      auVar137 = vaddpd_avx512f(auVar137,auVar138);
      auVar138 = vmulpd_avx512f(auVar132,local_6140);
      auVar137 = vaddpd_avx512f(auVar137,auVar138);
      auVar138 = vmulpd_avx512f(auVar134,local_6400);
      auVar137 = vaddpd_avx512f(auVar137,auVar138);
      auVar138 = vmulpd_avx512f(auVar135,local_6100);
      auVar137 = vaddpd_avx512f(auVar137,auVar138);
      auVar123 = vmulpd_avx512f(local_6200,auVar123);
      auVar126 = vmulpd_avx512f(auVar126,local_6280);
      auVar123 = vaddpd_avx512f(auVar123,auVar126);
      auVar126 = vmulpd_avx512f(auVar130,local_61c0);
      auVar123 = vaddpd_avx512f(auVar123,auVar126);
      auVar126 = vmulpd_avx512f(auVar132,local_5d40);
      auVar123 = vaddpd_avx512f(auVar123,auVar126);
      auVar126 = vmulpd_avx512f(auVar134,local_5cc0);
      auVar123 = vaddpd_avx512f(auVar123,auVar126);
      auVar126 = vmulpd_avx512f(auVar135,local_60c0._0_64_);
      auVar123 = vaddpd_avx512f(auVar123,auVar126);
      pdVar100 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                 m_storage.m_data;
      lVar90 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
               m_storage.m_rows;
      uVar87 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
               m_storage.m_rows;
      pauVar92 = (undefined1 (*) [64])local_2dc0;
      uVar105 = 0;
      pdVar103 = pdVar100;
      pdVar106 = pdVar100;
      do {
        if ((((~((long)uVar87 >> 0x3f) & uVar87) == uVar105) || (iVar82 < 0 || lVar91 < lVar95)) ||
           (iVar88 < 0 || lVar91 < lVar89)) goto LAB_0078eefb;
        auVar126 = vmulpd_avx512f(auVar113,*(undefined1 (*) [64])(pdVar103 + local_6490));
        auVar130 = vmulpd_avx512f(auVar127,*(undefined1 (*) [64])(pdVar103 + lVar84));
        auVar126 = vaddpd_avx512f(auVar126,auVar130);
        auVar130 = vmulpd_avx512f(auVar120,*(undefined1 (*) [64])(pdVar103 + lVar83));
        auVar126 = vaddpd_avx512f(auVar126,auVar130);
        pauVar92[-0xb] = auVar126;
        auVar126 = vmulpd_avx512f(auVar115,*(undefined1 (*) [64])(pdVar103 + local_6490 + 8));
        auVar130 = vmulpd_avx512f(auVar136,*(undefined1 (*) [64])(pdVar103 + lVar84 + 8));
        auVar126 = vaddpd_avx512f(auVar126,auVar130);
        auVar130 = vmulpd_avx512f(auVar131,*(undefined1 (*) [64])(pdVar103 + lVar83 + 8));
        auVar126 = vaddpd_avx512f(auVar126,auVar130);
        pauVar92[-10] = auVar126;
        auVar126 = vmulpd_avx512f(auVar116,*(undefined1 (*) [64])(pdVar103 + local_6490 + 0x10));
        auVar130 = vmulpd_avx512f(auVar137,*(undefined1 (*) [64])(pdVar103 + lVar84 + 0x10));
        auVar126 = vaddpd_avx512f(auVar126,auVar130);
        auVar130 = vmulpd_avx512f(auVar133,*(undefined1 (*) [64])(pdVar103 + lVar83 + 0x10));
        auVar126 = vaddpd_avx512f(auVar126,auVar130);
        pauVar92[-9] = auVar126;
        auVar126 = vmulpd_avx512f(auVar117,*(undefined1 (*) [64])(pdVar103 + local_6490 + 0x18));
        auVar130 = vmulpd_avx512f(auVar123,*(undefined1 (*) [64])(pdVar103 + lVar84 + 0x18));
        auVar126 = vaddpd_avx512f(auVar126,auVar130);
        auVar130 = vmulpd_avx512f(auVar122,*(undefined1 (*) [64])(pdVar103 + lVar83 + 0x18));
        auVar126 = vaddpd_avx512f(auVar126,auVar130);
        pauVar92[-8] = auVar126;
        if (((lVar90 <= (long)uVar105) || (lVar91 < lVar85)) ||
           ((lVar91 < lVar95 || (lVar91 < lVar89)))) goto LAB_0078eefb;
        auVar126 = vmulpd_avx512f(auVar127,*(undefined1 (*) [64])(pdVar106 + local_6490));
        auVar130 = vmulpd_avx512f(auVar109,*(undefined1 (*) [64])(pdVar106 + lVar84));
        auVar126 = vaddpd_avx512f(auVar126,auVar130);
        auVar130 = vmulpd_avx512f(auVar118,*(undefined1 (*) [64])(pdVar106 + lVar83));
        auVar126 = vaddpd_avx512f(auVar126,auVar130);
        pauVar92[-7] = auVar126;
        auVar126 = vmulpd_avx512f(auVar136,*(undefined1 (*) [64])(pdVar106 + local_6490 + 8));
        auVar130 = vmulpd_avx512f(auVar119,*(undefined1 (*) [64])(pdVar106 + lVar84 + 8));
        auVar126 = vaddpd_avx512f(auVar126,auVar130);
        auVar130 = vmulpd_avx512f(auVar128,*(undefined1 (*) [64])(pdVar106 + lVar83 + 8));
        auVar126 = vaddpd_avx512f(auVar126,auVar130);
        pauVar92[-6] = auVar126;
        auVar126 = vmulpd_avx512f(auVar137,*(undefined1 (*) [64])(pdVar106 + local_6490 + 0x10));
        auVar130 = vmulpd_avx512f(auVar121,*(undefined1 (*) [64])(pdVar106 + lVar84 + 0x10));
        auVar126 = vaddpd_avx512f(auVar126,auVar130);
        auVar130 = vmulpd_avx512f(auVar129,*(undefined1 (*) [64])(pdVar106 + lVar83 + 0x10));
        auVar126 = vaddpd_avx512f(auVar126,auVar130);
        pauVar92[-5] = auVar126;
        auVar126 = vmulpd_avx512f(auVar123,*(undefined1 (*) [64])(pdVar106 + local_6490 + 0x18));
        auVar130 = vmulpd_avx512f(auVar110,*(undefined1 (*) [64])(pdVar106 + lVar84 + 0x18));
        auVar126 = vaddpd_avx512f(auVar126,auVar130);
        auVar130 = vmulpd_avx512f(auVar112,*(undefined1 (*) [64])(pdVar106 + lVar83 + 0x18));
        auVar126 = vaddpd_avx512f(auVar126,auVar130);
        pauVar92[-4] = auVar126;
        if (((lVar90 <= (long)uVar105) || (lVar91 < lVar85)) ||
           ((lVar91 < lVar95 || (lVar91 < lVar89)))) goto LAB_0078eefb;
        auVar126 = vmulpd_avx512f(auVar120,*(undefined1 (*) [64])(pdVar100 + local_6490));
        auVar130 = vmulpd_avx512f(auVar118,*(undefined1 (*) [64])(pdVar100 + lVar84));
        auVar126 = vaddpd_avx512f(auVar126,auVar130);
        auVar130 = vmulpd_avx512f(auVar114,*(undefined1 (*) [64])(pdVar100 + lVar83));
        auVar126 = vaddpd_avx512f(auVar126,auVar130);
        pauVar92[-3] = auVar126;
        auVar126 = vmulpd_avx512f(auVar131,*(undefined1 (*) [64])(pdVar100 + local_6490 + 8));
        auVar130 = vmulpd_avx512f(auVar128,*(undefined1 (*) [64])(pdVar100 + lVar84 + 8));
        auVar126 = vaddpd_avx512f(auVar126,auVar130);
        auVar130 = vmulpd_avx512f(auVar124,*(undefined1 (*) [64])(pdVar100 + lVar83 + 8));
        auVar126 = vaddpd_avx512f(auVar126,auVar130);
        pauVar92[-2] = auVar126;
        auVar126 = vmulpd_avx512f(auVar133,*(undefined1 (*) [64])(pdVar100 + local_6490 + 0x10));
        auVar130 = vmulpd_avx512f(auVar129,*(undefined1 (*) [64])(pdVar100 + lVar84 + 0x10));
        auVar126 = vaddpd_avx512f(auVar126,auVar130);
        auVar130 = vmulpd_avx512f(auVar125,*(undefined1 (*) [64])(pdVar100 + lVar83 + 0x10));
        auVar126 = vaddpd_avx512f(auVar126,auVar130);
        pauVar92[-1] = auVar126;
        auVar126 = vmulpd_avx512f(auVar122,*(undefined1 (*) [64])(pdVar100 + local_6490 + 0x18));
        auVar130 = vmulpd_avx512f(auVar112,*(undefined1 (*) [64])(pdVar100 + lVar84 + 0x18));
        auVar126 = vaddpd_avx512f(auVar126,auVar130);
        auVar130 = vmulpd_avx512f(auVar111,*(undefined1 (*) [64])(pdVar100 + lVar83 + 0x18));
        auVar126 = vaddpd_avx512f(auVar126,auVar130);
        *pauVar92 = auVar126;
        uVar105 = uVar105 + 1;
        pdVar103 = pdVar103 + lVar91;
        pauVar92 = pauVar92 + 0xc;
        pdVar106 = pdVar106 + lVar91;
        pdVar100 = pdVar100 + lVar91;
      } while (uVar105 != 0x10);
      lVar85 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
               m_storage.m_cols;
      local_6100._0_8_ = lVar85;
      if (lVar85 < (long)local_6208) {
LAB_0078ef1d:
        __function = 
        "Eigen::Block<Eigen::Matrix<double, -1, -1, 1>, 1, 96>::Block(XprType &, Index, Index) [XprType = Eigen::Matrix<double, -1, -1, 1>, BlockRows = 1, BlockCols = 96, InnerPanel = false]"
        ;
        goto LAB_0078ef10;
      }
      pdVar100 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                 m_storage.m_data;
      uVar87 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
               m_storage.m_rows;
      uVar87 = ~((long)uVar87 >> 0x3f) & uVar87;
      local_60c0._0_8_ = uVar87;
      lVar83 = 0x10;
      lVar91 = 8;
      pauVar92 = (undefined1 (*) [64])local_2dc0;
      lVar95 = 0;
      lVar84 = 0;
      uVar105 = 0;
      do {
        if (uVar105 == uVar87) goto LAB_0078ef1d;
        lVar101 = lVar85 * uVar105;
        pdVar74 = (H->
                  super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                  ).
                  super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                  .
                  super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                  .m_data;
        lVar94 = (H->
                 super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                 ).
                 super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                 .
                 super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                 .m_rows.m_value;
        lVar99 = (H->
                 super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                 ).m_stride.m_outer.m_value;
        lVar90 = uVar105 * 3 + 1;
        local_6140._0_8_ = uVar105;
        lVar93 = uVar105 * 3 + 2;
        lVar89 = lVar99 + 1;
        lVar98 = lVar83 * lVar89;
        pdVar103 = (double *)((long)pdVar74 + lVar98);
        lVar107 = lVar91 * lVar89;
        local_6280._0_8_ = lVar107;
        local_6200._0_8_ = lVar95;
        lVar89 = lVar89 * lVar95;
        local_6400._0_8_ = lVar89;
        local_61c0._0_8_ = pauVar92;
        lVar97 = 0;
        pauVar96 = pauVar92;
        pdVar104 = pdVar74;
        do {
          local_6050 = local_6048;
          if ((lVar94 <= (long)(uVar105 * 3)) ||
             ((H->
              super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
              ).
              super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
              .
              super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
              .m_cols.m_value <= lVar84 + lVar97)) {
LAB_0078eed9:
            __assert_fail("row >= 0 && row < rows() && col >= 0 && col < cols()",
                          "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x16f,
                          "Scalar &Eigen::DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double, -1, -1, 1>>, 1>::operator()(Index, Index) [Derived = Eigen::Ref<Eigen::Matrix<double, -1, -1, 1>>, Level = 1]"
                         );
          }
          auVar117 = vmulpd_avx512f(local_3c00,*(undefined1 (*) [64])(pdVar100 + uVar102 + lVar101))
          ;
          auVar117 = vmulpd_avx512f(auVar117,pauVar96[-0xb]);
          auVar113 = vmulpd_avx512f(local_3c00,
                                    *(undefined1 (*) [64])(pdVar100 + uVar102 + lVar101 + 8));
          auVar113 = vmulpd_avx512f(auVar113,pauVar96[-10]);
          auVar109 = vmulpd_avx512f(local_3c00,
                                    *(undefined1 (*) [64])(pdVar100 + uVar102 + lVar101 + 0x10));
          auVar109 = vmulpd_avx512f(auVar109,pauVar96[-9]);
          auVar113 = vaddpd_avx512f(auVar113,auVar109);
          auVar117 = vaddpd_avx512f(auVar117,auVar113);
          auVar113 = vmulpd_avx512f(local_3c00,
                                    *(undefined1 (*) [64])(pdVar100 + uVar102 + lVar101 + 0x18));
          auVar113 = vmulpd_avx512f(auVar113,pauVar96[-8]);
          auVar109 = vmulpd_avx512f(local_3c00,
                                    *(undefined1 (*) [64])(pdVar100 + uVar102 + lVar101 + 0x20));
          auVar109 = vmulpd_avx512f(auVar109,pauVar96[-7]);
          auVar110 = vmulpd_avx512f(local_3c00,
                                    *(undefined1 (*) [64])(pdVar100 + uVar102 + lVar101 + 0x28));
          auVar110 = vmulpd_avx512f(auVar110,pauVar96[-6]);
          auVar109 = vaddpd_avx512f(auVar109,auVar110);
          auVar113 = vaddpd_avx512f(auVar113,auVar109);
          auVar117 = vaddpd_avx512f(auVar117,auVar113);
          auVar113 = vmulpd_avx512f(local_3c00,
                                    *(undefined1 (*) [64])(pdVar100 + uVar102 + lVar101 + 0x30));
          auVar113 = vmulpd_avx512f(auVar113,pauVar96[-5]);
          auVar109 = vmulpd_avx512f(local_3c00,
                                    *(undefined1 (*) [64])(pdVar100 + uVar102 + lVar101 + 0x38));
          auVar109 = vmulpd_avx512f(auVar109,pauVar96[-4]);
          auVar110 = vmulpd_avx512f(local_3c00,
                                    *(undefined1 (*) [64])(pdVar100 + uVar102 + lVar101 + 0x40));
          auVar110 = vmulpd_avx512f(auVar110,pauVar96[-3]);
          auVar109 = vaddpd_avx512f(auVar109,auVar110);
          auVar113 = vaddpd_avx512f(auVar113,auVar109);
          auVar109 = vmulpd_avx512f(local_3c00,
                                    *(undefined1 (*) [64])(pdVar100 + uVar102 + lVar101 + 0x48));
          auVar109 = vmulpd_avx512f(auVar109,pauVar96[-2]);
          auVar110 = vmulpd_avx512f(local_3c00,
                                    *(undefined1 (*) [64])(pdVar100 + uVar102 + lVar101 + 0x50));
          auVar110 = vmulpd_avx512f(auVar110,pauVar96[-1]);
          auVar111 = vmulpd_avx512f(local_3c00,
                                    *(undefined1 (*) [64])(pdVar100 + uVar102 + lVar101 + 0x58));
          auVar111 = vmulpd_avx512f(auVar111,*pauVar96);
          auVar110 = vaddpd_avx512f(auVar110,auVar111);
          auVar109 = vaddpd_avx512f(auVar109,auVar110);
          auVar113 = vaddpd_avx512f(auVar113,auVar109);
          auVar117 = vaddpd_avx512f(auVar117,auVar113);
          auVar108 = vextractf64x4_avx512f(auVar117,1);
          dVar139 = auVar117._0_8_ + auVar108._0_8_ + auVar117._8_8_ + auVar108._8_8_ +
                    auVar117._16_8_ + auVar108._16_8_ + auVar117._24_8_ + auVar108._24_8_;
          *(double *)((long)pdVar74 + lVar97 * 8 + lVar89) =
               dVar139 + *(double *)((long)pdVar74 + lVar97 * 8 + lVar89);
          if ((lVar94 <= lVar90) ||
             (((lVar2 = lVar84 + 1 + lVar97,
               (H->
               super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
               ).
               super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
               .
               super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
               .m_cols.m_value <= lVar2 ||
               (*(double *)((long)pdVar74 + lVar97 * 8 + lVar107) =
                     dVar139 + *(double *)((long)pdVar74 + lVar97 * 8 + lVar107), lVar94 <= lVar93))
              || (lVar3 = lVar84 + 2 + lVar97,
                 (H->
                 super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                 ).
                 super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                 .
                 super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                 .m_cols.m_value <= lVar3)))) goto LAB_0078eed9;
          *(double *)((long)pdVar74 + lVar97 * 8 + lVar98) =
               dVar139 + *(double *)((long)pdVar74 + lVar97 * 8 + lVar98);
          if (lVar97 != 0) {
            if ((((lVar94 <= lVar84 + lVar97) ||
                 ((H->
                  super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                  ).
                  super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                  .
                  super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                  .m_cols.m_value <= (long)(uVar105 * 3))) ||
                ((*(double *)((long)pdVar104 + lVar89) =
                       dVar139 + *(double *)((long)pdVar104 + lVar89), lVar94 <= lVar2 ||
                 (((H->
                   super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                   ).
                   super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                   .
                   super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                   .m_cols.m_value <= lVar90 ||
                  (*(double *)((long)pdVar104 + lVar107) =
                        dVar139 + *(double *)((long)pdVar104 + lVar107), lVar94 <= lVar3)))))) ||
               ((H->
                super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                ).
                super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                .
                super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                .m_cols.m_value <= lVar93)) goto LAB_0078eed9;
            *pdVar103 = dVar139 + *pdVar103;
          }
          pdVar103 = pdVar103 + lVar99 * 3;
          pdVar104 = pdVar104 + lVar99 * 3;
          pauVar96 = pauVar96 + 0xc;
          lVar2 = lVar84 + 3 + lVar97;
          lVar97 = lVar97 + 3;
        } while (lVar2 != 0x30);
        uVar105 = uVar105 + 1;
        lVar84 = lVar84 + 3;
        lVar83 = lVar83 + 0x18;
        lVar91 = lVar91 + 0x18;
        lVar95 = lVar95 + 0x18;
        pauVar92 = pauVar92 + 0xc;
      } while (uVar105 != 0x10);
      if (local_6460.m_data != (double *)0x0) {
        free((void *)local_6460.m_data[-1]);
      }
      if (local_6440.m_data != (double *)0x0) {
        free((void *)local_6440.m_data[-1]);
      }
      if (local_6420.m_data != (double *)0x0) {
        free((void *)local_6420.m_data[-1]);
      }
      lVar85 = local_6408 + 1;
      local_6464 = local_6464 + 0x60;
      local_6468 = local_6468 + 0x60;
      local_6490 = (ulong)((int)local_6490 + 0x60);
    } while (lVar85 < this->m_numLayers);
  }
  return;
}

Assistant:

void ChElementShellANCF_3443::ComputeInternalJacobianContIntDamping(ChMatrixRef& H, double Kfactor, double Rfactor) {
    // Calculate the Jacobian of the generalize internal force vector using the "Continuous Integration" style of method
    // assuming a linear viscoelastic material model (single term damping model).  For this style of method, the
    // Jacobian of the generalized internal force vector is integrated across the volume of the element every time this
    // calculation is performed. For a small number of layers this method can be more efficient than the
    // "Pre-Integration" style calculation method.

    MatrixNx6 ebar_ebardot;
    CalcCombinedCoordMatrix(ebar_ebardot);

    // Zero out the Jacobian matrix since the results from each layer will be added to this value
    H.setZero();

    // Sum the contribution to the Jacobian matrix layer by layer
    for (int kl = 0; kl < m_numLayers; kl++) {
        // No values from the generalized internal force vector are cached for reuse in the Jacobian.  Instead these
        // quantities are recalculated again during the Jacobian calculations.  This both simplifies the code and speeds
        // up the generalized internal force calculation while only having a minimal impact on the performance of the
        // Jacobian calculation speed.  The Jacobian calculation is performed in two major pieces.  First is the
        // calculation of the potentially non-symmetric and non-sparse component.  The second pieces is the symmetric
        // and sparse component.

        // =============================================================================
        // Calculate the deformation gradient and time derivative of the deformation gradient for all Gauss quadrature
        // points in a single matrix multiplication.  Note that since the shape function derivative matrix is ordered by
        // columns, the resulting deformation gradient will be ordered by block matrix (column vectors) components
        // Note that the indices of the components are in transposed order
        //      [F11  F21  F31  F11dot  F21dot  F31dot ]
        // FC = [F12  F22  F32  F12dot  F22dot  F32dot ]
        //      [F13  F23  F33  F13dot  F23dot  F33dot ]
        // =============================================================================

        ChMatrixNMc<double, 3 * NIP, 6> FC = m_SD.block<NSF, 3 * NIP>(0, 3 * NIP * kl).transpose() * ebar_ebardot;

        //==============================================================================
        //==============================================================================
        // Calculate the potentially non-symmetric and non-sparse component of the Jacobian matrix
        //==============================================================================
        //==============================================================================

        // =============================================================================
        // Calculate the partial derivative of the Green-Largrange strains with respect to the nodal coordinates
        // (transposed).  This calculation is performed in blocks across all the Gauss quadrature points at the same
        // time.  This value should be store in row major memory layout to align with the access patterns for
        // calculating this matrix.
        // PE = [(d epsilon1/d e)GQPnt1' (d epsilon1/d e)GQPnt2' ... (d epsilon1/d e)GQPntNIP'...
        //       (d epsilon2/d e)GQPnt1' (d epsilon2/d e)GQPnt2' ... (d epsilon2/d e)GQPntNIP'...
        //       (d epsilon3/d e)GQPnt1' (d epsilon3/d e)GQPnt2' ... (d epsilon3/d e)GQPntNIP'...
        //       (d epsilon4/d e)GQPnt1' (d epsilon4/d e)GQPnt2' ... (d epsilon4/d e)GQPntNIP'...
        //       (d epsilon5/d e)GQPnt1' (d epsilon5/d e)GQPnt2' ... (d epsilon5/d e)GQPntNIP'...
        //       (d epsilon6/d e)GQPnt1' (d epsilon6/d e)GQPnt2' ... (d epsilon6/d e)GQPntNIP']
        // Note that each partial derivative block shown is placed to the left of the previous block.
        // The explanation of the calculation above is just too long to write it all on a single line.
        // =============================================================================

        Eigen::Matrix<double, Eigen::Dynamic, Eigen::Dynamic, Eigen::RowMajor> PE;
        PE.resize(3 * NSF, 6 * NIP);

        for (auto i = 0; i < NSF; i++) {
            PE.block<1, NIP>(3 * i, 0 * NIP) = m_SD.block<1, NIP>(i, (3 * kl + 0) * NIP)
                                                   .cwiseProduct(FC.template block<NIP, 1>(0 * NIP, 0).transpose());
            PE.block<1, NIP>(3 * i, 1 * NIP) = m_SD.block<1, NIP>(i, (3 * kl + 1) * NIP)
                                                   .cwiseProduct(FC.template block<NIP, 1>(1 * NIP, 0).transpose());
            PE.block<1, NIP>(3 * i, 2 * NIP) = m_SD.block<1, NIP>(i, (3 * kl + 2) * NIP)
                                                   .cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 0).transpose());
            PE.block<1, NIP>(3 * i, 3 * NIP) = m_SD.block<1, NIP>(i, (3 * kl + 2) * NIP)
                                                   .cwiseProduct(FC.template block<NIP, 1>(1 * NIP, 0).transpose()) +
                                               m_SD.block<1, NIP>(i, (3 * kl + 1) * NIP)
                                                   .cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 0).transpose());
            PE.block<1, NIP>(3 * i, 4 * NIP) = m_SD.block<1, NIP>(i, (3 * kl + 2) * NIP)
                                                   .cwiseProduct(FC.template block<NIP, 1>(0 * NIP, 0).transpose()) +
                                               m_SD.block<1, NIP>(i, (3 * kl + 0) * NIP)
                                                   .cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 0).transpose());
            PE.block<1, NIP>(3 * i, 5 * NIP) = m_SD.block<1, NIP>(i, (3 * kl + 1) * NIP)
                                                   .cwiseProduct(FC.template block<NIP, 1>(0 * NIP, 0).transpose()) +
                                               m_SD.block<1, NIP>(i, (3 * kl + 0) * NIP)
                                                   .cwiseProduct(FC.template block<NIP, 1>(1 * NIP, 0).transpose());

            PE.block<1, NIP>((3 * i) + 1, 0) =
                m_SD.block<1, NIP>(i, (3 * kl + 0) * NIP).cwiseProduct(FC.template block<NIP, 1>(0, 1).transpose());
            PE.block<1, NIP>((3 * i) + 1, NIP) =
                m_SD.block<1, NIP>(i, (3 * kl + 1) * NIP).cwiseProduct(FC.template block<NIP, 1>(NIP, 1).transpose());
            PE.block<1, NIP>((3 * i) + 1, 2 * NIP) =
                m_SD.block<1, NIP>(i, (3 * kl + 2) * NIP)
                    .cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 1).transpose());
            PE.block<1, NIP>((3 * i) + 1, 3 * NIP) =
                m_SD.block<1, NIP>(i, (3 * kl + 2) * NIP).cwiseProduct(FC.template block<NIP, 1>(NIP, 1).transpose()) +
                m_SD.block<1, NIP>(i, (3 * kl + 1) * NIP)
                    .cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 1).transpose());
            PE.block<1, NIP>((3 * i) + 1, 4 * NIP) =
                m_SD.block<1, NIP>(i, (3 * kl + 2) * NIP).cwiseProduct(FC.template block<NIP, 1>(0, 1).transpose()) +
                m_SD.block<1, NIP>(i, (3 * kl + 0) * NIP)
                    .cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 1).transpose());
            PE.block<1, NIP>((3 * i) + 1, 5 * NIP) =
                m_SD.block<1, NIP>(i, (3 * kl + 1) * NIP).cwiseProduct(FC.template block<NIP, 1>(0, 1).transpose()) +
                m_SD.block<1, NIP>(i, (3 * kl + 0) * NIP).cwiseProduct(FC.template block<NIP, 1>(NIP, 1).transpose());

            PE.block<1, NIP>((3 * i) + 2, 0) =
                m_SD.block<1, NIP>(i, (3 * kl + 0) * NIP).cwiseProduct(FC.template block<NIP, 1>(0, 2).transpose());
            PE.block<1, NIP>((3 * i) + 2, NIP) =
                m_SD.block<1, NIP>(i, (3 * kl + 1) * NIP).cwiseProduct(FC.template block<NIP, 1>(NIP, 2).transpose());
            PE.block<1, NIP>((3 * i) + 2, 2 * NIP) =
                m_SD.block<1, NIP>(i, (3 * kl + 2) * NIP)
                    .cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 2).transpose());
            PE.block<1, NIP>((3 * i) + 2, 3 * NIP) =
                m_SD.block<1, NIP>(i, (3 * kl + 2) * NIP).cwiseProduct(FC.template block<NIP, 1>(NIP, 2).transpose()) +
                m_SD.block<1, NIP>(i, (3 * kl + 1) * NIP)
                    .cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 2).transpose());
            PE.block<1, NIP>((3 * i) + 2, 4 * NIP) =
                m_SD.block<1, NIP>(i, (3 * kl + 2) * NIP).cwiseProduct(FC.template block<NIP, 1>(0, 2).transpose()) +
                m_SD.block<1, NIP>(i, (3 * kl + 0) * NIP)
                    .cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 2).transpose());
            PE.block<1, NIP>((3 * i) + 2, 5 * NIP) =
                m_SD.block<1, NIP>(i, (3 * kl + 1) * NIP).cwiseProduct(FC.template block<NIP, 1>(0, 2).transpose()) +
                m_SD.block<1, NIP>(i, (3 * kl + 0) * NIP).cwiseProduct(FC.template block<NIP, 1>(NIP, 2).transpose());
        }

        // =============================================================================
        // Combine the deformation gradient, time derivative of the deformation gradient, damping coefficient, Gauss
        // quadrature weighting times the element Jacobian, and Jacobian component scale factors into a scaled block
        // deformation gradient matrix Calculate the deformation gradient and time derivative of the deformation
        // gradient for all Gauss quadrature points in a single matrix multiplication.  Note that the resulting combined
        // deformation gradient block matrix will be ordered by block matrix (column vectors) components Note that the
        // indices of the components are in transposed order
        //            [kGQ*(Kfactor+alpha*Rfactor)*F11+alpha*Rfactor*F11dot ... similar for F21 & F31 blocks]
        // FCscaled = [kGQ*(Kfactor+alpha*Rfactor)*F12+alpha*Rfactor*F12dot ... similar for F22 & F32 blocks]
        //            [kGQ*(Kfactor+alpha*Rfactor)*F13+alpha*Rfactor*F13dot ... similar for F23 & F33 blocks]
        // =============================================================================

        ChMatrixNMc<double, 3 * NIP, 3> FCscaled = (Kfactor + m_Alpha * Rfactor) * FC.template block<3 * NIP, 3>(0, 0) +
                                                   (m_Alpha * Kfactor) * FC.template block<3 * NIP, 3>(0, 3);

        for (auto i = 0; i < 3; i++) {
            FCscaled.template block<NIP, 1>(0, i).array() *= m_kGQ.block<NIP, 1>(kl * NIP, 0).array();
            FCscaled.template block<NIP, 1>(NIP, i).array() *= m_kGQ.block<NIP, 1>(kl * NIP, 0).array();
            FCscaled.template block<NIP, 1>(2 * NIP, i).array() *= m_kGQ.block<NIP, 1>(kl * NIP, 0).array();
        }

        // =============================================================================
        // Calculate the combination of the scaled partial derivative of the Green-Largrange strains with respect to the
        // nodal coordinates, the scaled partial derivative of the time derivative of the Green-Largrange strains with
        // respect to the nodal coordinates, the scaled partial derivative of the Green-Largrange strains with respect
        // to the time derivative of the nodal coordinates, and the other parameters to correctly integrate across the
        // volume of the element.  This calculation is performed in blocks across all the Gauss quadrature points at the
        // same time.  This value should be store in row major memory layout to align with the access patterns for
        // calculating this matrix.
        // =============================================================================

        Eigen::Matrix<double, Eigen::Dynamic, Eigen::Dynamic, Eigen::RowMajor> Scaled_Combined_PE;
        Scaled_Combined_PE.resize(3 * NSF, 6 * NIP);

        for (auto i = 0; i < NSF; i++) {
            Scaled_Combined_PE.block<1, NIP>(3 * i, 0) =
                m_SD.block<1, NIP>(i, (3 * kl + 0) * NIP)
                    .cwiseProduct(FCscaled.template block<NIP, 1>(0, 0).transpose());
            Scaled_Combined_PE.block<1, NIP>(3 * i, NIP) =
                m_SD.block<1, NIP>(i, (3 * kl + 1) * NIP)
                    .cwiseProduct(FCscaled.template block<NIP, 1>(NIP, 0).transpose());
            Scaled_Combined_PE.block<1, NIP>(3 * i, 2 * NIP) =
                m_SD.block<1, NIP>(i, (3 * kl + 2) * NIP)
                    .cwiseProduct(FCscaled.template block<NIP, 1>(2 * NIP, 0).transpose());
            Scaled_Combined_PE.block<1, NIP>(3 * i, 3 * NIP) =
                m_SD.block<1, NIP>(i, (3 * kl + 2) * NIP)
                    .cwiseProduct(FCscaled.template block<NIP, 1>(NIP, 0).transpose()) +
                m_SD.block<1, NIP>(i, (3 * kl + 1) * NIP)
                    .cwiseProduct(FCscaled.template block<NIP, 1>(2 * NIP, 0).transpose());
            Scaled_Combined_PE.block<1, NIP>(3 * i, 4 * NIP) =
                m_SD.block<1, NIP>(i, (3 * kl + 2) * NIP)
                    .cwiseProduct(FCscaled.template block<NIP, 1>(0, 0).transpose()) +
                m_SD.block<1, NIP>(i, (3 * kl + 0) * NIP)
                    .cwiseProduct(FCscaled.template block<NIP, 1>(2 * NIP, 0).transpose());
            Scaled_Combined_PE.block<1, NIP>(3 * i, 5 * NIP) =
                m_SD.block<1, NIP>(i, (3 * kl + 1) * NIP)
                    .cwiseProduct(FCscaled.template block<NIP, 1>(0, 0).transpose()) +
                m_SD.block<1, NIP>(i, (3 * kl + 0) * NIP)
                    .cwiseProduct(FCscaled.template block<NIP, 1>(NIP, 0).transpose());

            Scaled_Combined_PE.block<1, NIP>((3 * i) + 1, 0) =
                m_SD.block<1, NIP>(i, (3 * kl + 0) * NIP)
                    .cwiseProduct(FCscaled.template block<NIP, 1>(0, 1).transpose());
            Scaled_Combined_PE.block<1, NIP>((3 * i) + 1, NIP) =
                m_SD.block<1, NIP>(i, (3 * kl + 1) * NIP)
                    .cwiseProduct(FCscaled.template block<NIP, 1>(NIP, 1).transpose());
            Scaled_Combined_PE.block<1, NIP>((3 * i) + 1, 2 * NIP) =
                m_SD.block<1, NIP>(i, (3 * kl + 2) * NIP)
                    .cwiseProduct(FCscaled.template block<NIP, 1>(2 * NIP, 1).transpose());
            Scaled_Combined_PE.block<1, NIP>((3 * i) + 1, 3 * NIP) =
                m_SD.block<1, NIP>(i, (3 * kl + 2) * NIP)
                    .cwiseProduct(FCscaled.template block<NIP, 1>(NIP, 1).transpose()) +
                m_SD.block<1, NIP>(i, (3 * kl + 1) * NIP)
                    .cwiseProduct(FCscaled.template block<NIP, 1>(2 * NIP, 1).transpose());
            Scaled_Combined_PE.block<1, NIP>((3 * i) + 1, 4 * NIP) =
                m_SD.block<1, NIP>(i, (3 * kl + 2) * NIP)
                    .cwiseProduct(FCscaled.template block<NIP, 1>(0, 1).transpose()) +
                m_SD.block<1, NIP>(i, (3 * kl + 0) * NIP)
                    .cwiseProduct(FCscaled.template block<NIP, 1>(2 * NIP, 1).transpose());
            Scaled_Combined_PE.block<1, NIP>((3 * i) + 1, 5 * NIP) =
                m_SD.block<1, NIP>(i, (3 * kl + 1) * NIP)
                    .cwiseProduct(FCscaled.template block<NIP, 1>(0, 1).transpose()) +
                m_SD.block<1, NIP>(i, (3 * kl + 0) * NIP)
                    .cwiseProduct(FCscaled.template block<NIP, 1>(NIP, 1).transpose());

            Scaled_Combined_PE.block<1, NIP>((3 * i) + 2, 0) =
                m_SD.block<1, NIP>(i, (3 * kl + 0) * NIP)
                    .cwiseProduct(FCscaled.template block<NIP, 1>(0, 2).transpose());
            Scaled_Combined_PE.block<1, NIP>((3 * i) + 2, NIP) =
                m_SD.block<1, NIP>(i, (3 * kl + 1) * NIP)
                    .cwiseProduct(FCscaled.template block<NIP, 1>(NIP, 2).transpose());
            Scaled_Combined_PE.block<1, NIP>((3 * i) + 2, 2 * NIP) =
                m_SD.block<1, NIP>(i, (3 * kl + 2) * NIP)
                    .cwiseProduct(FCscaled.template block<NIP, 1>(2 * NIP, 2).transpose());
            Scaled_Combined_PE.block<1, NIP>((3 * i) + 2, 3 * NIP) =
                m_SD.block<1, NIP>(i, (3 * kl + 2) * NIP)
                    .cwiseProduct(FCscaled.template block<NIP, 1>(NIP, 2).transpose()) +
                m_SD.block<1, NIP>(i, (3 * kl + 1) * NIP)
                    .cwiseProduct(FCscaled.template block<NIP, 1>(2 * NIP, 2).transpose());
            Scaled_Combined_PE.block<1, NIP>((3 * i) + 2, 4 * NIP) =
                m_SD.block<1, NIP>(i, (3 * kl + 2) * NIP)
                    .cwiseProduct(FCscaled.template block<NIP, 1>(0, 2).transpose()) +
                m_SD.block<1, NIP>(i, (3 * kl + 0) * NIP)
                    .cwiseProduct(FCscaled.template block<NIP, 1>(2 * NIP, 2).transpose());
            Scaled_Combined_PE.block<1, NIP>((3 * i) + 2, 5 * NIP) =
                m_SD.block<1, NIP>(i, (3 * kl + 1) * NIP)
                    .cwiseProduct(FCscaled.template block<NIP, 1>(0, 2).transpose()) +
                m_SD.block<1, NIP>(i, (3 * kl + 0) * NIP)
                    .cwiseProduct(FCscaled.template block<NIP, 1>(NIP, 2).transpose());
        }

        // =============================================================================
        // Get the stiffness tensor in 6x6 matrix form for the current layer at rotate it in the midsurface according to
        // the user specified angle.  Note that the matrix is reordered as well to match the Voigt notation used in this
        // element
        // =============================================================================

        ChMatrixNM<double, 6, 6> D = m_layers[kl].GetMaterial()->Get_E_eps();
        RotateReorderStiffnessMatrix(D, m_layers[kl].Get_theta());

        // =============================================================================
        // Multiply the scaled and combined partial derivative block matrix by the stiffness matrix for each individual
        // Gauss quadrature point
        // =============================================================================

        Eigen::Matrix<double, Eigen::Dynamic, Eigen::Dynamic, Eigen::RowMajor> DScaled_Combined_PE;
        DScaled_Combined_PE.resize(3 * NSF, 6 * NIP);

        DScaled_Combined_PE.template block<3 * NSF, NIP>(0, 0) =
            D(0, 0) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 0) +
            D(0, 1) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, NIP) +
            D(0, 2) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 2 * NIP) +
            D(0, 3) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 3 * NIP) +
            D(0, 4) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 4 * NIP) +
            D(0, 5) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 5 * NIP);
        DScaled_Combined_PE.template block<3 * NSF, NIP>(0, NIP) =
            D(1, 0) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 0) +
            D(1, 1) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, NIP) +
            D(1, 2) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 2 * NIP) +
            D(1, 3) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 3 * NIP) +
            D(1, 4) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 4 * NIP) +
            D(1, 5) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 5 * NIP);
        DScaled_Combined_PE.template block<3 * NSF, NIP>(0, 2 * NIP) =
            D(2, 0) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 0) +
            D(2, 1) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, NIP) +
            D(2, 2) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 2 * NIP) +
            D(2, 3) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 3 * NIP) +
            D(2, 4) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 4 * NIP) +
            D(2, 5) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 5 * NIP);
        DScaled_Combined_PE.template block<3 * NSF, NIP>(0, 3 * NIP) =
            D(3, 0) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 0) +
            D(3, 1) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, NIP) +
            D(3, 2) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 2 * NIP) +
            D(3, 3) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 3 * NIP) +
            D(3, 4) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 4 * NIP) +
            D(3, 5) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 5 * NIP);
        DScaled_Combined_PE.template block<3 * NSF, NIP>(0, 4 * NIP) =
            D(4, 0) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 0) +
            D(4, 1) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, NIP) +
            D(4, 2) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 2 * NIP) +
            D(4, 3) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 3 * NIP) +
            D(4, 4) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 4 * NIP) +
            D(4, 5) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 5 * NIP);
        DScaled_Combined_PE.template block<3 * NSF, NIP>(0, 5 * NIP) =
            D(5, 0) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 0) +
            D(5, 1) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, NIP) +
            D(5, 2) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 2 * NIP) +
            D(5, 3) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 3 * NIP) +
            D(5, 4) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 4 * NIP) +
            D(5, 5) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 5 * NIP);

        // =============================================================================
        // Multiply the partial derivative block matrix by the final scaled and combined partial derivative block matrix
        // to obtain the potentially non-symmetric and non-sparse component of the Jacobian matrix
        // =============================================================================

        H.noalias() += PE * DScaled_Combined_PE.transpose();

        //==============================================================================
        //==============================================================================
        // Calculate the sparse and symmetric component of the Jacobian matrix
        //==============================================================================
        //==============================================================================

        // =============================================================================
        // Calculate each individual value of the Green-Lagrange strain component by component across all the
        // Gauss-Quadrature points at a time for the current layer to better leverage vectorized CPU instructions.
        // Note that the scaled time derivatives of the Green-Lagrange strain are added to make the later calculation of
        // the 2nd Piola-Kirchoff stresses more efficient.  The combined result is then scaled by minus the Gauss
        // quadrature weight times the element Jacobian at the corresponding Gauss point (m_kGQ) again for efficiency.
        // Results are written in Voigt notation: epsilon = [E11,E22,E33,2*E23,2*E13,2*E12]
        // =============================================================================

        // Each entry in E1 = kGQ*(E11+alpha*E11dot)
        //                  = kGQ*(1/2*(F11*F11+F21*F21+F31*F31-1)+alpha*(F11*F11dot+F21*F21dot+F31*F31dot))
        VectorNIP E_BlockDamping = FC.template block<NIP, 1>(0, 0).cwiseProduct(FC.template block<NIP, 1>(0, 3)) +
                                   FC.template block<NIP, 1>(0, 1).cwiseProduct(FC.template block<NIP, 1>(0, 4)) +
                                   FC.template block<NIP, 1>(0, 2).cwiseProduct(FC.template block<NIP, 1>(0, 5));
        VectorNIP E1_Block = FC.template block<NIP, 1>(0, 0).cwiseProduct(FC.template block<NIP, 1>(0, 0)) +
                             FC.template block<NIP, 1>(0, 1).cwiseProduct(FC.template block<NIP, 1>(0, 1)) +
                             FC.template block<NIP, 1>(0, 2).cwiseProduct(FC.template block<NIP, 1>(0, 2));
        E1_Block.array() -= 1;
        E1_Block *= 0.5;
        E1_Block += m_Alpha * E_BlockDamping;
        E1_Block.array() *= m_kGQ.block<NIP, 1>(kl * NIP, 0).array();

        // Each entry in E2 = kGQ*(E22+alpha*E22dot)
        //                  = kGQ*(1/2*(F12*F12+F22*F22+F32*F32-1)+alpha*(F12*F12dot+F22*F22dot+F32*F32dot))
        E_BlockDamping.noalias() = FC.template block<NIP, 1>(NIP, 0).cwiseProduct(FC.template block<NIP, 1>(NIP, 3)) +
                                   FC.template block<NIP, 1>(NIP, 1).cwiseProduct(FC.template block<NIP, 1>(NIP, 4)) +
                                   FC.template block<NIP, 1>(NIP, 2).cwiseProduct(FC.template block<NIP, 1>(NIP, 5));
        VectorNIP E2_Block = FC.template block<NIP, 1>(NIP, 0).cwiseProduct(FC.template block<NIP, 1>(NIP, 0)) +
                             FC.template block<NIP, 1>(NIP, 1).cwiseProduct(FC.template block<NIP, 1>(NIP, 1)) +
                             FC.template block<NIP, 1>(NIP, 2).cwiseProduct(FC.template block<NIP, 1>(NIP, 2));
        E2_Block.array() -= 1;
        E2_Block *= 0.5;
        E2_Block += m_Alpha * E_BlockDamping;
        E2_Block.array() *= m_kGQ.block<NIP, 1>(kl * NIP, 0).array();

        // Each entry in E3 = kGQ*(E33+alpha*E33dot)
        //                  = kGQ*(1/2*(F13*F13+F23*F23+F33*F33-1)+alpha*(F13*F13dot+F23*F23dot+F33*F33dot))
        E_BlockDamping.noalias() =
            FC.template block<NIP, 1>(2 * NIP, 0).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 3)) +
            FC.template block<NIP, 1>(2 * NIP, 1).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 4)) +
            FC.template block<NIP, 1>(2 * NIP, 2).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 5));
        VectorNIP E3_Block = FC.template block<NIP, 1>(2 * NIP, 0).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 0)) +
                             FC.template block<NIP, 1>(2 * NIP, 1).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 1)) +
                             FC.template block<NIP, 1>(2 * NIP, 2).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 2));
        E3_Block.array() -= 1;
        E3_Block *= 0.5;
        E3_Block += m_Alpha * E_BlockDamping;
        E3_Block.array() *= m_kGQ.block<NIP, 1>(kl * NIP, 0).array();

        // Each entry in E4 = kGQ*(2*(E23+alpha*E23dot))
        //                  = kGQ*((F12*F13+F22*F23+F32*F33)
        //                    +alpha*(F12dot*F13+F22dot*F23+F32dot*F33 + F12*F13dot+F22*F23dot+F32*F33dot))
        E_BlockDamping.noalias() =
            FC.template block<NIP, 1>(2 * NIP, 0).cwiseProduct(FC.template block<NIP, 1>(NIP, 3)) +
            FC.template block<NIP, 1>(2 * NIP, 1).cwiseProduct(FC.template block<NIP, 1>(NIP, 4)) +
            FC.template block<NIP, 1>(2 * NIP, 2).cwiseProduct(FC.template block<NIP, 1>(NIP, 5)) +
            FC.template block<NIP, 1>(NIP, 0).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 3)) +
            FC.template block<NIP, 1>(NIP, 1).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 4)) +
            FC.template block<NIP, 1>(NIP, 2).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 5));
        VectorNIP E4_Block = FC.template block<NIP, 1>(NIP, 0).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 0)) +
                             FC.template block<NIP, 1>(NIP, 1).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 1)) +
                             FC.template block<NIP, 1>(NIP, 2).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 2));
        E4_Block += m_Alpha * E_BlockDamping;
        E4_Block.array() *= m_kGQ.block<NIP, 1>(kl * NIP, 0).array();

        // Each entry in E5 = kGQ*(2*(E13+alpha*E13dot))
        //                  = kGQ*((F11*F13+F21*F23+F31*F33)
        //                    +alpha*(F11dot*F13+F21dot*F23+F31dot*F33 + F11*F13dot+F21*F23dot+F31*F33dot))
        E_BlockDamping.noalias() = FC.template block<NIP, 1>(2 * NIP, 0).cwiseProduct(FC.template block<NIP, 1>(0, 3)) +
                                   FC.template block<NIP, 1>(2 * NIP, 1).cwiseProduct(FC.template block<NIP, 1>(0, 4)) +
                                   FC.template block<NIP, 1>(2 * NIP, 2).cwiseProduct(FC.template block<NIP, 1>(0, 5)) +
                                   FC.template block<NIP, 1>(0, 0).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 3)) +
                                   FC.template block<NIP, 1>(0, 1).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 4)) +
                                   FC.template block<NIP, 1>(0, 2).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 5));
        VectorNIP E5_Block = FC.template block<NIP, 1>(0, 0).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 0)) +
                             FC.template block<NIP, 1>(0, 1).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 1)) +
                             FC.template block<NIP, 1>(0, 2).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 2));
        E5_Block += m_Alpha * E_BlockDamping;
        E5_Block.array() *= m_kGQ.block<NIP, 1>(kl * NIP, 0).array();

        // Each entry in E6 = kGQ*(2*(E12+alpha*E12dot))
        //                  = kGQ*((F11*F12+F21*F22+F31*F32)
        //                    +alpha*(F11dot*F12+F21dot*F22+F31dot*F32 + F11*F12dot+F21*F22dot+F31*F32dot))
        E_BlockDamping.noalias() = FC.template block<NIP, 1>(NIP, 0).cwiseProduct(FC.template block<NIP, 1>(0, 3)) +
                                   FC.template block<NIP, 1>(NIP, 1).cwiseProduct(FC.template block<NIP, 1>(0, 4)) +
                                   FC.template block<NIP, 1>(NIP, 2).cwiseProduct(FC.template block<NIP, 1>(0, 5)) +
                                   FC.template block<NIP, 1>(0, 0).cwiseProduct(FC.template block<NIP, 1>(NIP, 3)) +
                                   FC.template block<NIP, 1>(0, 1).cwiseProduct(FC.template block<NIP, 1>(NIP, 4)) +
                                   FC.template block<NIP, 1>(0, 2).cwiseProduct(FC.template block<NIP, 1>(NIP, 5));
        VectorNIP E6_Block = FC.template block<NIP, 1>(0, 0).cwiseProduct(FC.template block<NIP, 1>(NIP, 0)) +
                             FC.template block<NIP, 1>(0, 1).cwiseProduct(FC.template block<NIP, 1>(NIP, 1)) +
                             FC.template block<NIP, 1>(0, 2).cwiseProduct(FC.template block<NIP, 1>(NIP, 2));
        E6_Block += m_Alpha * E_BlockDamping;
        E6_Block.array() *= m_kGQ.block<NIP, 1>(kl * NIP, 0).array();

        // =============================================================================
        // Calculate the 2nd Piola-Kirchoff stresses in Voigt notation across all the Gauss quadrature points in the
        // current layer at a time component by component.
        // Note that the Green-Largrange strain components have been scaled have already been combined with their scaled
        // time derivatives and minus the Gauss quadrature weight times the element Jacobian at the corresponding Gauss
        // point to make the calculation of the 2nd Piola-Kirchoff stresses more efficient.
        //  kGQ*SPK2 = kGQ*[SPK2_11,SPK2_22,SPK2_33,SPK2_23,SPK2_13,SPK2_12] = D * E_Combined
        // =============================================================================

        VectorNIP SPK2_1_Block = D(0, 0) * E1_Block + D(0, 1) * E2_Block + D(0, 2) * E3_Block + D(0, 3) * E4_Block +
                                 D(0, 4) * E5_Block + D(0, 5) * E6_Block;
        VectorNIP SPK2_2_Block = D(1, 0) * E1_Block + D(1, 1) * E2_Block + D(1, 2) * E3_Block + D(1, 3) * E4_Block +
                                 D(1, 4) * E5_Block + D(1, 5) * E6_Block;
        VectorNIP SPK2_3_Block = D(2, 0) * E1_Block + D(2, 1) * E2_Block + D(2, 2) * E3_Block + D(2, 3) * E4_Block +
                                 D(2, 4) * E5_Block + D(2, 5) * E6_Block;
        VectorNIP SPK2_4_Block = D(3, 0) * E1_Block + D(3, 1) * E2_Block + D(3, 2) * E3_Block + D(3, 3) * E4_Block +
                                 D(3, 4) * E5_Block + D(3, 5) * E6_Block;
        VectorNIP SPK2_5_Block = D(4, 0) * E1_Block + D(4, 1) * E2_Block + D(4, 2) * E3_Block + D(4, 3) * E4_Block +
                                 D(4, 4) * E5_Block + D(4, 5) * E6_Block;
        VectorNIP SPK2_6_Block = D(5, 0) * E1_Block + D(5, 1) * E2_Block + D(5, 2) * E3_Block + D(5, 3) * E4_Block +
                                 D(5, 4) * E5_Block + D(5, 5) * E6_Block;

        // =============================================================================
        // Multiply the shape function derivative matrix by the 2nd Piola-Kirchoff stresses for each corresponding Gauss
        // quadrature point
        // =============================================================================

        ChMatrixNM<double, NSF, 3 * NIP> S_scaled_SD;

        for (auto i = 0; i < NSF; i++) {
            S_scaled_SD.template block<1, NIP>(i, 0) =
                SPK2_1_Block.transpose().cwiseProduct(m_SD.block<1, NIP>(i, (3 * kl + 0) * NIP)) +
                SPK2_6_Block.transpose().cwiseProduct(m_SD.block<1, NIP>(i, (3 * kl + 1) * NIP)) +
                SPK2_5_Block.transpose().cwiseProduct(m_SD.block<1, NIP>(i, (3 * kl + 2) * NIP));

            S_scaled_SD.template block<1, NIP>(i, NIP) =
                SPK2_6_Block.transpose().cwiseProduct(m_SD.block<1, NIP>(i, (3 * kl + 0) * NIP)) +
                SPK2_2_Block.transpose().cwiseProduct(m_SD.block<1, NIP>(i, (3 * kl + 1) * NIP)) +
                SPK2_4_Block.transpose().cwiseProduct(m_SD.block<1, NIP>(i, (3 * kl + 2) * NIP));

            S_scaled_SD.template block<1, NIP>(i, 2 * NIP) =
                SPK2_5_Block.transpose().cwiseProduct(m_SD.block<1, NIP>(i, (3 * kl + 0) * NIP)) +
                SPK2_4_Block.transpose().cwiseProduct(m_SD.block<1, NIP>(i, (3 * kl + 1) * NIP)) +
                SPK2_3_Block.transpose().cwiseProduct(m_SD.block<1, NIP>(i, (3 * kl + 2) * NIP));
        }

        // =============================================================================
        // Calculate just the non-sparse upper triangular entires of the sparse and symmetric component of the Jacobian
        // matrix and then expand them out to full size by summing the contribution into the correct locations of the
        // full sized Jacobian matrix
        // =============================================================================
        unsigned int idx = 0;
        for (unsigned int i = 0; i < NSF; i++) {
            for (unsigned int j = i; j < NSF; j++) {
                double d = Kfactor * m_SD.block<1, 3 * NIP>(i, 3 * kl * NIP) *
                           S_scaled_SD.template block<1, 3 * NIP>(j, 0).transpose();

                H(3 * i, 3 * j) += d;
                H(3 * i + 1, 3 * j + 1) += d;
                H(3 * i + 2, 3 * j + 2) += d;
                if (i != j) {
                    H(3 * j, 3 * i) += d;
                    H(3 * j + 1, 3 * i + 1) += d;
                    H(3 * j + 2, 3 * i + 2) += d;
                }
                idx++;
            }
        }
    }
}